

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O2

void __thiscall
HDWallet_GetMnemonicWordlistTest_Test::TestBody(HDWallet_GetMnemonicWordlistTest_Test *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertHelper AStack_10898;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_10890;
  allocator_type aStack_10875;
  allocator aStack_10874;
  allocator aStack_10873;
  allocator aStack_10872;
  allocator aStack_10871;
  allocator aStack_10870;
  allocator aStack_1086f;
  allocator aStack_1086e;
  allocator aStack_1086d;
  allocator aStack_1086c;
  allocator aStack_1086b;
  allocator aStack_1086a;
  allocator aStack_10869;
  allocator aStack_10868;
  allocator aStack_10867;
  allocator aStack_10866;
  allocator aStack_10865;
  allocator aStack_10864;
  allocator aStack_10863;
  allocator aStack_10862;
  allocator aStack_10861;
  allocator aStack_10860;
  allocator aStack_1085f;
  allocator aStack_1085e;
  allocator aStack_1085d;
  allocator aStack_1085c;
  allocator aStack_1085b;
  allocator aStack_1085a;
  allocator aStack_10859;
  allocator aStack_10858;
  allocator aStack_10857;
  allocator aStack_10856;
  allocator aStack_10855;
  allocator aStack_10854;
  allocator aStack_10853;
  allocator aStack_10852;
  allocator aStack_10851;
  allocator aStack_10850;
  allocator aStack_1084f;
  allocator aStack_1084e;
  allocator aStack_1084d;
  allocator aStack_1084c;
  allocator aStack_1084b;
  allocator aStack_1084a;
  allocator aStack_10849;
  allocator aStack_10848;
  allocator aStack_10847;
  allocator aStack_10846;
  allocator aStack_10845;
  allocator aStack_10844;
  allocator aStack_10843;
  allocator aStack_10842;
  allocator aStack_10841;
  allocator aStack_10840;
  allocator aStack_1083f;
  allocator aStack_1083e;
  allocator aStack_1083d;
  allocator aStack_1083c;
  allocator aStack_1083b;
  allocator aStack_1083a;
  allocator aStack_10839;
  allocator aStack_10838;
  allocator aStack_10837;
  allocator aStack_10836;
  allocator aStack_10835;
  allocator aStack_10834;
  allocator aStack_10833;
  allocator aStack_10832;
  allocator aStack_10831;
  allocator aStack_10830;
  allocator aStack_1082f;
  allocator aStack_1082e;
  allocator aStack_1082d;
  allocator aStack_1082c;
  allocator aStack_1082b;
  allocator aStack_1082a;
  allocator aStack_10829;
  allocator aStack_10828;
  allocator aStack_10827;
  allocator aStack_10826;
  allocator aStack_10825;
  allocator aStack_10824;
  allocator aStack_10823;
  allocator aStack_10822;
  allocator aStack_10821;
  allocator aStack_10820;
  allocator aStack_1081f;
  allocator aStack_1081e;
  allocator aStack_1081d;
  allocator aStack_1081c;
  allocator aStack_1081b;
  allocator aStack_1081a;
  allocator aStack_10819;
  allocator aStack_10818;
  allocator aStack_10817;
  allocator aStack_10816;
  allocator aStack_10815;
  allocator aStack_10814;
  allocator aStack_10813;
  allocator aStack_10812;
  allocator aStack_10811;
  allocator aStack_10810;
  allocator aStack_1080f;
  allocator aStack_1080e;
  allocator aStack_1080d;
  allocator aStack_1080c;
  allocator aStack_1080b;
  allocator aStack_1080a;
  allocator aStack_10809;
  allocator aStack_10808;
  allocator aStack_10807;
  allocator aStack_10806;
  allocator aStack_10805;
  allocator aStack_10804;
  allocator aStack_10803;
  allocator aStack_10802;
  allocator aStack_10801;
  allocator aStack_10800;
  allocator aStack_107ff;
  allocator aStack_107fe;
  allocator aStack_107fd;
  allocator aStack_107fc;
  allocator aStack_107fb;
  allocator aStack_107fa;
  allocator aStack_107f9;
  allocator aStack_107f8;
  allocator aStack_107f7;
  allocator aStack_107f6;
  allocator aStack_107f5;
  allocator aStack_107f4;
  allocator aStack_107f3;
  allocator aStack_107f2;
  allocator aStack_107f1;
  allocator aStack_107f0;
  allocator aStack_107ef;
  allocator aStack_107ee;
  allocator aStack_107ed;
  allocator aStack_107ec;
  allocator aStack_107eb;
  allocator aStack_107ea;
  allocator aStack_107e9;
  allocator aStack_107e8;
  allocator aStack_107e7;
  allocator aStack_107e6;
  allocator aStack_107e5;
  allocator aStack_107e4;
  allocator aStack_107e3;
  allocator aStack_107e2;
  allocator aStack_107e1;
  allocator aStack_107e0;
  allocator aStack_107df;
  allocator aStack_107de;
  allocator aStack_107dd;
  allocator aStack_107dc;
  allocator aStack_107db;
  allocator aStack_107da;
  allocator aStack_107d9;
  allocator aStack_107d8;
  allocator aStack_107d7;
  allocator aStack_107d6;
  allocator aStack_107d5;
  allocator aStack_107d4;
  allocator aStack_107d3;
  allocator aStack_107d2;
  allocator aStack_107d1;
  allocator aStack_107d0;
  allocator aStack_107cf;
  allocator aStack_107ce;
  allocator aStack_107cd;
  allocator aStack_107cc;
  allocator aStack_107cb;
  allocator aStack_107ca;
  allocator aStack_107c9;
  allocator aStack_107c8;
  allocator aStack_107c7;
  allocator aStack_107c6;
  allocator aStack_107c5;
  allocator aStack_107c4;
  allocator aStack_107c3;
  allocator aStack_107c2;
  allocator aStack_107c1;
  allocator aStack_107c0;
  allocator aStack_107bf;
  allocator aStack_107be;
  allocator aStack_107bd;
  allocator aStack_107bc;
  allocator aStack_107bb;
  allocator aStack_107ba;
  allocator aStack_107b9;
  allocator aStack_107b8;
  allocator aStack_107b7;
  allocator aStack_107b6;
  allocator aStack_107b5;
  allocator aStack_107b4;
  allocator aStack_107b3;
  allocator aStack_107b2;
  allocator aStack_107b1;
  allocator aStack_107b0;
  allocator aStack_107af;
  allocator aStack_107ae;
  allocator aStack_107ad;
  allocator aStack_107ac;
  allocator aStack_107ab;
  allocator aStack_107aa;
  allocator aStack_107a9;
  allocator aStack_107a8;
  allocator aStack_107a7;
  allocator aStack_107a6;
  allocator aStack_107a5;
  allocator aStack_107a4;
  allocator aStack_107a3;
  allocator aStack_107a2;
  allocator aStack_107a1;
  allocator aStack_107a0;
  allocator aStack_1079f;
  allocator aStack_1079e;
  allocator aStack_1079d;
  allocator aStack_1079c;
  allocator aStack_1079b;
  allocator aStack_1079a;
  allocator aStack_10799;
  allocator aStack_10798;
  allocator aStack_10797;
  allocator aStack_10796;
  allocator aStack_10795;
  allocator aStack_10794;
  allocator aStack_10793;
  allocator aStack_10792;
  allocator aStack_10791;
  allocator aStack_10790;
  allocator aStack_1078f;
  allocator aStack_1078e;
  allocator aStack_1078d;
  allocator aStack_1078c;
  allocator aStack_1078b;
  allocator aStack_1078a;
  allocator aStack_10789;
  allocator aStack_10788;
  allocator aStack_10787;
  allocator aStack_10786;
  allocator aStack_10785;
  allocator aStack_10784;
  allocator aStack_10783;
  allocator aStack_10782;
  allocator aStack_10781;
  allocator aStack_10780;
  allocator aStack_1077f;
  allocator aStack_1077e;
  allocator aStack_1077d;
  allocator aStack_1077c;
  allocator aStack_1077b;
  allocator aStack_1077a;
  allocator aStack_10779;
  allocator aStack_10778;
  allocator aStack_10777;
  allocator aStack_10776;
  allocator aStack_10775;
  allocator aStack_10774;
  allocator aStack_10773;
  allocator aStack_10772;
  allocator aStack_10771;
  allocator aStack_10770;
  allocator aStack_1076f;
  allocator aStack_1076e;
  allocator aStack_1076d;
  allocator aStack_1076c;
  allocator aStack_1076b;
  allocator aStack_1076a;
  allocator aStack_10769;
  allocator aStack_10768;
  allocator aStack_10767;
  allocator aStack_10766;
  allocator aStack_10765;
  allocator aStack_10764;
  allocator aStack_10763;
  allocator aStack_10762;
  allocator aStack_10761;
  allocator aStack_10760;
  allocator aStack_1075f;
  allocator aStack_1075e;
  allocator aStack_1075d;
  allocator aStack_1075c;
  allocator aStack_1075b;
  allocator aStack_1075a;
  allocator aStack_10759;
  allocator aStack_10758;
  allocator aStack_10757;
  allocator aStack_10756;
  allocator aStack_10755;
  allocator aStack_10754;
  allocator aStack_10753;
  allocator aStack_10752;
  allocator aStack_10751;
  allocator aStack_10750;
  allocator aStack_1074f;
  allocator aStack_1074e;
  allocator aStack_1074d;
  allocator aStack_1074c;
  allocator aStack_1074b;
  allocator aStack_1074a;
  allocator aStack_10749;
  allocator aStack_10748;
  allocator aStack_10747;
  allocator aStack_10746;
  allocator aStack_10745;
  allocator aStack_10744;
  allocator aStack_10743;
  allocator aStack_10742;
  allocator aStack_10741;
  allocator aStack_10740;
  allocator aStack_1073f;
  allocator aStack_1073e;
  allocator aStack_1073d;
  allocator aStack_1073c;
  allocator aStack_1073b;
  allocator aStack_1073a;
  allocator aStack_10739;
  allocator aStack_10738;
  allocator aStack_10737;
  allocator aStack_10736;
  allocator aStack_10735;
  allocator aStack_10734;
  allocator aStack_10733;
  allocator aStack_10732;
  allocator aStack_10731;
  allocator aStack_10730;
  allocator aStack_1072f;
  allocator aStack_1072e;
  allocator aStack_1072d;
  allocator aStack_1072c;
  allocator aStack_1072b;
  allocator aStack_1072a;
  allocator aStack_10729;
  allocator aStack_10728;
  allocator aStack_10727;
  allocator aStack_10726;
  allocator aStack_10725;
  allocator aStack_10724;
  allocator aStack_10723;
  allocator aStack_10722;
  allocator aStack_10721;
  allocator aStack_10720;
  allocator aStack_1071f;
  allocator aStack_1071e;
  allocator aStack_1071d;
  allocator aStack_1071c;
  allocator aStack_1071b;
  allocator aStack_1071a;
  allocator aStack_10719;
  allocator aStack_10718;
  allocator aStack_10717;
  allocator aStack_10716;
  allocator aStack_10715;
  allocator aStack_10714;
  allocator aStack_10713;
  allocator aStack_10712;
  allocator aStack_10711;
  allocator aStack_10710;
  allocator aStack_1070f;
  allocator aStack_1070e;
  allocator aStack_1070d;
  allocator aStack_1070c;
  allocator aStack_1070b;
  allocator aStack_1070a;
  allocator aStack_10709;
  allocator aStack_10708;
  allocator aStack_10707;
  allocator aStack_10706;
  allocator aStack_10705;
  allocator aStack_10704;
  allocator aStack_10703;
  allocator aStack_10702;
  allocator aStack_10701;
  allocator aStack_10700;
  allocator aStack_106ff;
  allocator aStack_106fe;
  allocator aStack_106fd;
  allocator aStack_106fc;
  allocator aStack_106fb;
  allocator aStack_106fa;
  allocator aStack_106f9;
  allocator aStack_106f8;
  allocator aStack_106f7;
  allocator aStack_106f6;
  allocator aStack_106f5;
  allocator aStack_106f4;
  allocator aStack_106f3;
  allocator aStack_106f2;
  allocator aStack_106f1;
  allocator aStack_106f0;
  allocator aStack_106ef;
  allocator aStack_106ee;
  allocator aStack_106ed;
  allocator aStack_106ec;
  allocator aStack_106eb;
  allocator aStack_106ea;
  allocator aStack_106e9;
  allocator aStack_106e8;
  allocator aStack_106e7;
  allocator aStack_106e6;
  allocator aStack_106e5;
  allocator aStack_106e4;
  allocator aStack_106e3;
  allocator aStack_106e2;
  allocator aStack_106e1;
  allocator aStack_106e0;
  allocator aStack_106df;
  allocator aStack_106de;
  allocator aStack_106dd;
  allocator aStack_106dc;
  allocator aStack_106db;
  allocator aStack_106da;
  allocator aStack_106d9;
  allocator aStack_106d8;
  allocator aStack_106d7;
  allocator aStack_106d6;
  allocator aStack_106d5;
  allocator aStack_106d4;
  allocator aStack_106d3;
  allocator aStack_106d2;
  allocator aStack_106d1;
  allocator aStack_106d0;
  allocator aStack_106cf;
  allocator aStack_106ce;
  allocator aStack_106cd;
  allocator aStack_106cc;
  allocator aStack_106cb;
  allocator aStack_106ca;
  allocator aStack_106c9;
  allocator aStack_106c8;
  allocator aStack_106c7;
  allocator aStack_106c6;
  allocator aStack_106c5;
  allocator aStack_106c4;
  allocator aStack_106c3;
  allocator aStack_106c2;
  allocator aStack_106c1;
  allocator aStack_106c0;
  allocator aStack_106bf;
  allocator aStack_106be;
  allocator aStack_106bd;
  allocator aStack_106bc;
  allocator aStack_106bb;
  allocator aStack_106ba;
  allocator aStack_106b9;
  allocator aStack_106b8;
  allocator aStack_106b7;
  allocator aStack_106b6;
  allocator aStack_106b5;
  allocator aStack_106b4;
  allocator aStack_106b3;
  allocator aStack_106b2;
  allocator aStack_106b1;
  allocator aStack_106b0;
  allocator aStack_106af;
  allocator aStack_106ae;
  allocator aStack_106ad;
  allocator aStack_106ac;
  allocator aStack_106ab;
  allocator aStack_106aa;
  allocator aStack_106a9;
  allocator aStack_106a8;
  allocator aStack_106a7;
  allocator aStack_106a6;
  allocator aStack_106a5;
  allocator aStack_106a4;
  allocator aStack_106a3;
  allocator aStack_106a2;
  allocator aStack_106a1;
  allocator aStack_106a0;
  allocator aStack_1069f;
  allocator aStack_1069e;
  allocator aStack_1069d;
  allocator aStack_1069c;
  allocator aStack_1069b;
  allocator aStack_1069a;
  allocator aStack_10699;
  allocator aStack_10698;
  allocator aStack_10697;
  allocator aStack_10696;
  allocator aStack_10695;
  allocator aStack_10694;
  allocator aStack_10693;
  allocator aStack_10692;
  allocator aStack_10691;
  allocator aStack_10690;
  allocator aStack_1068f;
  allocator aStack_1068e;
  allocator aStack_1068d;
  allocator aStack_1068c;
  allocator aStack_1068b;
  allocator aStack_1068a;
  allocator aStack_10689;
  allocator aStack_10688;
  allocator aStack_10687;
  allocator aStack_10686;
  allocator aStack_10685;
  allocator aStack_10684;
  allocator aStack_10683;
  allocator aStack_10682;
  allocator aStack_10681;
  allocator aStack_10680;
  allocator aStack_1067f;
  allocator aStack_1067e;
  allocator aStack_1067d;
  allocator aStack_1067c;
  allocator aStack_1067b;
  allocator aStack_1067a;
  allocator aStack_10679;
  allocator aStack_10678;
  allocator aStack_10677;
  allocator aStack_10676;
  allocator aStack_10675;
  allocator aStack_10674;
  allocator aStack_10673;
  allocator aStack_10672;
  allocator aStack_10671;
  allocator aStack_10670;
  allocator aStack_1066f;
  allocator aStack_1066e;
  allocator aStack_1066d;
  allocator aStack_1066c;
  allocator aStack_1066b;
  allocator aStack_1066a;
  allocator aStack_10669;
  allocator aStack_10668;
  allocator aStack_10667;
  allocator aStack_10666;
  allocator aStack_10665;
  allocator aStack_10664;
  allocator aStack_10663;
  allocator aStack_10662;
  allocator aStack_10661;
  allocator aStack_10660;
  allocator aStack_1065f;
  allocator aStack_1065e;
  allocator aStack_1065d;
  allocator aStack_1065c;
  allocator aStack_1065b;
  allocator aStack_1065a;
  allocator aStack_10659;
  allocator aStack_10658;
  allocator aStack_10657;
  allocator aStack_10656;
  allocator aStack_10655;
  allocator aStack_10654;
  allocator aStack_10653;
  allocator aStack_10652;
  allocator aStack_10651;
  allocator aStack_10650;
  allocator aStack_1064f;
  allocator aStack_1064e;
  allocator aStack_1064d;
  allocator aStack_1064c;
  allocator aStack_1064b;
  allocator aStack_1064a;
  allocator aStack_10649;
  allocator aStack_10648;
  allocator aStack_10647;
  allocator aStack_10646;
  allocator aStack_10645;
  allocator aStack_10644;
  allocator aStack_10643;
  allocator aStack_10642;
  allocator aStack_10641;
  allocator aStack_10640;
  allocator aStack_1063f;
  allocator aStack_1063e;
  allocator aStack_1063d;
  allocator aStack_1063c;
  allocator aStack_1063b;
  allocator aStack_1063a;
  allocator aStack_10639;
  allocator aStack_10638;
  allocator aStack_10637;
  allocator aStack_10636;
  allocator aStack_10635;
  allocator aStack_10634;
  allocator aStack_10633;
  allocator aStack_10632;
  allocator aStack_10631;
  allocator aStack_10630;
  allocator aStack_1062f;
  allocator aStack_1062e;
  allocator aStack_1062d;
  allocator aStack_1062c;
  allocator aStack_1062b;
  allocator aStack_1062a;
  allocator aStack_10629;
  allocator aStack_10628;
  allocator aStack_10627;
  allocator aStack_10626;
  allocator aStack_10625;
  allocator aStack_10624;
  allocator aStack_10623;
  allocator aStack_10622;
  allocator aStack_10621;
  allocator aStack_10620;
  allocator aStack_1061f;
  allocator aStack_1061e;
  allocator aStack_1061d;
  allocator aStack_1061c;
  allocator aStack_1061b;
  allocator aStack_1061a;
  allocator aStack_10619;
  allocator aStack_10618;
  allocator aStack_10617;
  allocator aStack_10616;
  allocator aStack_10615;
  allocator aStack_10614;
  allocator aStack_10613;
  allocator aStack_10612;
  allocator aStack_10611;
  allocator aStack_10610;
  allocator aStack_1060f;
  allocator aStack_1060e;
  allocator aStack_1060d;
  allocator aStack_1060c;
  allocator aStack_1060b;
  allocator aStack_1060a;
  allocator aStack_10609;
  allocator aStack_10608;
  allocator aStack_10607;
  allocator aStack_10606;
  allocator aStack_10605;
  allocator aStack_10604;
  allocator aStack_10603;
  allocator aStack_10602;
  allocator aStack_10601;
  allocator aStack_10600;
  allocator aStack_105ff;
  allocator aStack_105fe;
  allocator aStack_105fd;
  allocator aStack_105fc;
  allocator aStack_105fb;
  allocator aStack_105fa;
  allocator aStack_105f9;
  allocator aStack_105f8;
  allocator aStack_105f7;
  allocator aStack_105f6;
  allocator aStack_105f5;
  allocator aStack_105f4;
  allocator aStack_105f3;
  allocator aStack_105f2;
  allocator aStack_105f1;
  allocator aStack_105f0;
  allocator aStack_105ef;
  allocator aStack_105ee;
  allocator aStack_105ed;
  allocator aStack_105ec;
  allocator aStack_105eb;
  allocator aStack_105ea;
  allocator aStack_105e9;
  allocator aStack_105e8;
  allocator aStack_105e7;
  allocator aStack_105e6;
  allocator aStack_105e5;
  allocator aStack_105e4;
  allocator aStack_105e3;
  allocator aStack_105e2;
  allocator aStack_105e1;
  allocator aStack_105e0;
  allocator aStack_105df;
  allocator aStack_105de;
  allocator aStack_105dd;
  allocator aStack_105dc;
  allocator aStack_105db;
  allocator aStack_105da;
  allocator aStack_105d9;
  allocator aStack_105d8;
  allocator aStack_105d7;
  allocator aStack_105d6;
  allocator aStack_105d5;
  allocator aStack_105d4;
  allocator aStack_105d3;
  allocator aStack_105d2;
  allocator aStack_105d1;
  allocator aStack_105d0;
  allocator aStack_105cf;
  allocator aStack_105ce;
  allocator aStack_105cd;
  allocator aStack_105cc;
  allocator aStack_105cb;
  allocator aStack_105ca;
  allocator aStack_105c9;
  allocator aStack_105c8;
  allocator aStack_105c7;
  allocator aStack_105c6;
  allocator aStack_105c5;
  allocator aStack_105c4;
  allocator aStack_105c3;
  allocator aStack_105c2;
  allocator aStack_105c1;
  allocator aStack_105c0;
  allocator aStack_105bf;
  allocator aStack_105be;
  allocator aStack_105bd;
  allocator aStack_105bc;
  allocator aStack_105bb;
  allocator aStack_105ba;
  allocator aStack_105b9;
  allocator aStack_105b8;
  allocator aStack_105b7;
  allocator aStack_105b6;
  allocator aStack_105b5;
  allocator aStack_105b4;
  allocator aStack_105b3;
  allocator aStack_105b2;
  allocator aStack_105b1;
  allocator aStack_105b0;
  allocator aStack_105af;
  allocator aStack_105ae;
  allocator aStack_105ad;
  allocator aStack_105ac;
  allocator aStack_105ab;
  allocator aStack_105aa;
  allocator aStack_105a9;
  allocator aStack_105a8;
  allocator aStack_105a7;
  allocator aStack_105a6;
  allocator aStack_105a5;
  allocator aStack_105a4;
  allocator aStack_105a3;
  allocator aStack_105a2;
  allocator aStack_105a1;
  allocator aStack_105a0;
  allocator aStack_1059f;
  allocator aStack_1059e;
  allocator aStack_1059d;
  allocator aStack_1059c;
  allocator aStack_1059b;
  allocator aStack_1059a;
  allocator aStack_10599;
  allocator aStack_10598;
  allocator aStack_10597;
  allocator aStack_10596;
  allocator aStack_10595;
  allocator aStack_10594;
  allocator aStack_10593;
  allocator aStack_10592;
  allocator aStack_10591;
  allocator aStack_10590;
  allocator aStack_1058f;
  allocator aStack_1058e;
  allocator aStack_1058d;
  allocator aStack_1058c;
  allocator aStack_1058b;
  allocator aStack_1058a;
  allocator aStack_10589;
  allocator aStack_10588;
  allocator aStack_10587;
  allocator aStack_10586;
  allocator aStack_10585;
  allocator aStack_10584;
  allocator aStack_10583;
  allocator aStack_10582;
  allocator aStack_10581;
  allocator aStack_10580;
  allocator aStack_1057f;
  allocator aStack_1057e;
  allocator aStack_1057d;
  allocator aStack_1057c;
  allocator aStack_1057b;
  allocator aStack_1057a;
  allocator aStack_10579;
  allocator aStack_10578;
  allocator aStack_10577;
  allocator aStack_10576;
  allocator aStack_10575;
  allocator aStack_10574;
  allocator aStack_10573;
  allocator aStack_10572;
  allocator aStack_10571;
  allocator aStack_10570;
  allocator aStack_1056f;
  allocator aStack_1056e;
  allocator aStack_1056d;
  allocator aStack_1056c;
  allocator aStack_1056b;
  allocator aStack_1056a;
  allocator aStack_10569;
  allocator aStack_10568;
  allocator aStack_10567;
  allocator aStack_10566;
  allocator aStack_10565;
  allocator aStack_10564;
  allocator aStack_10563;
  allocator aStack_10562;
  allocator aStack_10561;
  allocator aStack_10560;
  allocator aStack_1055f;
  allocator aStack_1055e;
  allocator aStack_1055d;
  allocator aStack_1055c;
  allocator aStack_1055b;
  allocator aStack_1055a;
  allocator aStack_10559;
  allocator aStack_10558;
  allocator aStack_10557;
  allocator aStack_10556;
  allocator aStack_10555;
  allocator aStack_10554;
  allocator aStack_10553;
  allocator aStack_10552;
  allocator aStack_10551;
  allocator aStack_10550;
  allocator aStack_1054f;
  allocator aStack_1054e;
  allocator aStack_1054d;
  allocator aStack_1054c;
  allocator aStack_1054b;
  allocator aStack_1054a;
  allocator aStack_10549;
  allocator aStack_10548;
  allocator aStack_10547;
  allocator aStack_10546;
  allocator aStack_10545;
  allocator aStack_10544;
  allocator aStack_10543;
  allocator aStack_10542;
  allocator aStack_10541;
  allocator aStack_10540;
  allocator aStack_1053f;
  allocator aStack_1053e;
  allocator aStack_1053d;
  allocator aStack_1053c;
  allocator aStack_1053b;
  allocator aStack_1053a;
  allocator aStack_10539;
  allocator aStack_10538;
  allocator aStack_10537;
  allocator aStack_10536;
  allocator aStack_10535;
  allocator aStack_10534;
  allocator aStack_10533;
  allocator aStack_10532;
  allocator aStack_10531;
  allocator aStack_10530;
  allocator aStack_1052f;
  allocator aStack_1052e;
  allocator aStack_1052d;
  allocator aStack_1052c;
  allocator aStack_1052b;
  allocator aStack_1052a;
  allocator aStack_10529;
  allocator aStack_10528;
  allocator aStack_10527;
  allocator aStack_10526;
  allocator aStack_10525;
  allocator aStack_10524;
  allocator aStack_10523;
  allocator aStack_10522;
  allocator aStack_10521;
  allocator aStack_10520;
  allocator aStack_1051f;
  allocator aStack_1051e;
  allocator aStack_1051d;
  allocator aStack_1051c;
  allocator aStack_1051b;
  allocator aStack_1051a;
  allocator aStack_10519;
  allocator aStack_10518;
  allocator aStack_10517;
  allocator aStack_10516;
  allocator aStack_10515;
  allocator aStack_10514;
  allocator aStack_10513;
  allocator aStack_10512;
  allocator aStack_10511;
  allocator aStack_10510;
  allocator aStack_1050f;
  allocator aStack_1050e;
  allocator aStack_1050d;
  allocator aStack_1050c;
  allocator aStack_1050b;
  allocator aStack_1050a;
  allocator aStack_10509;
  allocator aStack_10508;
  allocator aStack_10507;
  allocator aStack_10506;
  allocator aStack_10505;
  allocator aStack_10504;
  allocator aStack_10503;
  allocator aStack_10502;
  allocator aStack_10501;
  allocator aStack_10500;
  allocator aStack_104ff;
  allocator aStack_104fe;
  allocator aStack_104fd;
  allocator aStack_104fc;
  allocator aStack_104fb;
  allocator aStack_104fa;
  allocator aStack_104f9;
  allocator aStack_104f8;
  allocator aStack_104f7;
  allocator aStack_104f6;
  allocator aStack_104f5;
  allocator aStack_104f4;
  allocator aStack_104f3;
  allocator aStack_104f2;
  allocator aStack_104f1;
  allocator aStack_104f0;
  allocator aStack_104ef;
  allocator aStack_104ee;
  allocator aStack_104ed;
  allocator aStack_104ec;
  allocator aStack_104eb;
  allocator aStack_104ea;
  allocator aStack_104e9;
  allocator aStack_104e8;
  allocator aStack_104e7;
  allocator aStack_104e6;
  allocator aStack_104e5;
  allocator aStack_104e4;
  allocator aStack_104e3;
  allocator aStack_104e2;
  allocator aStack_104e1;
  allocator aStack_104e0;
  allocator aStack_104df;
  allocator aStack_104de;
  allocator aStack_104dd;
  allocator aStack_104dc;
  allocator aStack_104db;
  allocator aStack_104da;
  allocator aStack_104d9;
  allocator aStack_104d8;
  allocator aStack_104d7;
  allocator aStack_104d6;
  allocator aStack_104d5;
  allocator aStack_104d4;
  allocator aStack_104d3;
  allocator aStack_104d2;
  allocator aStack_104d1;
  allocator aStack_104d0;
  allocator aStack_104cf;
  allocator aStack_104ce;
  allocator aStack_104cd;
  allocator aStack_104cc;
  allocator aStack_104cb;
  allocator aStack_104ca;
  allocator aStack_104c9;
  allocator aStack_104c8;
  allocator aStack_104c7;
  allocator aStack_104c6;
  allocator aStack_104c5;
  allocator aStack_104c4;
  allocator aStack_104c3;
  allocator aStack_104c2;
  allocator aStack_104c1;
  allocator aStack_104c0;
  allocator aStack_104bf;
  allocator aStack_104be;
  allocator aStack_104bd;
  allocator aStack_104bc;
  allocator aStack_104bb;
  allocator aStack_104ba;
  allocator aStack_104b9;
  allocator aStack_104b8;
  allocator aStack_104b7;
  allocator aStack_104b6;
  allocator aStack_104b5;
  allocator aStack_104b4;
  allocator aStack_104b3;
  allocator aStack_104b2;
  allocator aStack_104b1;
  allocator aStack_104b0;
  allocator aStack_104af;
  allocator aStack_104ae;
  allocator aStack_104ad;
  allocator aStack_104ac;
  allocator aStack_104ab;
  allocator aStack_104aa;
  allocator aStack_104a9;
  allocator aStack_104a8;
  allocator aStack_104a7;
  allocator aStack_104a6;
  allocator aStack_104a5;
  allocator aStack_104a4;
  allocator aStack_104a3;
  allocator aStack_104a2;
  allocator aStack_104a1;
  allocator aStack_104a0;
  allocator aStack_1049f;
  allocator aStack_1049e;
  allocator aStack_1049d;
  allocator aStack_1049c;
  allocator aStack_1049b;
  allocator aStack_1049a;
  allocator aStack_10499;
  allocator aStack_10498;
  allocator aStack_10497;
  allocator aStack_10496;
  allocator aStack_10495;
  allocator aStack_10494;
  allocator aStack_10493;
  allocator aStack_10492;
  allocator aStack_10491;
  allocator aStack_10490;
  allocator aStack_1048f;
  allocator aStack_1048e;
  allocator aStack_1048d;
  allocator aStack_1048c;
  allocator aStack_1048b;
  allocator aStack_1048a;
  allocator aStack_10489;
  allocator aStack_10488;
  allocator aStack_10487;
  allocator aStack_10486;
  allocator aStack_10485;
  allocator aStack_10484;
  allocator aStack_10483;
  allocator aStack_10482;
  allocator aStack_10481;
  allocator aStack_10480;
  allocator aStack_1047f;
  allocator aStack_1047e;
  allocator aStack_1047d;
  allocator aStack_1047c;
  allocator aStack_1047b;
  allocator aStack_1047a;
  allocator aStack_10479;
  allocator aStack_10478;
  allocator aStack_10477;
  allocator aStack_10476;
  allocator aStack_10475;
  allocator aStack_10474;
  allocator aStack_10473;
  allocator aStack_10472;
  allocator aStack_10471;
  allocator aStack_10470;
  allocator aStack_1046f;
  allocator aStack_1046e;
  allocator aStack_1046d;
  allocator aStack_1046c;
  allocator aStack_1046b;
  allocator aStack_1046a;
  allocator aStack_10469;
  allocator aStack_10468;
  allocator aStack_10467;
  allocator aStack_10466;
  allocator aStack_10465;
  allocator aStack_10464;
  allocator aStack_10463;
  allocator aStack_10462;
  allocator aStack_10461;
  allocator aStack_10460;
  allocator aStack_1045f;
  allocator aStack_1045e;
  allocator aStack_1045d;
  allocator aStack_1045c;
  allocator aStack_1045b;
  allocator aStack_1045a;
  allocator aStack_10459;
  allocator aStack_10458;
  allocator aStack_10457;
  allocator aStack_10456;
  allocator aStack_10455;
  allocator aStack_10454;
  allocator aStack_10453;
  allocator aStack_10452;
  allocator aStack_10451;
  allocator aStack_10450;
  allocator aStack_1044f;
  allocator aStack_1044e;
  allocator aStack_1044d;
  allocator aStack_1044c;
  allocator aStack_1044b;
  allocator aStack_1044a;
  allocator aStack_10449;
  allocator aStack_10448;
  allocator aStack_10447;
  allocator aStack_10446;
  allocator aStack_10445;
  allocator aStack_10444;
  allocator aStack_10443;
  allocator aStack_10442;
  allocator aStack_10441;
  allocator aStack_10440;
  allocator aStack_1043f;
  allocator aStack_1043e;
  allocator aStack_1043d;
  allocator aStack_1043c;
  allocator aStack_1043b;
  allocator aStack_1043a;
  allocator aStack_10439;
  allocator aStack_10438;
  allocator aStack_10437;
  allocator aStack_10436;
  allocator aStack_10435;
  allocator aStack_10434;
  allocator aStack_10433;
  allocator aStack_10432;
  allocator aStack_10431;
  allocator aStack_10430;
  allocator aStack_1042f;
  allocator aStack_1042e;
  allocator aStack_1042d;
  allocator aStack_1042c;
  allocator aStack_1042b;
  allocator aStack_1042a;
  allocator aStack_10429;
  allocator aStack_10428;
  allocator aStack_10427;
  allocator aStack_10426;
  allocator aStack_10425;
  allocator aStack_10424;
  allocator aStack_10423;
  allocator aStack_10422;
  allocator aStack_10421;
  allocator aStack_10420;
  allocator aStack_1041f;
  allocator aStack_1041e;
  allocator aStack_1041d;
  allocator aStack_1041c;
  allocator aStack_1041b;
  allocator aStack_1041a;
  allocator aStack_10419;
  allocator aStack_10418;
  allocator aStack_10417;
  allocator aStack_10416;
  allocator aStack_10415;
  allocator aStack_10414;
  allocator aStack_10413;
  allocator aStack_10412;
  allocator aStack_10411;
  allocator aStack_10410;
  allocator aStack_1040f;
  allocator aStack_1040e;
  allocator aStack_1040d;
  allocator aStack_1040c;
  allocator aStack_1040b;
  allocator aStack_1040a;
  allocator aStack_10409;
  allocator aStack_10408;
  allocator aStack_10407;
  allocator aStack_10406;
  allocator aStack_10405;
  allocator aStack_10404;
  allocator aStack_10403;
  allocator aStack_10402;
  allocator aStack_10401;
  allocator aStack_10400;
  allocator aStack_103ff;
  allocator aStack_103fe;
  allocator aStack_103fd;
  allocator aStack_103fc;
  allocator aStack_103fb;
  allocator aStack_103fa;
  allocator aStack_103f9;
  allocator aStack_103f8;
  allocator aStack_103f7;
  allocator aStack_103f6;
  allocator aStack_103f5;
  allocator aStack_103f4;
  allocator aStack_103f3;
  allocator aStack_103f2;
  allocator aStack_103f1;
  allocator aStack_103f0;
  allocator aStack_103ef;
  allocator aStack_103ee;
  allocator aStack_103ed;
  allocator aStack_103ec;
  allocator aStack_103eb;
  allocator aStack_103ea;
  allocator aStack_103e9;
  allocator aStack_103e8;
  allocator aStack_103e7;
  allocator aStack_103e6;
  allocator aStack_103e5;
  allocator aStack_103e4;
  allocator aStack_103e3;
  allocator aStack_103e2;
  allocator aStack_103e1;
  allocator aStack_103e0;
  allocator aStack_103df;
  allocator aStack_103de;
  allocator aStack_103dd;
  allocator aStack_103dc;
  allocator aStack_103db;
  allocator aStack_103da;
  allocator aStack_103d9;
  allocator aStack_103d8;
  allocator aStack_103d7;
  allocator aStack_103d6;
  allocator aStack_103d5;
  allocator aStack_103d4;
  allocator aStack_103d3;
  allocator aStack_103d2;
  allocator aStack_103d1;
  allocator aStack_103d0;
  allocator aStack_103cf;
  allocator aStack_103ce;
  allocator aStack_103cd;
  allocator aStack_103cc;
  allocator aStack_103cb;
  allocator aStack_103ca;
  allocator aStack_103c9;
  allocator aStack_103c8;
  allocator aStack_103c7;
  allocator aStack_103c6;
  allocator aStack_103c5;
  allocator aStack_103c4;
  allocator aStack_103c3;
  allocator aStack_103c2;
  allocator aStack_103c1;
  allocator aStack_103c0;
  allocator aStack_103bf;
  allocator aStack_103be;
  allocator aStack_103bd;
  allocator aStack_103bc;
  allocator aStack_103bb;
  allocator aStack_103ba;
  allocator aStack_103b9;
  allocator aStack_103b8;
  allocator aStack_103b7;
  allocator aStack_103b6;
  allocator aStack_103b5;
  allocator aStack_103b4;
  allocator aStack_103b3;
  allocator aStack_103b2;
  allocator aStack_103b1;
  allocator aStack_103b0;
  allocator aStack_103af;
  allocator aStack_103ae;
  allocator aStack_103ad;
  allocator aStack_103ac;
  allocator aStack_103ab;
  allocator aStack_103aa;
  allocator aStack_103a9;
  allocator aStack_103a8;
  allocator aStack_103a7;
  allocator aStack_103a6;
  allocator aStack_103a5;
  allocator aStack_103a4;
  allocator aStack_103a3;
  allocator aStack_103a2;
  allocator aStack_103a1;
  allocator aStack_103a0;
  allocator aStack_1039f;
  allocator aStack_1039e;
  allocator aStack_1039d;
  allocator aStack_1039c;
  allocator aStack_1039b;
  allocator aStack_1039a;
  allocator aStack_10399;
  allocator aStack_10398;
  allocator aStack_10397;
  allocator aStack_10396;
  allocator aStack_10395;
  allocator aStack_10394;
  allocator aStack_10393;
  allocator aStack_10392;
  allocator aStack_10391;
  allocator aStack_10390;
  allocator aStack_1038f;
  allocator aStack_1038e;
  allocator aStack_1038d;
  allocator aStack_1038c;
  allocator aStack_1038b;
  allocator aStack_1038a;
  allocator aStack_10389;
  allocator aStack_10388;
  allocator aStack_10387;
  allocator aStack_10386;
  allocator aStack_10385;
  allocator aStack_10384;
  allocator aStack_10383;
  allocator aStack_10382;
  allocator aStack_10381;
  allocator aStack_10380;
  allocator aStack_1037f;
  allocator aStack_1037e;
  allocator aStack_1037d;
  allocator aStack_1037c;
  allocator aStack_1037b;
  allocator aStack_1037a;
  allocator aStack_10379;
  allocator aStack_10378;
  allocator aStack_10377;
  allocator aStack_10376;
  allocator aStack_10375;
  allocator aStack_10374;
  allocator aStack_10373;
  allocator aStack_10372;
  allocator aStack_10371;
  allocator aStack_10370;
  allocator aStack_1036f;
  allocator aStack_1036e;
  allocator aStack_1036d;
  allocator aStack_1036c;
  allocator aStack_1036b;
  allocator aStack_1036a;
  allocator aStack_10369;
  allocator aStack_10368;
  allocator aStack_10367;
  allocator aStack_10366;
  allocator aStack_10365;
  allocator aStack_10364;
  allocator aStack_10363;
  allocator aStack_10362;
  allocator aStack_10361;
  allocator aStack_10360;
  allocator aStack_1035f;
  allocator aStack_1035e;
  allocator aStack_1035d;
  allocator aStack_1035c;
  allocator aStack_1035b;
  allocator aStack_1035a;
  allocator aStack_10359;
  allocator aStack_10358;
  allocator aStack_10357;
  allocator aStack_10356;
  allocator aStack_10355;
  allocator aStack_10354;
  allocator aStack_10353;
  allocator aStack_10352;
  allocator aStack_10351;
  allocator aStack_10350;
  allocator aStack_1034f;
  allocator aStack_1034e;
  allocator aStack_1034d;
  allocator aStack_1034c;
  allocator aStack_1034b;
  allocator aStack_1034a;
  allocator aStack_10349;
  allocator aStack_10348;
  allocator aStack_10347;
  allocator aStack_10346;
  allocator aStack_10345;
  allocator aStack_10344;
  allocator aStack_10343;
  allocator aStack_10342;
  allocator aStack_10341;
  allocator aStack_10340;
  allocator aStack_1033f;
  allocator aStack_1033e;
  allocator aStack_1033d;
  allocator aStack_1033c;
  allocator aStack_1033b;
  allocator aStack_1033a;
  allocator aStack_10339;
  allocator aStack_10338;
  allocator aStack_10337;
  allocator aStack_10336;
  allocator aStack_10335;
  allocator aStack_10334;
  allocator aStack_10333;
  allocator aStack_10332;
  allocator aStack_10331;
  allocator aStack_10330;
  allocator aStack_1032f;
  allocator aStack_1032e;
  allocator aStack_1032d;
  allocator aStack_1032c;
  allocator aStack_1032b;
  allocator aStack_1032a;
  allocator aStack_10329;
  allocator aStack_10328;
  allocator aStack_10327;
  allocator aStack_10326;
  allocator aStack_10325;
  allocator aStack_10324;
  allocator aStack_10323;
  allocator aStack_10322;
  allocator aStack_10321;
  allocator aStack_10320;
  allocator aStack_1031f;
  allocator aStack_1031e;
  allocator aStack_1031d;
  allocator aStack_1031c;
  allocator aStack_1031b;
  allocator aStack_1031a;
  allocator aStack_10319;
  allocator aStack_10318;
  allocator aStack_10317;
  allocator aStack_10316;
  allocator aStack_10315;
  allocator aStack_10314;
  allocator aStack_10313;
  allocator aStack_10312;
  allocator aStack_10311;
  allocator aStack_10310;
  allocator aStack_1030f;
  allocator aStack_1030e;
  allocator aStack_1030d;
  allocator aStack_1030c;
  allocator aStack_1030b;
  allocator aStack_1030a;
  allocator aStack_10309;
  allocator aStack_10308;
  allocator aStack_10307;
  allocator aStack_10306;
  allocator aStack_10305;
  allocator aStack_10304;
  allocator aStack_10303;
  allocator aStack_10302;
  allocator aStack_10301;
  allocator aStack_10300;
  allocator aStack_102ff;
  allocator aStack_102fe;
  allocator aStack_102fd;
  allocator aStack_102fc;
  allocator aStack_102fb;
  allocator aStack_102fa;
  allocator aStack_102f9;
  allocator aStack_102f8;
  allocator aStack_102f7;
  allocator aStack_102f6;
  allocator aStack_102f5;
  allocator aStack_102f4;
  allocator aStack_102f3;
  allocator aStack_102f2;
  allocator aStack_102f1;
  allocator aStack_102f0;
  allocator aStack_102ef;
  allocator aStack_102ee;
  allocator aStack_102ed;
  allocator aStack_102ec;
  allocator aStack_102eb;
  allocator aStack_102ea;
  allocator aStack_102e9;
  allocator aStack_102e8;
  allocator aStack_102e7;
  allocator aStack_102e6;
  allocator aStack_102e5;
  allocator aStack_102e4;
  allocator aStack_102e3;
  allocator aStack_102e2;
  allocator aStack_102e1;
  allocator aStack_102e0;
  allocator aStack_102df;
  allocator aStack_102de;
  allocator aStack_102dd;
  allocator aStack_102dc;
  allocator aStack_102db;
  allocator aStack_102da;
  allocator aStack_102d9;
  allocator aStack_102d8;
  allocator aStack_102d7;
  allocator aStack_102d6;
  allocator aStack_102d5;
  allocator aStack_102d4;
  allocator aStack_102d3;
  allocator aStack_102d2;
  allocator aStack_102d1;
  allocator aStack_102d0;
  allocator aStack_102cf;
  allocator aStack_102ce;
  allocator aStack_102cd;
  allocator aStack_102cc;
  allocator aStack_102cb;
  allocator aStack_102ca;
  allocator aStack_102c9;
  allocator aStack_102c8;
  allocator aStack_102c7;
  allocator aStack_102c6;
  allocator aStack_102c5;
  allocator aStack_102c4;
  allocator aStack_102c3;
  allocator aStack_102c2;
  allocator aStack_102c1;
  allocator aStack_102c0;
  allocator aStack_102bf;
  allocator aStack_102be;
  allocator aStack_102bd;
  allocator aStack_102bc;
  allocator aStack_102bb;
  allocator aStack_102ba;
  allocator aStack_102b9;
  allocator aStack_102b8;
  allocator aStack_102b7;
  allocator aStack_102b6;
  allocator aStack_102b5;
  allocator aStack_102b4;
  allocator aStack_102b3;
  allocator aStack_102b2;
  allocator aStack_102b1;
  allocator aStack_102b0;
  allocator aStack_102af;
  allocator aStack_102ae;
  allocator aStack_102ad;
  allocator aStack_102ac;
  allocator aStack_102ab;
  allocator aStack_102aa;
  allocator aStack_102a9;
  allocator aStack_102a8;
  allocator aStack_102a7;
  allocator aStack_102a6;
  allocator aStack_102a5;
  allocator aStack_102a4;
  allocator aStack_102a3;
  allocator aStack_102a2;
  allocator aStack_102a1;
  allocator aStack_102a0;
  allocator aStack_1029f;
  allocator aStack_1029e;
  allocator aStack_1029d;
  allocator aStack_1029c;
  allocator aStack_1029b;
  allocator aStack_1029a;
  allocator aStack_10299;
  allocator aStack_10298;
  allocator aStack_10297;
  allocator aStack_10296;
  allocator aStack_10295;
  allocator aStack_10294;
  allocator aStack_10293;
  allocator aStack_10292;
  allocator aStack_10291;
  allocator aStack_10290;
  allocator aStack_1028f;
  allocator aStack_1028e;
  allocator aStack_1028d;
  allocator aStack_1028c;
  allocator aStack_1028b;
  allocator aStack_1028a;
  allocator aStack_10289;
  allocator aStack_10288;
  allocator aStack_10287;
  allocator aStack_10286;
  allocator aStack_10285;
  allocator aStack_10284;
  allocator aStack_10283;
  allocator aStack_10282;
  allocator aStack_10281;
  allocator aStack_10280;
  allocator aStack_1027f;
  allocator aStack_1027e;
  allocator aStack_1027d;
  allocator aStack_1027c;
  allocator aStack_1027b;
  allocator aStack_1027a;
  allocator aStack_10279;
  allocator aStack_10278;
  allocator aStack_10277;
  allocator aStack_10276;
  allocator aStack_10275;
  allocator aStack_10274;
  allocator aStack_10273;
  allocator aStack_10272;
  allocator aStack_10271;
  allocator aStack_10270;
  allocator aStack_1026f;
  allocator aStack_1026e;
  allocator aStack_1026d;
  allocator aStack_1026c;
  allocator aStack_1026b;
  allocator aStack_1026a;
  allocator aStack_10269;
  allocator aStack_10268;
  allocator aStack_10267;
  allocator aStack_10266;
  allocator aStack_10265;
  allocator aStack_10264;
  allocator aStack_10263;
  allocator aStack_10262;
  allocator aStack_10261;
  allocator aStack_10260;
  allocator aStack_1025f;
  allocator aStack_1025e;
  allocator aStack_1025d;
  allocator aStack_1025c;
  allocator aStack_1025b;
  allocator aStack_1025a;
  allocator aStack_10259;
  allocator aStack_10258;
  allocator aStack_10257;
  allocator aStack_10256;
  allocator aStack_10255;
  allocator aStack_10254;
  allocator aStack_10253;
  allocator aStack_10252;
  allocator aStack_10251;
  allocator aStack_10250;
  allocator aStack_1024f;
  allocator aStack_1024e;
  allocator aStack_1024d;
  allocator aStack_1024c;
  allocator aStack_1024b;
  allocator aStack_1024a;
  allocator aStack_10249;
  allocator aStack_10248;
  allocator aStack_10247;
  allocator aStack_10246;
  allocator aStack_10245;
  allocator aStack_10244;
  allocator aStack_10243;
  allocator aStack_10242;
  allocator aStack_10241;
  allocator aStack_10240;
  allocator aStack_1023f;
  allocator aStack_1023e;
  allocator aStack_1023d;
  allocator aStack_1023c;
  allocator aStack_1023b;
  allocator aStack_1023a;
  allocator aStack_10239;
  allocator aStack_10238;
  allocator aStack_10237;
  allocator aStack_10236;
  allocator aStack_10235;
  allocator aStack_10234;
  allocator aStack_10233;
  allocator aStack_10232;
  allocator aStack_10231;
  allocator aStack_10230;
  allocator aStack_1022f;
  allocator aStack_1022e;
  allocator aStack_1022d;
  allocator aStack_1022c;
  allocator aStack_1022b;
  allocator aStack_1022a;
  allocator aStack_10229;
  allocator aStack_10228;
  allocator aStack_10227;
  allocator aStack_10226;
  allocator aStack_10225;
  allocator aStack_10224;
  allocator aStack_10223;
  allocator aStack_10222;
  allocator aStack_10221;
  allocator aStack_10220;
  allocator aStack_1021f;
  allocator aStack_1021e;
  allocator aStack_1021d;
  allocator aStack_1021c;
  allocator aStack_1021b;
  allocator aStack_1021a;
  allocator aStack_10219;
  allocator aStack_10218;
  allocator aStack_10217;
  allocator aStack_10216;
  allocator aStack_10215;
  allocator aStack_10214;
  allocator aStack_10213;
  allocator aStack_10212;
  allocator aStack_10211;
  allocator aStack_10210;
  allocator aStack_1020f;
  allocator aStack_1020e;
  allocator aStack_1020d;
  allocator aStack_1020c;
  allocator aStack_1020b;
  allocator aStack_1020a;
  allocator aStack_10209;
  allocator aStack_10208;
  allocator aStack_10207;
  allocator aStack_10206;
  allocator aStack_10205;
  allocator aStack_10204;
  allocator aStack_10203;
  allocator aStack_10202;
  allocator aStack_10201;
  allocator aStack_10200;
  allocator aStack_101ff;
  allocator aStack_101fe;
  allocator aStack_101fd;
  allocator aStack_101fc;
  allocator aStack_101fb;
  allocator aStack_101fa;
  allocator aStack_101f9;
  allocator aStack_101f8;
  allocator aStack_101f7;
  allocator aStack_101f6;
  allocator aStack_101f5;
  allocator aStack_101f4;
  allocator aStack_101f3;
  allocator aStack_101f2;
  allocator aStack_101f1;
  allocator aStack_101f0;
  allocator aStack_101ef;
  allocator aStack_101ee;
  allocator aStack_101ed;
  allocator aStack_101ec;
  allocator aStack_101eb;
  allocator aStack_101ea;
  allocator aStack_101e9;
  allocator aStack_101e8;
  allocator aStack_101e7;
  allocator aStack_101e6;
  allocator aStack_101e5;
  allocator aStack_101e4;
  allocator aStack_101e3;
  allocator aStack_101e2;
  allocator aStack_101e1;
  allocator aStack_101e0;
  allocator aStack_101df;
  allocator aStack_101de;
  allocator aStack_101dd;
  allocator aStack_101dc;
  allocator aStack_101db;
  allocator aStack_101da;
  allocator aStack_101d9;
  allocator aStack_101d8;
  allocator aStack_101d7;
  allocator aStack_101d6;
  allocator aStack_101d5;
  allocator aStack_101d4;
  allocator aStack_101d3;
  allocator aStack_101d2;
  allocator aStack_101d1;
  allocator aStack_101d0;
  allocator aStack_101cf;
  allocator aStack_101ce;
  allocator aStack_101cd;
  allocator aStack_101cc;
  allocator aStack_101cb;
  allocator aStack_101ca;
  allocator aStack_101c9;
  allocator aStack_101c8;
  allocator aStack_101c7;
  allocator aStack_101c6;
  allocator aStack_101c5;
  allocator aStack_101c4;
  allocator aStack_101c3;
  allocator aStack_101c2;
  allocator aStack_101c1;
  allocator aStack_101c0;
  allocator aStack_101bf;
  allocator aStack_101be;
  allocator aStack_101bd;
  allocator aStack_101bc;
  allocator aStack_101bb;
  allocator aStack_101ba;
  allocator aStack_101b9;
  allocator aStack_101b8;
  allocator aStack_101b7;
  allocator aStack_101b6;
  allocator aStack_101b5;
  allocator aStack_101b4;
  allocator aStack_101b3;
  allocator aStack_101b2;
  allocator aStack_101b1;
  allocator aStack_101b0;
  allocator aStack_101af;
  allocator aStack_101ae;
  allocator aStack_101ad;
  allocator aStack_101ac;
  allocator aStack_101ab;
  allocator aStack_101aa;
  allocator aStack_101a9;
  allocator aStack_101a8;
  allocator aStack_101a7;
  allocator aStack_101a6;
  allocator aStack_101a5;
  allocator aStack_101a4;
  allocator aStack_101a3;
  allocator aStack_101a2;
  allocator aStack_101a1;
  allocator aStack_101a0;
  allocator aStack_1019f;
  allocator aStack_1019e;
  allocator aStack_1019d;
  allocator aStack_1019c;
  allocator aStack_1019b;
  allocator aStack_1019a;
  allocator aStack_10199;
  allocator aStack_10198;
  allocator aStack_10197;
  allocator aStack_10196;
  allocator aStack_10195;
  allocator aStack_10194;
  allocator aStack_10193;
  allocator aStack_10192;
  allocator aStack_10191;
  allocator aStack_10190;
  allocator aStack_1018f;
  allocator aStack_1018e;
  allocator aStack_1018d;
  allocator aStack_1018c;
  allocator aStack_1018b;
  allocator aStack_1018a;
  allocator aStack_10189;
  allocator aStack_10188;
  allocator aStack_10187;
  allocator aStack_10186;
  allocator aStack_10185;
  allocator aStack_10184;
  allocator aStack_10183;
  allocator aStack_10182;
  allocator aStack_10181;
  allocator aStack_10180;
  allocator aStack_1017f;
  allocator aStack_1017e;
  allocator aStack_1017d;
  allocator aStack_1017c;
  allocator aStack_1017b;
  allocator aStack_1017a;
  allocator aStack_10179;
  allocator aStack_10178;
  allocator aStack_10177;
  allocator aStack_10176;
  allocator aStack_10175;
  allocator aStack_10174;
  allocator aStack_10173;
  allocator aStack_10172;
  allocator aStack_10171;
  allocator aStack_10170;
  allocator aStack_1016f;
  allocator aStack_1016e;
  allocator aStack_1016d;
  allocator aStack_1016c;
  allocator aStack_1016b;
  allocator aStack_1016a;
  allocator aStack_10169;
  allocator aStack_10168;
  allocator aStack_10167;
  allocator aStack_10166;
  allocator aStack_10165;
  allocator aStack_10164;
  allocator aStack_10163;
  allocator aStack_10162;
  allocator aStack_10161;
  allocator aStack_10160;
  allocator aStack_1015f;
  allocator aStack_1015e;
  allocator aStack_1015d;
  allocator aStack_1015c;
  allocator aStack_1015b;
  allocator aStack_1015a;
  allocator aStack_10159;
  allocator aStack_10158;
  allocator aStack_10157;
  allocator aStack_10156;
  allocator aStack_10155;
  allocator aStack_10154;
  allocator aStack_10153;
  allocator aStack_10152;
  allocator aStack_10151;
  allocator aStack_10150;
  allocator aStack_1014f;
  allocator aStack_1014e;
  allocator aStack_1014d;
  allocator aStack_1014c;
  allocator aStack_1014b;
  allocator aStack_1014a;
  allocator aStack_10149;
  allocator aStack_10148;
  allocator aStack_10147;
  allocator aStack_10146;
  allocator aStack_10145;
  allocator aStack_10144;
  allocator aStack_10143;
  allocator aStack_10142;
  allocator aStack_10141;
  allocator aStack_10140;
  allocator aStack_1013f;
  allocator aStack_1013e;
  allocator aStack_1013d;
  allocator aStack_1013c;
  allocator aStack_1013b;
  allocator aStack_1013a;
  allocator aStack_10139;
  allocator aStack_10138;
  allocator aStack_10137;
  allocator aStack_10136;
  allocator aStack_10135;
  allocator aStack_10134;
  allocator aStack_10133;
  allocator aStack_10132;
  allocator aStack_10131;
  allocator aStack_10130;
  allocator aStack_1012f;
  allocator aStack_1012e;
  allocator aStack_1012d;
  allocator aStack_1012c;
  allocator aStack_1012b;
  allocator aStack_1012a;
  allocator aStack_10129;
  allocator aStack_10128;
  allocator aStack_10127;
  allocator aStack_10126;
  allocator aStack_10125;
  allocator aStack_10124;
  allocator aStack_10123;
  allocator aStack_10122;
  allocator aStack_10121;
  allocator aStack_10120;
  allocator aStack_1011f;
  allocator aStack_1011e;
  allocator aStack_1011d;
  allocator aStack_1011c;
  allocator aStack_1011b;
  allocator aStack_1011a;
  allocator aStack_10119;
  allocator aStack_10118;
  allocator aStack_10117;
  allocator aStack_10116;
  allocator aStack_10115;
  allocator aStack_10114;
  allocator aStack_10113;
  allocator aStack_10112;
  allocator aStack_10111;
  allocator aStack_10110;
  allocator aStack_1010f;
  allocator aStack_1010e;
  allocator aStack_1010d;
  allocator aStack_1010c;
  allocator aStack_1010b;
  allocator aStack_1010a;
  allocator aStack_10109;
  allocator aStack_10108;
  allocator aStack_10107;
  allocator aStack_10106;
  allocator aStack_10105;
  allocator aStack_10104;
  allocator aStack_10103;
  allocator aStack_10102;
  allocator aStack_10101;
  allocator aStack_10100;
  allocator aStack_100ff;
  allocator aStack_100fe;
  allocator aStack_100fd;
  allocator aStack_100fc;
  allocator aStack_100fb;
  allocator aStack_100fa;
  allocator aStack_100f9;
  allocator aStack_100f8;
  allocator aStack_100f7;
  allocator aStack_100f6;
  allocator aStack_100f5;
  allocator aStack_100f4;
  allocator aStack_100f3;
  allocator aStack_100f2;
  allocator aStack_100f1;
  allocator aStack_100f0;
  allocator aStack_100ef;
  allocator aStack_100ee;
  allocator aStack_100ed;
  allocator aStack_100ec;
  allocator aStack_100eb;
  allocator aStack_100ea;
  allocator aStack_100e9;
  allocator aStack_100e8;
  allocator aStack_100e7;
  allocator aStack_100e6;
  allocator aStack_100e5;
  allocator aStack_100e4;
  allocator aStack_100e3;
  allocator aStack_100e2;
  allocator aStack_100e1;
  allocator aStack_100e0;
  allocator aStack_100df;
  allocator aStack_100de;
  allocator aStack_100dd;
  allocator aStack_100dc;
  allocator aStack_100db;
  allocator aStack_100da;
  allocator aStack_100d9;
  allocator aStack_100d8;
  allocator aStack_100d7;
  allocator aStack_100d6;
  allocator aStack_100d5;
  allocator aStack_100d4;
  allocator aStack_100d3;
  allocator aStack_100d2;
  allocator aStack_100d1;
  allocator aStack_100d0;
  allocator aStack_100cf;
  allocator aStack_100ce;
  allocator aStack_100cd;
  allocator aStack_100cc;
  allocator aStack_100cb;
  allocator aStack_100ca;
  allocator aStack_100c9;
  allocator aStack_100c8;
  allocator aStack_100c7;
  allocator aStack_100c6;
  allocator aStack_100c5;
  allocator aStack_100c4;
  allocator aStack_100c3;
  allocator aStack_100c2;
  allocator aStack_100c1;
  allocator aStack_100c0;
  allocator aStack_100bf;
  allocator aStack_100be;
  allocator aStack_100bd;
  allocator aStack_100bc;
  allocator aStack_100bb;
  allocator aStack_100ba;
  allocator aStack_100b9;
  allocator aStack_100b8;
  allocator aStack_100b7;
  allocator aStack_100b6;
  allocator aStack_100b5;
  allocator aStack_100b4;
  allocator aStack_100b3;
  allocator aStack_100b2;
  allocator aStack_100b1;
  allocator aStack_100b0;
  allocator aStack_100af;
  allocator aStack_100ae;
  allocator aStack_100ad;
  allocator aStack_100ac;
  allocator aStack_100ab;
  allocator aStack_100aa;
  allocator aStack_100a9;
  allocator aStack_100a8;
  allocator aStack_100a7;
  allocator aStack_100a6;
  allocator aStack_100a5;
  allocator aStack_100a4;
  allocator aStack_100a3;
  allocator aStack_100a2;
  allocator aStack_100a1;
  allocator aStack_100a0;
  allocator aStack_1009f;
  allocator aStack_1009e;
  allocator aStack_1009d;
  allocator aStack_1009c;
  allocator aStack_1009b;
  allocator aStack_1009a;
  allocator aStack_10099;
  allocator aStack_10098;
  allocator aStack_10097;
  allocator aStack_10096;
  allocator aStack_10095;
  allocator aStack_10094;
  allocator aStack_10093;
  allocator aStack_10092;
  allocator aStack_10091;
  allocator aStack_10090;
  allocator aStack_1008f;
  allocator aStack_1008e;
  allocator aStack_1008d;
  allocator aStack_1008c;
  allocator aStack_1008b;
  allocator aStack_1008a;
  allocator aStack_10089;
  allocator aStack_10088;
  allocator aStack_10087;
  allocator aStack_10086;
  allocator aStack_10085;
  allocator aStack_10084;
  allocator aStack_10083;
  allocator aStack_10082;
  allocator aStack_10081;
  allocator aStack_10080;
  allocator aStack_1007f;
  allocator aStack_1007e;
  allocator aStack_1007d;
  allocator aStack_1007c;
  allocator aStack_1007b;
  allocator aStack_1007a;
  allocator aStack_10079;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  actual_wordlist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expect_en_words;
  string language;
  string local_10000 [32];
  string local_ffe0 [32];
  string local_ffc0 [32];
  string local_ffa0 [32];
  string local_ff80 [32];
  string local_ff60 [32];
  string local_ff40 [32];
  string local_ff20 [32];
  string local_ff00 [32];
  string local_fee0 [32];
  string local_fec0 [32];
  string local_fea0 [32];
  string local_fe80 [32];
  string local_fe60 [32];
  string local_fe40 [32];
  string local_fe20 [32];
  string local_fe00 [32];
  string local_fde0 [32];
  string local_fdc0 [32];
  string local_fda0 [32];
  string local_fd80 [32];
  string local_fd60 [32];
  string local_fd40 [32];
  string local_fd20 [32];
  string local_fd00 [32];
  string local_fce0 [32];
  string local_fcc0 [32];
  string local_fca0 [32];
  string local_fc80 [32];
  string local_fc60 [32];
  string local_fc40 [32];
  string local_fc20 [32];
  string local_fc00 [32];
  string local_fbe0 [32];
  string local_fbc0 [32];
  string local_fba0 [32];
  string local_fb80 [32];
  string local_fb60 [32];
  string local_fb40 [32];
  string local_fb20 [32];
  string local_fb00 [32];
  string local_fae0 [32];
  string local_fac0 [32];
  string local_faa0 [32];
  string local_fa80 [32];
  string local_fa60 [32];
  string local_fa40 [32];
  string local_fa20 [32];
  string local_fa00 [32];
  string local_f9e0 [32];
  string local_f9c0 [32];
  string local_f9a0 [32];
  string local_f980 [32];
  string local_f960 [32];
  string local_f940 [32];
  string local_f920 [32];
  string local_f900 [32];
  string local_f8e0 [32];
  string local_f8c0 [32];
  string local_f8a0 [32];
  string local_f880 [32];
  string local_f860 [32];
  string local_f840 [32];
  string local_f820 [32];
  string local_f800 [32];
  string local_f7e0 [32];
  string local_f7c0 [32];
  string local_f7a0 [32];
  string local_f780 [32];
  string local_f760 [32];
  string local_f740 [32];
  string local_f720 [32];
  string local_f700 [32];
  string local_f6e0 [32];
  string local_f6c0 [32];
  string local_f6a0 [32];
  string local_f680 [32];
  string local_f660 [32];
  string local_f640 [32];
  string local_f620 [32];
  string local_f600 [32];
  string local_f5e0 [32];
  string local_f5c0 [32];
  string local_f5a0 [32];
  string local_f580 [32];
  string local_f560 [32];
  string local_f540 [32];
  string local_f520 [32];
  string local_f500 [32];
  string local_f4e0 [32];
  string local_f4c0 [32];
  string local_f4a0 [32];
  string local_f480 [32];
  string local_f460 [32];
  string local_f440 [32];
  string local_f420 [32];
  string local_f400 [32];
  string local_f3e0 [32];
  string local_f3c0 [32];
  string local_f3a0 [32];
  string local_f380 [32];
  string local_f360 [32];
  string local_f340 [32];
  string local_f320 [32];
  string local_f300 [32];
  string local_f2e0 [32];
  string local_f2c0 [32];
  string local_f2a0 [32];
  string local_f280 [32];
  string local_f260 [32];
  string local_f240 [32];
  string local_f220 [32];
  string local_f200 [32];
  string local_f1e0 [32];
  string local_f1c0 [32];
  string local_f1a0 [32];
  string local_f180 [32];
  string local_f160 [32];
  string local_f140 [32];
  string local_f120 [32];
  string local_f100 [32];
  string local_f0e0 [32];
  string local_f0c0 [32];
  string local_f0a0 [32];
  string local_f080 [32];
  string local_f060 [32];
  string local_f040 [32];
  string local_f020 [32];
  string local_f000 [32];
  string local_efe0 [32];
  string local_efc0 [32];
  string local_efa0 [32];
  string local_ef80 [32];
  string local_ef60 [32];
  string local_ef40 [32];
  string local_ef20 [32];
  string local_ef00 [32];
  string local_eee0 [32];
  string local_eec0 [32];
  string local_eea0 [32];
  string local_ee80 [32];
  string local_ee60 [32];
  string local_ee40 [32];
  string local_ee20 [32];
  string local_ee00 [32];
  string local_ede0 [32];
  string local_edc0 [32];
  string local_eda0 [32];
  string local_ed80 [32];
  string local_ed60 [32];
  string local_ed40 [32];
  string local_ed20 [32];
  string local_ed00 [32];
  string local_ece0 [32];
  string local_ecc0 [32];
  string local_eca0 [32];
  string local_ec80 [32];
  string local_ec60 [32];
  string local_ec40 [32];
  string local_ec20 [32];
  string local_ec00 [32];
  string local_ebe0 [32];
  string local_ebc0 [32];
  string local_eba0 [32];
  string local_eb80 [32];
  string local_eb60 [32];
  string local_eb40 [32];
  string local_eb20 [32];
  string local_eb00 [32];
  string local_eae0 [32];
  string local_eac0 [32];
  string local_eaa0 [32];
  string local_ea80 [32];
  string local_ea60 [32];
  string local_ea40 [32];
  string local_ea20 [32];
  string local_ea00 [32];
  string local_e9e0 [32];
  string local_e9c0 [32];
  string local_e9a0 [32];
  string local_e980 [32];
  string local_e960 [32];
  string local_e940 [32];
  string local_e920 [32];
  string local_e900 [32];
  string local_e8e0 [32];
  string local_e8c0 [32];
  string local_e8a0 [32];
  string local_e880 [32];
  string local_e860 [32];
  string local_e840 [32];
  string local_e820 [32];
  string local_e800 [32];
  string local_e7e0 [32];
  string local_e7c0 [32];
  string local_e7a0 [32];
  string local_e780 [32];
  string local_e760 [32];
  string local_e740 [32];
  string local_e720 [32];
  string local_e700 [32];
  string local_e6e0 [32];
  string local_e6c0 [32];
  string local_e6a0 [32];
  string local_e680 [32];
  string local_e660 [32];
  string local_e640 [32];
  string local_e620 [32];
  string local_e600 [32];
  string local_e5e0 [32];
  string local_e5c0 [32];
  string local_e5a0 [32];
  string local_e580 [32];
  string local_e560 [32];
  string local_e540 [32];
  string local_e520 [32];
  string local_e500 [32];
  string local_e4e0 [32];
  string local_e4c0 [32];
  string local_e4a0 [32];
  string local_e480 [32];
  string local_e460 [32];
  string local_e440 [32];
  string local_e420 [32];
  string local_e400 [32];
  string local_e3e0 [32];
  string local_e3c0 [32];
  string local_e3a0 [32];
  string local_e380 [32];
  string local_e360 [32];
  string local_e340 [32];
  string local_e320 [32];
  string local_e300 [32];
  string local_e2e0 [32];
  string local_e2c0 [32];
  string local_e2a0 [32];
  string local_e280 [32];
  string local_e260 [32];
  string local_e240 [32];
  string local_e220 [32];
  string local_e200 [32];
  string local_e1e0 [32];
  string local_e1c0 [32];
  string local_e1a0 [32];
  string local_e180 [32];
  string local_e160 [32];
  string local_e140 [32];
  string local_e120 [32];
  string local_e100 [32];
  string local_e0e0 [32];
  string local_e0c0 [32];
  string local_e0a0 [32];
  string local_e080 [32];
  string local_e060 [32];
  string local_e040 [32];
  string local_e020 [32];
  string local_e000 [32];
  string local_dfe0 [32];
  string local_dfc0 [32];
  string local_dfa0 [32];
  string local_df80 [32];
  string local_df60 [32];
  string local_df40 [32];
  string local_df20 [32];
  string local_df00 [32];
  string local_dee0 [32];
  string local_dec0 [32];
  string local_dea0 [32];
  string local_de80 [32];
  string local_de60 [32];
  string local_de40 [32];
  string local_de20 [32];
  string local_de00 [32];
  string local_dde0 [32];
  string local_ddc0 [32];
  string local_dda0 [32];
  string local_dd80 [32];
  string local_dd60 [32];
  string local_dd40 [32];
  string local_dd20 [32];
  string local_dd00 [32];
  string local_dce0 [32];
  string local_dcc0 [32];
  string local_dca0 [32];
  string local_dc80 [32];
  string local_dc60 [32];
  string local_dc40 [32];
  string local_dc20 [32];
  string local_dc00 [32];
  string local_dbe0 [32];
  string local_dbc0 [32];
  string local_dba0 [32];
  string local_db80 [32];
  string local_db60 [32];
  string local_db40 [32];
  string local_db20 [32];
  string local_db00 [32];
  string local_dae0 [32];
  string local_dac0 [32];
  string local_daa0 [32];
  string local_da80 [32];
  string local_da60 [32];
  string local_da40 [32];
  string local_da20 [32];
  string local_da00 [32];
  string local_d9e0 [32];
  string local_d9c0 [32];
  string local_d9a0 [32];
  string local_d980 [32];
  string local_d960 [32];
  string local_d940 [32];
  string local_d920 [32];
  string local_d900 [32];
  string local_d8e0 [32];
  string local_d8c0 [32];
  string local_d8a0 [32];
  string local_d880 [32];
  string local_d860 [32];
  string local_d840 [32];
  string local_d820 [32];
  string local_d800 [32];
  string local_d7e0 [32];
  string local_d7c0 [32];
  string local_d7a0 [32];
  string local_d780 [32];
  string local_d760 [32];
  string local_d740 [32];
  string local_d720 [32];
  string local_d700 [32];
  string local_d6e0 [32];
  string local_d6c0 [32];
  string local_d6a0 [32];
  string local_d680 [32];
  string local_d660 [32];
  string local_d640 [32];
  string local_d620 [32];
  string local_d600 [32];
  string local_d5e0 [32];
  string local_d5c0 [32];
  string local_d5a0 [32];
  string local_d580 [32];
  string local_d560 [32];
  string local_d540 [32];
  string local_d520 [32];
  string local_d500 [32];
  string local_d4e0 [32];
  string local_d4c0 [32];
  string local_d4a0 [32];
  string local_d480 [32];
  string local_d460 [32];
  string local_d440 [32];
  string local_d420 [32];
  string local_d400 [32];
  string local_d3e0 [32];
  string local_d3c0 [32];
  string local_d3a0 [32];
  string local_d380 [32];
  string local_d360 [32];
  string local_d340 [32];
  string local_d320 [32];
  string local_d300 [32];
  string local_d2e0 [32];
  string local_d2c0 [32];
  string local_d2a0 [32];
  string local_d280 [32];
  string local_d260 [32];
  string local_d240 [32];
  string local_d220 [32];
  string local_d200 [32];
  string local_d1e0 [32];
  string local_d1c0 [32];
  string local_d1a0 [32];
  string local_d180 [32];
  string local_d160 [32];
  string local_d140 [32];
  string local_d120 [32];
  string local_d100 [32];
  string local_d0e0 [32];
  string local_d0c0 [32];
  string local_d0a0 [32];
  string local_d080 [32];
  string local_d060 [32];
  string local_d040 [32];
  string local_d020 [32];
  string local_d000 [32];
  string local_cfe0 [32];
  string local_cfc0 [32];
  string local_cfa0 [32];
  string local_cf80 [32];
  string local_cf60 [32];
  string local_cf40 [32];
  string local_cf20 [32];
  string local_cf00 [32];
  string local_cee0 [32];
  string local_cec0 [32];
  string local_cea0 [32];
  string local_ce80 [32];
  string local_ce60 [32];
  string local_ce40 [32];
  string local_ce20 [32];
  string local_ce00 [32];
  string local_cde0 [32];
  string local_cdc0 [32];
  string local_cda0 [32];
  string local_cd80 [32];
  string local_cd60 [32];
  string local_cd40 [32];
  string local_cd20 [32];
  string local_cd00 [32];
  string local_cce0 [32];
  string local_ccc0 [32];
  string local_cca0 [32];
  string local_cc80 [32];
  string local_cc60 [32];
  string local_cc40 [32];
  string local_cc20 [32];
  string local_cc00 [32];
  string local_cbe0 [32];
  string local_cbc0 [32];
  string local_cba0 [32];
  string local_cb80 [32];
  string local_cb60 [32];
  string local_cb40 [32];
  string local_cb20 [32];
  string local_cb00 [32];
  string local_cae0 [32];
  string local_cac0 [32];
  string local_caa0 [32];
  string local_ca80 [32];
  string local_ca60 [32];
  string local_ca40 [32];
  string local_ca20 [32];
  string local_ca00 [32];
  string local_c9e0 [32];
  string local_c9c0 [32];
  string local_c9a0 [32];
  string local_c980 [32];
  string local_c960 [32];
  string local_c940 [32];
  string local_c920 [32];
  string local_c900 [32];
  string local_c8e0 [32];
  string local_c8c0 [32];
  string local_c8a0 [32];
  string local_c880 [32];
  string local_c860 [32];
  string local_c840 [32];
  string local_c820 [32];
  string local_c800 [32];
  string local_c7e0 [32];
  string local_c7c0 [32];
  string local_c7a0 [32];
  string local_c780 [32];
  string local_c760 [32];
  string local_c740 [32];
  string local_c720 [32];
  string local_c700 [32];
  string local_c6e0 [32];
  string local_c6c0 [32];
  string local_c6a0 [32];
  string local_c680 [32];
  string local_c660 [32];
  string local_c640 [32];
  string local_c620 [32];
  string local_c600 [32];
  string local_c5e0 [32];
  string local_c5c0 [32];
  string local_c5a0 [32];
  string local_c580 [32];
  string local_c560 [32];
  string local_c540 [32];
  string local_c520 [32];
  string local_c500 [32];
  string local_c4e0 [32];
  string local_c4c0 [32];
  string local_c4a0 [32];
  string local_c480 [32];
  string local_c460 [32];
  string local_c440 [32];
  string local_c420 [32];
  string local_c400 [32];
  string local_c3e0 [32];
  string local_c3c0 [32];
  string local_c3a0 [32];
  string local_c380 [32];
  string local_c360 [32];
  string local_c340 [32];
  string local_c320 [32];
  string local_c300 [32];
  string local_c2e0 [32];
  string local_c2c0 [32];
  string local_c2a0 [32];
  string local_c280 [32];
  string local_c260 [32];
  string local_c240 [32];
  string local_c220 [32];
  string local_c200 [32];
  string local_c1e0 [32];
  string local_c1c0 [32];
  string local_c1a0 [32];
  string local_c180 [32];
  string local_c160 [32];
  string local_c140 [32];
  string local_c120 [32];
  string local_c100 [32];
  string local_c0e0 [32];
  string local_c0c0 [32];
  string local_c0a0 [32];
  string local_c080 [32];
  string local_c060 [32];
  string local_c040 [32];
  string local_c020 [32];
  string local_c000 [32];
  string local_bfe0 [32];
  string local_bfc0 [32];
  string local_bfa0 [32];
  string local_bf80 [32];
  string local_bf60 [32];
  string local_bf40 [32];
  string local_bf20 [32];
  string local_bf00 [32];
  string local_bee0 [32];
  string local_bec0 [32];
  string local_bea0 [32];
  string local_be80 [32];
  string local_be60 [32];
  string local_be40 [32];
  string local_be20 [32];
  string local_be00 [32];
  string local_bde0 [32];
  string local_bdc0 [32];
  string local_bda0 [32];
  string local_bd80 [32];
  string local_bd60 [32];
  string local_bd40 [32];
  string local_bd20 [32];
  string local_bd00 [32];
  string local_bce0 [32];
  string local_bcc0 [32];
  string local_bca0 [32];
  string local_bc80 [32];
  string local_bc60 [32];
  string local_bc40 [32];
  string local_bc20 [32];
  string local_bc00 [32];
  string local_bbe0 [32];
  string local_bbc0 [32];
  string local_bba0 [32];
  string local_bb80 [32];
  string local_bb60 [32];
  string local_bb40 [32];
  string local_bb20 [32];
  string local_bb00 [32];
  string local_bae0 [32];
  string local_bac0 [32];
  string local_baa0 [32];
  string local_ba80 [32];
  string local_ba60 [32];
  string local_ba40 [32];
  string local_ba20 [32];
  string local_ba00 [32];
  string local_b9e0 [32];
  string local_b9c0 [32];
  string local_b9a0 [32];
  string local_b980 [32];
  string local_b960 [32];
  string local_b940 [32];
  string local_b920 [32];
  string local_b900 [32];
  string local_b8e0 [32];
  string local_b8c0 [32];
  string local_b8a0 [32];
  string local_b880 [32];
  string local_b860 [32];
  string local_b840 [32];
  string local_b820 [32];
  string local_b800 [32];
  string local_b7e0 [32];
  string local_b7c0 [32];
  string local_b7a0 [32];
  string local_b780 [32];
  string local_b760 [32];
  string local_b740 [32];
  string local_b720 [32];
  string local_b700 [32];
  string local_b6e0 [32];
  string local_b6c0 [32];
  string local_b6a0 [32];
  string local_b680 [32];
  string local_b660 [32];
  string local_b640 [32];
  string local_b620 [32];
  string local_b600 [32];
  string local_b5e0 [32];
  string local_b5c0 [32];
  string local_b5a0 [32];
  string local_b580 [32];
  string local_b560 [32];
  string local_b540 [32];
  string local_b520 [32];
  string local_b500 [32];
  string local_b4e0 [32];
  string local_b4c0 [32];
  string local_b4a0 [32];
  string local_b480 [32];
  string local_b460 [32];
  string local_b440 [32];
  string local_b420 [32];
  string local_b400 [32];
  string local_b3e0 [32];
  string local_b3c0 [32];
  string local_b3a0 [32];
  string local_b380 [32];
  string local_b360 [32];
  string local_b340 [32];
  string local_b320 [32];
  string local_b300 [32];
  string local_b2e0 [32];
  string local_b2c0 [32];
  string local_b2a0 [32];
  string local_b280 [32];
  string local_b260 [32];
  string local_b240 [32];
  string local_b220 [32];
  string local_b200 [32];
  string local_b1e0 [32];
  string local_b1c0 [32];
  string local_b1a0 [32];
  string local_b180 [32];
  string local_b160 [32];
  string local_b140 [32];
  string local_b120 [32];
  string local_b100 [32];
  string local_b0e0 [32];
  string local_b0c0 [32];
  string local_b0a0 [32];
  string local_b080 [32];
  string local_b060 [32];
  string local_b040 [32];
  string local_b020 [32];
  string local_b000 [32];
  string local_afe0 [32];
  string local_afc0 [32];
  string local_afa0 [32];
  string local_af80 [32];
  string local_af60 [32];
  string local_af40 [32];
  string local_af20 [32];
  string local_af00 [32];
  string local_aee0 [32];
  string local_aec0 [32];
  string local_aea0 [32];
  string local_ae80 [32];
  string local_ae60 [32];
  string local_ae40 [32];
  string local_ae20 [32];
  string local_ae00 [32];
  string local_ade0 [32];
  string local_adc0 [32];
  string local_ada0 [32];
  string local_ad80 [32];
  string local_ad60 [32];
  string local_ad40 [32];
  string local_ad20 [32];
  string local_ad00 [32];
  string local_ace0 [32];
  string local_acc0 [32];
  string local_aca0 [32];
  string local_ac80 [32];
  string local_ac60 [32];
  string local_ac40 [32];
  string local_ac20 [32];
  string local_ac00 [32];
  string local_abe0 [32];
  string local_abc0 [32];
  string local_aba0 [32];
  string local_ab80 [32];
  string local_ab60 [32];
  string local_ab40 [32];
  string local_ab20 [32];
  string local_ab00 [32];
  string local_aae0 [32];
  string local_aac0 [32];
  string local_aaa0 [32];
  string local_aa80 [32];
  string local_aa60 [32];
  string local_aa40 [32];
  string local_aa20 [32];
  string local_aa00 [32];
  string local_a9e0 [32];
  string local_a9c0 [32];
  string local_a9a0 [32];
  string local_a980 [32];
  string local_a960 [32];
  string local_a940 [32];
  string local_a920 [32];
  string local_a900 [32];
  string local_a8e0 [32];
  string local_a8c0 [32];
  string local_a8a0 [32];
  string local_a880 [32];
  string local_a860 [32];
  string local_a840 [32];
  string local_a820 [32];
  string local_a800 [32];
  string local_a7e0 [32];
  string local_a7c0 [32];
  string local_a7a0 [32];
  string local_a780 [32];
  string local_a760 [32];
  string local_a740 [32];
  string local_a720 [32];
  string local_a700 [32];
  string local_a6e0 [32];
  string local_a6c0 [32];
  string local_a6a0 [32];
  string local_a680 [32];
  string local_a660 [32];
  string local_a640 [32];
  string local_a620 [32];
  string local_a600 [32];
  string local_a5e0 [32];
  string local_a5c0 [32];
  string local_a5a0 [32];
  string local_a580 [32];
  string local_a560 [32];
  string local_a540 [32];
  string local_a520 [32];
  string local_a500 [32];
  string local_a4e0 [32];
  string local_a4c0 [32];
  string local_a4a0 [32];
  string local_a480 [32];
  string local_a460 [32];
  string local_a440 [32];
  string local_a420 [32];
  string local_a400 [32];
  string local_a3e0 [32];
  string local_a3c0 [32];
  string local_a3a0 [32];
  string local_a380 [32];
  string local_a360 [32];
  string local_a340 [32];
  string local_a320 [32];
  string local_a300 [32];
  string local_a2e0 [32];
  string local_a2c0 [32];
  string local_a2a0 [32];
  string local_a280 [32];
  string local_a260 [32];
  string local_a240 [32];
  string local_a220 [32];
  string local_a200 [32];
  string local_a1e0 [32];
  string local_a1c0 [32];
  string local_a1a0 [32];
  string local_a180 [32];
  string local_a160 [32];
  string local_a140 [32];
  string local_a120 [32];
  string local_a100 [32];
  string local_a0e0 [32];
  string local_a0c0 [32];
  string local_a0a0 [32];
  string local_a080 [32];
  string local_a060 [32];
  string local_a040 [32];
  string local_a020 [32];
  string local_a000 [32];
  string local_9fe0 [32];
  string local_9fc0 [32];
  string local_9fa0 [32];
  string local_9f80 [32];
  string local_9f60 [32];
  string local_9f40 [32];
  string local_9f20 [32];
  string local_9f00 [32];
  string local_9ee0 [32];
  string local_9ec0 [32];
  string local_9ea0 [32];
  string local_9e80 [32];
  string local_9e60 [32];
  string local_9e40 [32];
  string local_9e20 [32];
  string local_9e00 [32];
  string local_9de0 [32];
  string local_9dc0 [32];
  string local_9da0 [32];
  string local_9d80 [32];
  string local_9d60 [32];
  string local_9d40 [32];
  string local_9d20 [32];
  string local_9d00 [32];
  string local_9ce0 [32];
  string local_9cc0 [32];
  string local_9ca0 [32];
  string local_9c80 [32];
  string local_9c60 [32];
  string local_9c40 [32];
  string local_9c20 [32];
  string local_9c00 [32];
  string local_9be0 [32];
  string local_9bc0 [32];
  string local_9ba0 [32];
  string local_9b80 [32];
  string local_9b60 [32];
  string local_9b40 [32];
  string local_9b20 [32];
  string local_9b00 [32];
  string local_9ae0 [32];
  string local_9ac0 [32];
  string local_9aa0 [32];
  string local_9a80 [32];
  string local_9a60 [32];
  string local_9a40 [32];
  string local_9a20 [32];
  string local_9a00 [32];
  string local_99e0 [32];
  string local_99c0 [32];
  string local_99a0 [32];
  string local_9980 [32];
  string local_9960 [32];
  string local_9940 [32];
  string local_9920 [32];
  string local_9900 [32];
  string local_98e0 [32];
  string local_98c0 [32];
  string local_98a0 [32];
  string local_9880 [32];
  string local_9860 [32];
  string local_9840 [32];
  string local_9820 [32];
  string local_9800 [32];
  string local_97e0 [32];
  string local_97c0 [32];
  string local_97a0 [32];
  string local_9780 [32];
  string local_9760 [32];
  string local_9740 [32];
  string local_9720 [32];
  string local_9700 [32];
  string local_96e0 [32];
  string local_96c0 [32];
  string local_96a0 [32];
  string local_9680 [32];
  string local_9660 [32];
  string local_9640 [32];
  string local_9620 [32];
  string local_9600 [32];
  string local_95e0 [32];
  string local_95c0 [32];
  string local_95a0 [32];
  string local_9580 [32];
  string local_9560 [32];
  string local_9540 [32];
  string local_9520 [32];
  string local_9500 [32];
  string local_94e0 [32];
  string local_94c0 [32];
  string local_94a0 [32];
  string local_9480 [32];
  string local_9460 [32];
  string local_9440 [32];
  string local_9420 [32];
  string local_9400 [32];
  string local_93e0 [32];
  string local_93c0 [32];
  string local_93a0 [32];
  string local_9380 [32];
  string local_9360 [32];
  string local_9340 [32];
  string local_9320 [32];
  string local_9300 [32];
  string local_92e0 [32];
  string local_92c0 [32];
  string local_92a0 [32];
  string local_9280 [32];
  string local_9260 [32];
  string local_9240 [32];
  string local_9220 [32];
  string local_9200 [32];
  string local_91e0 [32];
  string local_91c0 [32];
  string local_91a0 [32];
  string local_9180 [32];
  string local_9160 [32];
  string local_9140 [32];
  string local_9120 [32];
  string local_9100 [32];
  string local_90e0 [32];
  string local_90c0 [32];
  string local_90a0 [32];
  string local_9080 [32];
  string local_9060 [32];
  string local_9040 [32];
  string local_9020 [32];
  string local_9000 [32];
  string local_8fe0 [32];
  string local_8fc0 [32];
  string local_8fa0 [32];
  string local_8f80 [32];
  string local_8f60 [32];
  string local_8f40 [32];
  string local_8f20 [32];
  string local_8f00 [32];
  string local_8ee0 [32];
  string local_8ec0 [32];
  string local_8ea0 [32];
  string local_8e80 [32];
  string local_8e60 [32];
  string local_8e40 [32];
  string local_8e20 [32];
  string local_8e00 [32];
  string local_8de0 [32];
  string local_8dc0 [32];
  string local_8da0 [32];
  string local_8d80 [32];
  string local_8d60 [32];
  string local_8d40 [32];
  string local_8d20 [32];
  string local_8d00 [32];
  string local_8ce0 [32];
  string local_8cc0 [32];
  string local_8ca0 [32];
  string local_8c80 [32];
  string local_8c60 [32];
  string local_8c40 [32];
  string local_8c20 [32];
  string local_8c00 [32];
  string local_8be0 [32];
  string local_8bc0 [32];
  string local_8ba0 [32];
  string local_8b80 [32];
  string local_8b60 [32];
  string local_8b40 [32];
  string local_8b20 [32];
  string local_8b00 [32];
  string local_8ae0 [32];
  string local_8ac0 [32];
  string local_8aa0 [32];
  string local_8a80 [32];
  string local_8a60 [32];
  string local_8a40 [32];
  string local_8a20 [32];
  string local_8a00 [32];
  string local_89e0 [32];
  string local_89c0 [32];
  string local_89a0 [32];
  string local_8980 [32];
  string local_8960 [32];
  string local_8940 [32];
  string local_8920 [32];
  string local_8900 [32];
  string local_88e0 [32];
  string local_88c0 [32];
  string local_88a0 [32];
  string local_8880 [32];
  string local_8860 [32];
  string local_8840 [32];
  string local_8820 [32];
  string local_8800 [32];
  string local_87e0 [32];
  string local_87c0 [32];
  string local_87a0 [32];
  string local_8780 [32];
  string local_8760 [32];
  string local_8740 [32];
  string local_8720 [32];
  string local_8700 [32];
  string local_86e0 [32];
  string local_86c0 [32];
  string local_86a0 [32];
  string local_8680 [32];
  string local_8660 [32];
  string local_8640 [32];
  string local_8620 [32];
  string local_8600 [32];
  string local_85e0 [32];
  string local_85c0 [32];
  string local_85a0 [32];
  string local_8580 [32];
  string local_8560 [32];
  string local_8540 [32];
  string local_8520 [32];
  string local_8500 [32];
  string local_84e0 [32];
  string local_84c0 [32];
  string local_84a0 [32];
  string local_8480 [32];
  string local_8460 [32];
  string local_8440 [32];
  string local_8420 [32];
  string local_8400 [32];
  string local_83e0 [32];
  string local_83c0 [32];
  string local_83a0 [32];
  string local_8380 [32];
  string local_8360 [32];
  string local_8340 [32];
  string local_8320 [32];
  string local_8300 [32];
  string local_82e0 [32];
  string local_82c0 [32];
  string local_82a0 [32];
  string local_8280 [32];
  string local_8260 [32];
  string local_8240 [32];
  string local_8220 [32];
  string local_8200 [32];
  string local_81e0 [32];
  string local_81c0 [32];
  string local_81a0 [32];
  string local_8180 [32];
  string local_8160 [32];
  string local_8140 [32];
  string local_8120 [32];
  string local_8100 [32];
  string local_80e0 [32];
  string local_80c0 [32];
  string local_80a0 [32];
  string local_8080 [32];
  string local_8060 [32];
  string local_8040 [32];
  string local_8020 [32];
  string local_8000 [32];
  string local_7fe0 [32];
  string local_7fc0 [32];
  string local_7fa0 [32];
  string local_7f80 [32];
  string local_7f60 [32];
  string local_7f40 [32];
  string local_7f20 [32];
  string local_7f00 [32];
  string local_7ee0 [32];
  string local_7ec0 [32];
  string local_7ea0 [32];
  string local_7e80 [32];
  string local_7e60 [32];
  string local_7e40 [32];
  string local_7e20 [32];
  string local_7e00 [32];
  string local_7de0 [32];
  string local_7dc0 [32];
  string local_7da0 [32];
  string local_7d80 [32];
  string local_7d60 [32];
  string local_7d40 [32];
  string local_7d20 [32];
  string local_7d00 [32];
  string local_7ce0 [32];
  string local_7cc0 [32];
  string local_7ca0 [32];
  string local_7c80 [32];
  string local_7c60 [32];
  string local_7c40 [32];
  string local_7c20 [32];
  string local_7c00 [32];
  string local_7be0 [32];
  string local_7bc0 [32];
  string local_7ba0 [32];
  string local_7b80 [32];
  string local_7b60 [32];
  string local_7b40 [32];
  string local_7b20 [32];
  string local_7b00 [32];
  string local_7ae0 [32];
  string local_7ac0 [32];
  string local_7aa0 [32];
  string local_7a80 [32];
  string local_7a60 [32];
  string local_7a40 [32];
  string local_7a20 [32];
  string local_7a00 [32];
  string local_79e0 [32];
  string local_79c0 [32];
  string local_79a0 [32];
  string local_7980 [32];
  string local_7960 [32];
  string local_7940 [32];
  string local_7920 [32];
  string local_7900 [32];
  string local_78e0 [32];
  string local_78c0 [32];
  string local_78a0 [32];
  string local_7880 [32];
  string local_7860 [32];
  string local_7840 [32];
  string local_7820 [32];
  string local_7800 [32];
  string local_77e0 [32];
  string local_77c0 [32];
  string local_77a0 [32];
  string local_7780 [32];
  string local_7760 [32];
  string local_7740 [32];
  string local_7720 [32];
  string local_7700 [32];
  string local_76e0 [32];
  string local_76c0 [32];
  string local_76a0 [32];
  string local_7680 [32];
  string local_7660 [32];
  string local_7640 [32];
  string local_7620 [32];
  string local_7600 [32];
  string local_75e0 [32];
  string local_75c0 [32];
  string local_75a0 [32];
  string local_7580 [32];
  string local_7560 [32];
  string local_7540 [32];
  string local_7520 [32];
  string local_7500 [32];
  string local_74e0 [32];
  string local_74c0 [32];
  string local_74a0 [32];
  string local_7480 [32];
  string local_7460 [32];
  string local_7440 [32];
  string local_7420 [32];
  string local_7400 [32];
  string local_73e0 [32];
  string local_73c0 [32];
  string local_73a0 [32];
  string local_7380 [32];
  string local_7360 [32];
  string local_7340 [32];
  string local_7320 [32];
  string local_7300 [32];
  string local_72e0 [32];
  string local_72c0 [32];
  string local_72a0 [32];
  string local_7280 [32];
  string local_7260 [32];
  string local_7240 [32];
  string local_7220 [32];
  string local_7200 [32];
  string local_71e0 [32];
  string local_71c0 [32];
  string local_71a0 [32];
  string local_7180 [32];
  string local_7160 [32];
  string local_7140 [32];
  string local_7120 [32];
  string local_7100 [32];
  string local_70e0 [32];
  string local_70c0 [32];
  string local_70a0 [32];
  string local_7080 [32];
  string local_7060 [32];
  string local_7040 [32];
  string local_7020 [32];
  string local_7000 [32];
  string local_6fe0 [32];
  string local_6fc0 [32];
  string local_6fa0 [32];
  string local_6f80 [32];
  string local_6f60 [32];
  string local_6f40 [32];
  string local_6f20 [32];
  string local_6f00 [32];
  string local_6ee0 [32];
  string local_6ec0 [32];
  string local_6ea0 [32];
  string local_6e80 [32];
  string local_6e60 [32];
  string local_6e40 [32];
  string local_6e20 [32];
  string local_6e00 [32];
  string local_6de0 [32];
  string local_6dc0 [32];
  string local_6da0 [32];
  string local_6d80 [32];
  string local_6d60 [32];
  string local_6d40 [32];
  string local_6d20 [32];
  string local_6d00 [32];
  string local_6ce0 [32];
  string local_6cc0 [32];
  string local_6ca0 [32];
  string local_6c80 [32];
  string local_6c60 [32];
  string local_6c40 [32];
  string local_6c20 [32];
  string local_6c00 [32];
  string local_6be0 [32];
  string local_6bc0 [32];
  string local_6ba0 [32];
  string local_6b80 [32];
  string local_6b60 [32];
  string local_6b40 [32];
  string local_6b20 [32];
  string local_6b00 [32];
  string local_6ae0 [32];
  string local_6ac0 [32];
  string local_6aa0 [32];
  string local_6a80 [32];
  string local_6a60 [32];
  string local_6a40 [32];
  string local_6a20 [32];
  string local_6a00 [32];
  string local_69e0 [32];
  string local_69c0 [32];
  string local_69a0 [32];
  string local_6980 [32];
  string local_6960 [32];
  string local_6940 [32];
  string local_6920 [32];
  string local_6900 [32];
  string local_68e0 [32];
  string local_68c0 [32];
  string local_68a0 [32];
  string local_6880 [32];
  string local_6860 [32];
  string local_6840 [32];
  string local_6820 [32];
  string local_6800 [32];
  string local_67e0 [32];
  string local_67c0 [32];
  string local_67a0 [32];
  string local_6780 [32];
  string local_6760 [32];
  string local_6740 [32];
  string local_6720 [32];
  string local_6700 [32];
  string local_66e0 [32];
  string local_66c0 [32];
  string local_66a0 [32];
  string local_6680 [32];
  string local_6660 [32];
  string local_6640 [32];
  string local_6620 [32];
  string local_6600 [32];
  string local_65e0 [32];
  string local_65c0 [32];
  string local_65a0 [32];
  string local_6580 [32];
  string local_6560 [32];
  string local_6540 [32];
  string local_6520 [32];
  string local_6500 [32];
  string local_64e0 [32];
  string local_64c0 [32];
  string local_64a0 [32];
  string local_6480 [32];
  string local_6460 [32];
  string local_6440 [32];
  string local_6420 [32];
  string local_6400 [32];
  string local_63e0 [32];
  string local_63c0 [32];
  string local_63a0 [32];
  string local_6380 [32];
  string local_6360 [32];
  string local_6340 [32];
  string local_6320 [32];
  string local_6300 [32];
  string local_62e0 [32];
  string local_62c0 [32];
  string local_62a0 [32];
  string local_6280 [32];
  string local_6260 [32];
  string local_6240 [32];
  string local_6220 [32];
  string local_6200 [32];
  string local_61e0 [32];
  string local_61c0 [32];
  string local_61a0 [32];
  string local_6180 [32];
  string local_6160 [32];
  string local_6140 [32];
  string local_6120 [32];
  string local_6100 [32];
  string local_60e0 [32];
  string local_60c0 [32];
  string local_60a0 [32];
  string local_6080 [32];
  string local_6060 [32];
  string local_6040 [32];
  string local_6020 [32];
  string local_6000 [32];
  string local_5fe0 [32];
  string local_5fc0 [32];
  string local_5fa0 [32];
  string local_5f80 [32];
  string local_5f60 [32];
  string local_5f40 [32];
  string local_5f20 [32];
  string local_5f00 [32];
  string local_5ee0 [32];
  string local_5ec0 [32];
  string local_5ea0 [32];
  string local_5e80 [32];
  string local_5e60 [32];
  string local_5e40 [32];
  string local_5e20 [32];
  string local_5e00 [32];
  string local_5de0 [32];
  string local_5dc0 [32];
  string local_5da0 [32];
  string local_5d80 [32];
  string local_5d60 [32];
  string local_5d40 [32];
  string local_5d20 [32];
  string local_5d00 [32];
  string local_5ce0 [32];
  string local_5cc0 [32];
  string local_5ca0 [32];
  string local_5c80 [32];
  string local_5c60 [32];
  string local_5c40 [32];
  string local_5c20 [32];
  string local_5c00 [32];
  string local_5be0 [32];
  string local_5bc0 [32];
  string local_5ba0 [32];
  string local_5b80 [32];
  string local_5b60 [32];
  string local_5b40 [32];
  string local_5b20 [32];
  string local_5b00 [32];
  string local_5ae0 [32];
  string local_5ac0 [32];
  string local_5aa0 [32];
  string local_5a80 [32];
  string local_5a60 [32];
  string local_5a40 [32];
  string local_5a20 [32];
  string local_5a00 [32];
  string local_59e0 [32];
  string local_59c0 [32];
  string local_59a0 [32];
  string local_5980 [32];
  string local_5960 [32];
  string local_5940 [32];
  string local_5920 [32];
  string local_5900 [32];
  string local_58e0 [32];
  string local_58c0 [32];
  string local_58a0 [32];
  string local_5880 [32];
  string local_5860 [32];
  string local_5840 [32];
  string local_5820 [32];
  string local_5800 [32];
  string local_57e0 [32];
  string local_57c0 [32];
  string local_57a0 [32];
  string local_5780 [32];
  string local_5760 [32];
  string local_5740 [32];
  string local_5720 [32];
  string local_5700 [32];
  string local_56e0 [32];
  string local_56c0 [32];
  string local_56a0 [32];
  string local_5680 [32];
  string local_5660 [32];
  string local_5640 [32];
  string local_5620 [32];
  string local_5600 [32];
  string local_55e0 [32];
  string local_55c0 [32];
  string local_55a0 [32];
  string local_5580 [32];
  string local_5560 [32];
  string local_5540 [32];
  string local_5520 [32];
  string local_5500 [32];
  string local_54e0 [32];
  string local_54c0 [32];
  string local_54a0 [32];
  string local_5480 [32];
  string local_5460 [32];
  string local_5440 [32];
  string local_5420 [32];
  string local_5400 [32];
  string local_53e0 [32];
  string local_53c0 [32];
  string local_53a0 [32];
  string local_5380 [32];
  string local_5360 [32];
  string local_5340 [32];
  string local_5320 [32];
  string local_5300 [32];
  string local_52e0 [32];
  string local_52c0 [32];
  string local_52a0 [32];
  string local_5280 [32];
  string local_5260 [32];
  string local_5240 [32];
  string local_5220 [32];
  string local_5200 [32];
  string local_51e0 [32];
  string local_51c0 [32];
  string local_51a0 [32];
  string local_5180 [32];
  string local_5160 [32];
  string local_5140 [32];
  string local_5120 [32];
  string local_5100 [32];
  string local_50e0 [32];
  string local_50c0 [32];
  string local_50a0 [32];
  string local_5080 [32];
  string local_5060 [32];
  string local_5040 [32];
  string local_5020 [32];
  string local_5000 [32];
  string local_4fe0 [32];
  string local_4fc0 [32];
  string local_4fa0 [32];
  string local_4f80 [32];
  string local_4f60 [32];
  string local_4f40 [32];
  string local_4f20 [32];
  string local_4f00 [32];
  string local_4ee0 [32];
  string local_4ec0 [32];
  string local_4ea0 [32];
  string local_4e80 [32];
  string local_4e60 [32];
  string local_4e40 [32];
  string local_4e20 [32];
  string local_4e00 [32];
  string local_4de0 [32];
  string local_4dc0 [32];
  string local_4da0 [32];
  string local_4d80 [32];
  string local_4d60 [32];
  string local_4d40 [32];
  string local_4d20 [32];
  string local_4d00 [32];
  string local_4ce0 [32];
  string local_4cc0 [32];
  string local_4ca0 [32];
  string local_4c80 [32];
  string local_4c60 [32];
  string local_4c40 [32];
  string local_4c20 [32];
  string local_4c00 [32];
  string local_4be0 [32];
  string local_4bc0 [32];
  string local_4ba0 [32];
  string local_4b80 [32];
  string local_4b60 [32];
  string local_4b40 [32];
  string local_4b20 [32];
  string local_4b00 [32];
  string local_4ae0 [32];
  string local_4ac0 [32];
  string local_4aa0 [32];
  string local_4a80 [32];
  string local_4a60 [32];
  string local_4a40 [32];
  string local_4a20 [32];
  string local_4a00 [32];
  string local_49e0 [32];
  string local_49c0 [32];
  string local_49a0 [32];
  string local_4980 [32];
  string local_4960 [32];
  string local_4940 [32];
  string local_4920 [32];
  string local_4900 [32];
  string local_48e0 [32];
  string local_48c0 [32];
  string local_48a0 [32];
  string local_4880 [32];
  string local_4860 [32];
  string local_4840 [32];
  string local_4820 [32];
  string local_4800 [32];
  string local_47e0 [32];
  string local_47c0 [32];
  string local_47a0 [32];
  string local_4780 [32];
  string local_4760 [32];
  string local_4740 [32];
  string local_4720 [32];
  string local_4700 [32];
  string local_46e0 [32];
  string local_46c0 [32];
  string local_46a0 [32];
  string local_4680 [32];
  string local_4660 [32];
  string local_4640 [32];
  string local_4620 [32];
  string local_4600 [32];
  string local_45e0 [32];
  string local_45c0 [32];
  string local_45a0 [32];
  string local_4580 [32];
  string local_4560 [32];
  string local_4540 [32];
  string local_4520 [32];
  string local_4500 [32];
  string local_44e0 [32];
  string local_44c0 [32];
  string local_44a0 [32];
  string local_4480 [32];
  string local_4460 [32];
  string local_4440 [32];
  string local_4420 [32];
  string local_4400 [32];
  string local_43e0 [32];
  string local_43c0 [32];
  string local_43a0 [32];
  string local_4380 [32];
  string local_4360 [32];
  string local_4340 [32];
  string local_4320 [32];
  string local_4300 [32];
  string local_42e0 [32];
  string local_42c0 [32];
  string local_42a0 [32];
  string local_4280 [32];
  string local_4260 [32];
  string local_4240 [32];
  string local_4220 [32];
  string local_4200 [32];
  string local_41e0 [32];
  string local_41c0 [32];
  string local_41a0 [32];
  string local_4180 [32];
  string local_4160 [32];
  string local_4140 [32];
  string local_4120 [32];
  string local_4100 [32];
  string local_40e0 [32];
  string local_40c0 [32];
  string local_40a0 [32];
  string local_4080 [32];
  string local_4060 [32];
  string local_4040 [32];
  string local_4020 [32];
  string local_4000 [32];
  string local_3fe0 [32];
  string local_3fc0 [32];
  string local_3fa0 [32];
  string local_3f80 [32];
  string local_3f60 [32];
  string local_3f40 [32];
  string local_3f20 [32];
  string local_3f00 [32];
  string local_3ee0 [32];
  string local_3ec0 [32];
  string local_3ea0 [32];
  string local_3e80 [32];
  string local_3e60 [32];
  string local_3e40 [32];
  string local_3e20 [32];
  string local_3e00 [32];
  string local_3de0 [32];
  string local_3dc0 [32];
  string local_3da0 [32];
  string local_3d80 [32];
  string local_3d60 [32];
  string local_3d40 [32];
  string local_3d20 [32];
  string local_3d00 [32];
  string local_3ce0 [32];
  string local_3cc0 [32];
  string local_3ca0 [32];
  string local_3c80 [32];
  string local_3c60 [32];
  string local_3c40 [32];
  string local_3c20 [32];
  string local_3c00 [32];
  string local_3be0 [32];
  string local_3bc0 [32];
  string local_3ba0 [32];
  string local_3b80 [32];
  string local_3b60 [32];
  string local_3b40 [32];
  string local_3b20 [32];
  string local_3b00 [32];
  string local_3ae0 [32];
  string local_3ac0 [32];
  string local_3aa0 [32];
  string local_3a80 [32];
  string local_3a60 [32];
  string local_3a40 [32];
  string local_3a20 [32];
  string local_3a00 [32];
  string local_39e0 [32];
  string local_39c0 [32];
  string local_39a0 [32];
  string local_3980 [32];
  string local_3960 [32];
  string local_3940 [32];
  string local_3920 [32];
  string local_3900 [32];
  string local_38e0 [32];
  string local_38c0 [32];
  string local_38a0 [32];
  string local_3880 [32];
  string local_3860 [32];
  string local_3840 [32];
  string local_3820 [32];
  string local_3800 [32];
  string local_37e0 [32];
  string local_37c0 [32];
  string local_37a0 [32];
  string local_3780 [32];
  string local_3760 [32];
  string local_3740 [32];
  string local_3720 [32];
  string local_3700 [32];
  string local_36e0 [32];
  string local_36c0 [32];
  string local_36a0 [32];
  string local_3680 [32];
  string local_3660 [32];
  string local_3640 [32];
  string local_3620 [32];
  string local_3600 [32];
  string local_35e0 [32];
  string local_35c0 [32];
  string local_35a0 [32];
  string local_3580 [32];
  string local_3560 [32];
  string local_3540 [32];
  string local_3520 [32];
  string local_3500 [32];
  string local_34e0 [32];
  string local_34c0 [32];
  string local_34a0 [32];
  string local_3480 [32];
  string local_3460 [32];
  string local_3440 [32];
  string local_3420 [32];
  string local_3400 [32];
  string local_33e0 [32];
  string local_33c0 [32];
  string local_33a0 [32];
  string local_3380 [32];
  string local_3360 [32];
  string local_3340 [32];
  string local_3320 [32];
  string local_3300 [32];
  string local_32e0 [32];
  string local_32c0 [32];
  string local_32a0 [32];
  string local_3280 [32];
  string local_3260 [32];
  string local_3240 [32];
  string local_3220 [32];
  string local_3200 [32];
  string local_31e0 [32];
  string local_31c0 [32];
  string local_31a0 [32];
  string local_3180 [32];
  string local_3160 [32];
  string local_3140 [32];
  string local_3120 [32];
  string local_3100 [32];
  string local_30e0 [32];
  string local_30c0 [32];
  string local_30a0 [32];
  string local_3080 [32];
  string local_3060 [32];
  string local_3040 [32];
  string local_3020 [32];
  string local_3000 [32];
  string local_2fe0 [32];
  string local_2fc0 [32];
  string local_2fa0 [32];
  string local_2f80 [32];
  string local_2f60 [32];
  string local_2f40 [32];
  string local_2f20 [32];
  string local_2f00 [32];
  string local_2ee0 [32];
  string local_2ec0 [32];
  string local_2ea0 [32];
  string local_2e80 [32];
  string local_2e60 [32];
  string local_2e40 [32];
  string local_2e20 [32];
  string local_2e00 [32];
  string local_2de0 [32];
  string local_2dc0 [32];
  string local_2da0 [32];
  string local_2d80 [32];
  string local_2d60 [32];
  string local_2d40 [32];
  string local_2d20 [32];
  string local_2d00 [32];
  string local_2ce0 [32];
  string local_2cc0 [32];
  string local_2ca0 [32];
  string local_2c80 [32];
  string local_2c60 [32];
  string local_2c40 [32];
  string local_2c20 [32];
  string local_2c00 [32];
  string local_2be0 [32];
  string local_2bc0 [32];
  string local_2ba0 [32];
  string local_2b80 [32];
  string local_2b60 [32];
  string local_2b40 [32];
  string local_2b20 [32];
  string local_2b00 [32];
  string local_2ae0 [32];
  string local_2ac0 [32];
  string local_2aa0 [32];
  string local_2a80 [32];
  string local_2a60 [32];
  string local_2a40 [32];
  string local_2a20 [32];
  string local_2a00 [32];
  string local_29e0 [32];
  string local_29c0 [32];
  string local_29a0 [32];
  string local_2980 [32];
  string local_2960 [32];
  string local_2940 [32];
  string local_2920 [32];
  string local_2900 [32];
  string local_28e0 [32];
  string local_28c0 [32];
  string local_28a0 [32];
  string local_2880 [32];
  string local_2860 [32];
  string local_2840 [32];
  string local_2820 [32];
  string local_2800 [32];
  string local_27e0 [32];
  string local_27c0 [32];
  string local_27a0 [32];
  string local_2780 [32];
  string local_2760 [32];
  string local_2740 [32];
  string local_2720 [32];
  string local_2700 [32];
  string local_26e0 [32];
  string local_26c0 [32];
  string local_26a0 [32];
  string local_2680 [32];
  string local_2660 [32];
  string local_2640 [32];
  string local_2620 [32];
  string local_2600 [32];
  string local_25e0 [32];
  string local_25c0 [32];
  string local_25a0 [32];
  string local_2580 [32];
  string local_2560 [32];
  string local_2540 [32];
  string local_2520 [32];
  string local_2500 [32];
  string local_24e0 [32];
  string local_24c0 [32];
  string local_24a0 [32];
  string local_2480 [32];
  string local_2460 [32];
  string local_2440 [32];
  string local_2420 [32];
  string local_2400 [32];
  string local_23e0 [32];
  string local_23c0 [32];
  string local_23a0 [32];
  string local_2380 [32];
  string local_2360 [32];
  string local_2340 [32];
  string local_2320 [32];
  string local_2300 [32];
  string local_22e0 [32];
  string local_22c0 [32];
  string local_22a0 [32];
  string local_2280 [32];
  string local_2260 [32];
  string local_2240 [32];
  string local_2220 [32];
  string local_2200 [32];
  string local_21e0 [32];
  string local_21c0 [32];
  string local_21a0 [32];
  string local_2180 [32];
  string local_2160 [32];
  string local_2140 [32];
  string local_2120 [32];
  string local_2100 [32];
  string local_20e0 [32];
  string local_20c0 [32];
  string local_20a0 [32];
  string local_2080 [32];
  string local_2060 [32];
  string local_2040 [32];
  string local_2020 [32];
  string local_2000 [32];
  string local_1fe0 [32];
  string local_1fc0 [32];
  string local_1fa0 [32];
  string local_1f80 [32];
  string local_1f60 [32];
  string local_1f40 [32];
  string local_1f20 [32];
  string local_1f00 [32];
  string local_1ee0 [32];
  string local_1ec0 [32];
  string local_1ea0 [32];
  string local_1e80 [32];
  string local_1e60 [32];
  string local_1e40 [32];
  string local_1e20 [32];
  string local_1e00 [32];
  string local_1de0 [32];
  string local_1dc0 [32];
  string local_1da0 [32];
  string local_1d80 [32];
  string local_1d60 [32];
  string local_1d40 [32];
  string local_1d20 [32];
  string local_1d00 [32];
  string local_1ce0 [32];
  string local_1cc0 [32];
  string local_1ca0 [32];
  string local_1c80 [32];
  string local_1c60 [32];
  string local_1c40 [32];
  string local_1c20 [32];
  string local_1c00 [32];
  string local_1be0 [32];
  string local_1bc0 [32];
  string local_1ba0 [32];
  string local_1b80 [32];
  string local_1b60 [32];
  string local_1b40 [32];
  string local_1b20 [32];
  string local_1b00 [32];
  string local_1ae0 [32];
  string local_1ac0 [32];
  string local_1aa0 [32];
  string local_1a80 [32];
  string local_1a60 [32];
  string local_1a40 [32];
  string local_1a20 [32];
  string local_1a00 [32];
  string local_19e0 [32];
  string local_19c0 [32];
  string local_19a0 [32];
  string local_1980 [32];
  string local_1960 [32];
  string local_1940 [32];
  string local_1920 [32];
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [32];
  string local_18a0 [32];
  string local_1880 [32];
  string local_1860 [32];
  string local_1840 [32];
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string local_17a0 [32];
  string local_1780 [32];
  string local_1760 [32];
  string local_1740 [32];
  string local_1720 [32];
  string local_1700 [32];
  string local_16e0 [32];
  string local_16c0 [32];
  string local_16a0 [32];
  string local_1680 [32];
  string local_1660 [32];
  string local_1640 [32];
  string local_1620 [32];
  string local_1600 [32];
  string local_15e0 [32];
  string local_15c0 [32];
  string local_15a0 [32];
  string local_1580 [32];
  string local_1560 [32];
  string local_1540 [32];
  string local_1520 [32];
  string local_1500 [32];
  string local_14e0 [32];
  string local_14c0 [32];
  string local_14a0 [32];
  string local_1480 [32];
  string local_1460 [32];
  string local_1440 [32];
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [32];
  string local_13a0 [32];
  string local_1380 [32];
  string local_1360 [32];
  string local_1340 [32];
  string local_1320 [32];
  string local_1300 [32];
  string local_12e0 [32];
  string local_12c0 [32];
  string local_12a0 [32];
  string local_1280 [32];
  string local_1260 [32];
  string local_1240 [32];
  string local_1220 [32];
  string local_1200 [32];
  string local_11e0 [32];
  string local_11c0 [32];
  string local_11a0 [32];
  string local_1180 [32];
  string local_1160 [32];
  string local_1140 [32];
  string local_1120 [32];
  string local_1100 [32];
  string local_10e0 [32];
  string local_10c0 [32];
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string((string *)&language,"abandon",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_10000,"ability",(allocator *)&actual_wordlist);
  std::__cxx11::string::string(local_ffe0,"able",(allocator *)&vStack_10890);
  std::__cxx11::string::string(local_ffc0,"about",(allocator *)&AStack_10898);
  std::__cxx11::string::string(local_ffa0,"above",&aStack_10079);
  std::__cxx11::string::string(local_ff80,"absent",&aStack_1007a);
  std::__cxx11::string::string(local_ff60,"absorb",&aStack_1007b);
  std::__cxx11::string::string(local_ff40,"abstract",&aStack_1007c);
  std::__cxx11::string::string(local_ff20,"absurd",&aStack_1007d);
  std::__cxx11::string::string(local_ff00,"abuse",&aStack_1007e);
  std::__cxx11::string::string(local_fee0,"access",&aStack_1007f);
  std::__cxx11::string::string(local_fec0,"accident",&aStack_10080);
  std::__cxx11::string::string(local_fea0,"account",&aStack_10081);
  std::__cxx11::string::string(local_fe80,"accuse",&aStack_10082);
  std::__cxx11::string::string(local_fe60,"achieve",&aStack_10083);
  std::__cxx11::string::string(local_fe40,"acid",&aStack_10084);
  std::__cxx11::string::string(local_fe20,"acoustic",&aStack_10085);
  std::__cxx11::string::string(local_fe00,"acquire",&aStack_10086);
  std::__cxx11::string::string(local_fde0,"across",&aStack_10087);
  std::__cxx11::string::string(local_fdc0,"act",&aStack_10088);
  std::__cxx11::string::string(local_fda0,"action",&aStack_10089);
  std::__cxx11::string::string(local_fd80,"actor",&aStack_1008a);
  std::__cxx11::string::string(local_fd60,"actress",&aStack_1008b);
  std::__cxx11::string::string(local_fd40,"actual",&aStack_1008c);
  std::__cxx11::string::string(local_fd20,"adapt",&aStack_1008d);
  std::__cxx11::string::string(local_fd00,"add",&aStack_1008e);
  std::__cxx11::string::string(local_fce0,"addict",&aStack_1008f);
  std::__cxx11::string::string(local_fcc0,"address",&aStack_10090);
  std::__cxx11::string::string(local_fca0,"adjust",&aStack_10091);
  std::__cxx11::string::string(local_fc80,"admit",&aStack_10092);
  std::__cxx11::string::string(local_fc60,"adult",&aStack_10093);
  std::__cxx11::string::string(local_fc40,"advance",&aStack_10094);
  std::__cxx11::string::string(local_fc20,"advice",&aStack_10095);
  std::__cxx11::string::string(local_fc00,"aerobic",&aStack_10096);
  std::__cxx11::string::string(local_fbe0,"affair",&aStack_10097);
  std::__cxx11::string::string(local_fbc0,"afford",&aStack_10098);
  std::__cxx11::string::string(local_fba0,"afraid",&aStack_10099);
  std::__cxx11::string::string(local_fb80,"again",&aStack_1009a);
  std::__cxx11::string::string(local_fb60,"age",&aStack_1009b);
  std::__cxx11::string::string(local_fb40,"agent",&aStack_1009c);
  std::__cxx11::string::string(local_fb20,"agree",&aStack_1009d);
  std::__cxx11::string::string(local_fb00,"ahead",&aStack_1009e);
  std::__cxx11::string::string(local_fae0,"aim",&aStack_1009f);
  std::__cxx11::string::string(local_fac0,"air",&aStack_100a0);
  std::__cxx11::string::string(local_faa0,"airport",&aStack_100a1);
  std::__cxx11::string::string(local_fa80,"aisle",&aStack_100a2);
  std::__cxx11::string::string(local_fa60,"alarm",&aStack_100a3);
  std::__cxx11::string::string(local_fa40,"album",&aStack_100a4);
  std::__cxx11::string::string(local_fa20,"alcohol",&aStack_100a5);
  std::__cxx11::string::string(local_fa00,"alert",&aStack_100a6);
  std::__cxx11::string::string(local_f9e0,"alien",&aStack_100a7);
  std::__cxx11::string::string(local_f9c0,"all",&aStack_100a8);
  std::__cxx11::string::string(local_f9a0,"alley",&aStack_100a9);
  std::__cxx11::string::string(local_f980,"allow",&aStack_100aa);
  std::__cxx11::string::string(local_f960,"almost",&aStack_100ab);
  std::__cxx11::string::string(local_f940,"alone",&aStack_100ac);
  std::__cxx11::string::string(local_f920,"alpha",&aStack_100ad);
  std::__cxx11::string::string(local_f900,"already",&aStack_100ae);
  std::__cxx11::string::string(local_f8e0,"also",&aStack_100af);
  std::__cxx11::string::string(local_f8c0,"alter",&aStack_100b0);
  std::__cxx11::string::string(local_f8a0,"always",&aStack_100b1);
  std::__cxx11::string::string(local_f880,"amateur",&aStack_100b2);
  std::__cxx11::string::string(local_f860,"amazing",&aStack_100b3);
  std::__cxx11::string::string(local_f840,"among",&aStack_100b4);
  std::__cxx11::string::string(local_f820,"amount",&aStack_100b5);
  std::__cxx11::string::string(local_f800,"amused",&aStack_100b6);
  std::__cxx11::string::string(local_f7e0,"analyst",&aStack_100b7);
  std::__cxx11::string::string(local_f7c0,"anchor",&aStack_100b8);
  std::__cxx11::string::string(local_f7a0,"ancient",&aStack_100b9);
  std::__cxx11::string::string(local_f780,"anger",&aStack_100ba);
  std::__cxx11::string::string(local_f760,"angle",&aStack_100bb);
  std::__cxx11::string::string(local_f740,"angry",&aStack_100bc);
  std::__cxx11::string::string(local_f720,"animal",&aStack_100bd);
  std::__cxx11::string::string(local_f700,"ankle",&aStack_100be);
  std::__cxx11::string::string(local_f6e0,"announce",&aStack_100bf);
  std::__cxx11::string::string(local_f6c0,"annual",&aStack_100c0);
  std::__cxx11::string::string(local_f6a0,"another",&aStack_100c1);
  std::__cxx11::string::string(local_f680,"answer",&aStack_100c2);
  std::__cxx11::string::string(local_f660,"antenna",&aStack_100c3);
  std::__cxx11::string::string(local_f640,"antique",&aStack_100c4);
  std::__cxx11::string::string(local_f620,"anxiety",&aStack_100c5);
  std::__cxx11::string::string(local_f600,"any",&aStack_100c6);
  std::__cxx11::string::string(local_f5e0,"apart",&aStack_100c7);
  std::__cxx11::string::string(local_f5c0,"apology",&aStack_100c8);
  std::__cxx11::string::string(local_f5a0,"appear",&aStack_100c9);
  std::__cxx11::string::string(local_f580,"apple",&aStack_100ca);
  std::__cxx11::string::string(local_f560,"approve",&aStack_100cb);
  std::__cxx11::string::string(local_f540,"april",&aStack_100cc);
  std::__cxx11::string::string(local_f520,"arch",&aStack_100cd);
  std::__cxx11::string::string(local_f500,"arctic",&aStack_100ce);
  std::__cxx11::string::string(local_f4e0,"area",&aStack_100cf);
  std::__cxx11::string::string(local_f4c0,"arena",&aStack_100d0);
  std::__cxx11::string::string(local_f4a0,"argue",&aStack_100d1);
  std::__cxx11::string::string(local_f480,"arm",&aStack_100d2);
  std::__cxx11::string::string(local_f460,"armed",&aStack_100d3);
  std::__cxx11::string::string(local_f440,"armor",&aStack_100d4);
  std::__cxx11::string::string(local_f420,"army",&aStack_100d5);
  std::__cxx11::string::string(local_f400,"around",&aStack_100d6);
  std::__cxx11::string::string(local_f3e0,"arrange",&aStack_100d7);
  std::__cxx11::string::string(local_f3c0,"arrest",&aStack_100d8);
  std::__cxx11::string::string(local_f3a0,"arrive",&aStack_100d9);
  std::__cxx11::string::string(local_f380,"arrow",&aStack_100da);
  std::__cxx11::string::string(local_f360,"art",&aStack_100db);
  std::__cxx11::string::string(local_f340,"artefact",&aStack_100dc);
  std::__cxx11::string::string(local_f320,"artist",&aStack_100dd);
  std::__cxx11::string::string(local_f300,"artwork",&aStack_100de);
  std::__cxx11::string::string(local_f2e0,"ask",&aStack_100df);
  std::__cxx11::string::string(local_f2c0,"aspect",&aStack_100e0);
  std::__cxx11::string::string(local_f2a0,"assault",&aStack_100e1);
  std::__cxx11::string::string(local_f280,"asset",&aStack_100e2);
  std::__cxx11::string::string(local_f260,"assist",&aStack_100e3);
  std::__cxx11::string::string(local_f240,"assume",&aStack_100e4);
  std::__cxx11::string::string(local_f220,"asthma",&aStack_100e5);
  std::__cxx11::string::string(local_f200,"athlete",&aStack_100e6);
  std::__cxx11::string::string(local_f1e0,"atom",&aStack_100e7);
  std::__cxx11::string::string(local_f1c0,"attack",&aStack_100e8);
  std::__cxx11::string::string(local_f1a0,"attend",&aStack_100e9);
  std::__cxx11::string::string(local_f180,"attitude",&aStack_100ea);
  std::__cxx11::string::string(local_f160,"attract",&aStack_100eb);
  std::__cxx11::string::string(local_f140,"auction",&aStack_100ec);
  std::__cxx11::string::string(local_f120,"audit",&aStack_100ed);
  std::__cxx11::string::string(local_f100,"august",&aStack_100ee);
  std::__cxx11::string::string(local_f0e0,"aunt",&aStack_100ef);
  std::__cxx11::string::string(local_f0c0,"author",&aStack_100f0);
  std::__cxx11::string::string(local_f0a0,"auto",&aStack_100f1);
  std::__cxx11::string::string(local_f080,"autumn",&aStack_100f2);
  std::__cxx11::string::string(local_f060,"average",&aStack_100f3);
  std::__cxx11::string::string(local_f040,"avocado",&aStack_100f4);
  std::__cxx11::string::string(local_f020,"avoid",&aStack_100f5);
  std::__cxx11::string::string(local_f000,"awake",&aStack_100f6);
  std::__cxx11::string::string(local_efe0,"aware",&aStack_100f7);
  std::__cxx11::string::string(local_efc0,"away",&aStack_100f8);
  std::__cxx11::string::string(local_efa0,"awesome",&aStack_100f9);
  std::__cxx11::string::string(local_ef80,"awful",&aStack_100fa);
  std::__cxx11::string::string(local_ef60,"awkward",&aStack_100fb);
  std::__cxx11::string::string(local_ef40,"axis",&aStack_100fc);
  std::__cxx11::string::string(local_ef20,"baby",&aStack_100fd);
  std::__cxx11::string::string(local_ef00,"bachelor",&aStack_100fe);
  std::__cxx11::string::string(local_eee0,"bacon",&aStack_100ff);
  std::__cxx11::string::string(local_eec0,"badge",&aStack_10100);
  std::__cxx11::string::string(local_eea0,"bag",&aStack_10101);
  std::__cxx11::string::string(local_ee80,"balance",&aStack_10102);
  std::__cxx11::string::string(local_ee60,"balcony",&aStack_10103);
  std::__cxx11::string::string(local_ee40,"ball",&aStack_10104);
  std::__cxx11::string::string(local_ee20,"bamboo",&aStack_10105);
  std::__cxx11::string::string(local_ee00,"banana",&aStack_10106);
  std::__cxx11::string::string(local_ede0,"banner",&aStack_10107);
  std::__cxx11::string::string(local_edc0,"bar",&aStack_10108);
  std::__cxx11::string::string(local_eda0,"barely",&aStack_10109);
  std::__cxx11::string::string(local_ed80,"bargain",&aStack_1010a);
  std::__cxx11::string::string(local_ed60,"barrel",&aStack_1010b);
  std::__cxx11::string::string(local_ed40,"base",&aStack_1010c);
  std::__cxx11::string::string(local_ed20,"basic",&aStack_1010d);
  std::__cxx11::string::string(local_ed00,"basket",&aStack_1010e);
  std::__cxx11::string::string(local_ece0,"battle",&aStack_1010f);
  std::__cxx11::string::string(local_ecc0,"beach",&aStack_10110);
  std::__cxx11::string::string(local_eca0,"bean",&aStack_10111);
  std::__cxx11::string::string(local_ec80,"beauty",&aStack_10112);
  std::__cxx11::string::string(local_ec60,"because",&aStack_10113);
  std::__cxx11::string::string(local_ec40,"become",&aStack_10114);
  std::__cxx11::string::string(local_ec20,"beef",&aStack_10115);
  std::__cxx11::string::string(local_ec00,"before",&aStack_10116);
  std::__cxx11::string::string(local_ebe0,"begin",&aStack_10117);
  std::__cxx11::string::string(local_ebc0,"behave",&aStack_10118);
  std::__cxx11::string::string(local_eba0,"behind",&aStack_10119);
  std::__cxx11::string::string(local_eb80,"believe",&aStack_1011a);
  std::__cxx11::string::string(local_eb60,"below",&aStack_1011b);
  std::__cxx11::string::string(local_eb40,"belt",&aStack_1011c);
  std::__cxx11::string::string(local_eb20,"bench",&aStack_1011d);
  std::__cxx11::string::string(local_eb00,"benefit",&aStack_1011e);
  std::__cxx11::string::string(local_eae0,"best",&aStack_1011f);
  std::__cxx11::string::string(local_eac0,"betray",&aStack_10120);
  std::__cxx11::string::string(local_eaa0,"better",&aStack_10121);
  std::__cxx11::string::string(local_ea80,"between",&aStack_10122);
  std::__cxx11::string::string(local_ea60,"beyond",&aStack_10123);
  std::__cxx11::string::string(local_ea40,"bicycle",&aStack_10124);
  std::__cxx11::string::string(local_ea20,"bid",&aStack_10125);
  std::__cxx11::string::string(local_ea00,"bike",&aStack_10126);
  std::__cxx11::string::string(local_e9e0,"bind",&aStack_10127);
  std::__cxx11::string::string(local_e9c0,"biology",&aStack_10128);
  std::__cxx11::string::string(local_e9a0,"bird",&aStack_10129);
  std::__cxx11::string::string(local_e980,"birth",&aStack_1012a);
  std::__cxx11::string::string(local_e960,"bitter",&aStack_1012b);
  std::__cxx11::string::string(local_e940,"black",&aStack_1012c);
  std::__cxx11::string::string(local_e920,"blade",&aStack_1012d);
  std::__cxx11::string::string(local_e900,"blame",&aStack_1012e);
  std::__cxx11::string::string(local_e8e0,"blanket",&aStack_1012f);
  std::__cxx11::string::string(local_e8c0,"blast",&aStack_10130);
  std::__cxx11::string::string(local_e8a0,"bleak",&aStack_10131);
  std::__cxx11::string::string(local_e880,"bless",&aStack_10132);
  std::__cxx11::string::string(local_e860,"blind",&aStack_10133);
  std::__cxx11::string::string(local_e840,"blood",&aStack_10134);
  std::__cxx11::string::string(local_e820,"blossom",&aStack_10135);
  std::__cxx11::string::string(local_e800,"blouse",&aStack_10136);
  std::__cxx11::string::string(local_e7e0,"blue",&aStack_10137);
  std::__cxx11::string::string(local_e7c0,"blur",&aStack_10138);
  std::__cxx11::string::string(local_e7a0,"blush",&aStack_10139);
  std::__cxx11::string::string(local_e780,"board",&aStack_1013a);
  std::__cxx11::string::string(local_e760,"boat",&aStack_1013b);
  std::__cxx11::string::string(local_e740,"body",&aStack_1013c);
  std::__cxx11::string::string(local_e720,"boil",&aStack_1013d);
  std::__cxx11::string::string(local_e700,"bomb",&aStack_1013e);
  std::__cxx11::string::string(local_e6e0,"bone",&aStack_1013f);
  std::__cxx11::string::string(local_e6c0,"bonus",&aStack_10140);
  std::__cxx11::string::string(local_e6a0,"book",&aStack_10141);
  std::__cxx11::string::string(local_e680,"boost",&aStack_10142);
  std::__cxx11::string::string(local_e660,"border",&aStack_10143);
  std::__cxx11::string::string(local_e640,"boring",&aStack_10144);
  std::__cxx11::string::string(local_e620,"borrow",&aStack_10145);
  std::__cxx11::string::string(local_e600,"boss",&aStack_10146);
  std::__cxx11::string::string(local_e5e0,"bottom",&aStack_10147);
  std::__cxx11::string::string(local_e5c0,"bounce",&aStack_10148);
  std::__cxx11::string::string(local_e5a0,"box",&aStack_10149);
  std::__cxx11::string::string(local_e580,"boy",&aStack_1014a);
  std::__cxx11::string::string(local_e560,"bracket",&aStack_1014b);
  std::__cxx11::string::string(local_e540,"brain",&aStack_1014c);
  std::__cxx11::string::string(local_e520,"brand",&aStack_1014d);
  std::__cxx11::string::string(local_e500,"brass",&aStack_1014e);
  std::__cxx11::string::string(local_e4e0,"brave",&aStack_1014f);
  std::__cxx11::string::string(local_e4c0,"bread",&aStack_10150);
  std::__cxx11::string::string(local_e4a0,"breeze",&aStack_10151);
  std::__cxx11::string::string(local_e480,"brick",&aStack_10152);
  std::__cxx11::string::string(local_e460,"bridge",&aStack_10153);
  std::__cxx11::string::string(local_e440,"brief",&aStack_10154);
  std::__cxx11::string::string(local_e420,"bright",&aStack_10155);
  std::__cxx11::string::string(local_e400,"bring",&aStack_10156);
  std::__cxx11::string::string(local_e3e0,"brisk",&aStack_10157);
  std::__cxx11::string::string(local_e3c0,"broccoli",&aStack_10158);
  std::__cxx11::string::string(local_e3a0,"broken",&aStack_10159);
  std::__cxx11::string::string(local_e380,"bronze",&aStack_1015a);
  std::__cxx11::string::string(local_e360,"broom",&aStack_1015b);
  std::__cxx11::string::string(local_e340,"brother",&aStack_1015c);
  std::__cxx11::string::string(local_e320,"brown",&aStack_1015d);
  std::__cxx11::string::string(local_e300,"brush",&aStack_1015e);
  std::__cxx11::string::string(local_e2e0,"bubble",&aStack_1015f);
  std::__cxx11::string::string(local_e2c0,"buddy",&aStack_10160);
  std::__cxx11::string::string(local_e2a0,"budget",&aStack_10161);
  std::__cxx11::string::string(local_e280,"buffalo",&aStack_10162);
  std::__cxx11::string::string(local_e260,"build",&aStack_10163);
  std::__cxx11::string::string(local_e240,"bulb",&aStack_10164);
  std::__cxx11::string::string(local_e220,"bulk",&aStack_10165);
  std::__cxx11::string::string(local_e200,"bullet",&aStack_10166);
  std::__cxx11::string::string(local_e1e0,"bundle",&aStack_10167);
  std::__cxx11::string::string(local_e1c0,"bunker",&aStack_10168);
  std::__cxx11::string::string(local_e1a0,"burden",&aStack_10169);
  std::__cxx11::string::string(local_e180,"burger",&aStack_1016a);
  std::__cxx11::string::string(local_e160,"burst",&aStack_1016b);
  std::__cxx11::string::string(local_e140,"bus",&aStack_1016c);
  std::__cxx11::string::string(local_e120,"business",&aStack_1016d);
  std::__cxx11::string::string(local_e100,"busy",&aStack_1016e);
  std::__cxx11::string::string(local_e0e0,"butter",&aStack_1016f);
  std::__cxx11::string::string(local_e0c0,"buyer",&aStack_10170);
  std::__cxx11::string::string(local_e0a0,"buzz",&aStack_10171);
  std::__cxx11::string::string(local_e080,"cabbage",&aStack_10172);
  std::__cxx11::string::string(local_e060,"cabin",&aStack_10173);
  std::__cxx11::string::string(local_e040,"cable",&aStack_10174);
  std::__cxx11::string::string(local_e020,"cactus",&aStack_10175);
  std::__cxx11::string::string(local_e000,"cage",&aStack_10176);
  std::__cxx11::string::string(local_dfe0,"cake",&aStack_10177);
  std::__cxx11::string::string(local_dfc0,"call",&aStack_10178);
  std::__cxx11::string::string(local_dfa0,"calm",&aStack_10179);
  std::__cxx11::string::string(local_df80,"camera",&aStack_1017a);
  std::__cxx11::string::string(local_df60,"camp",&aStack_1017b);
  std::__cxx11::string::string(local_df40,"can",&aStack_1017c);
  std::__cxx11::string::string(local_df20,"canal",&aStack_1017d);
  std::__cxx11::string::string(local_df00,"cancel",&aStack_1017e);
  std::__cxx11::string::string(local_dee0,"candy",&aStack_1017f);
  std::__cxx11::string::string(local_dec0,"cannon",&aStack_10180);
  std::__cxx11::string::string(local_dea0,"canoe",&aStack_10181);
  std::__cxx11::string::string(local_de80,"canvas",&aStack_10182);
  std::__cxx11::string::string(local_de60,"canyon",&aStack_10183);
  std::__cxx11::string::string(local_de40,"capable",&aStack_10184);
  std::__cxx11::string::string(local_de20,"capital",&aStack_10185);
  std::__cxx11::string::string(local_de00,"captain",&aStack_10186);
  std::__cxx11::string::string(local_dde0,"car",&aStack_10187);
  std::__cxx11::string::string(local_ddc0,"carbon",&aStack_10188);
  std::__cxx11::string::string(local_dda0,"card",&aStack_10189);
  std::__cxx11::string::string(local_dd80,"cargo",&aStack_1018a);
  std::__cxx11::string::string(local_dd60,"carpet",&aStack_1018b);
  std::__cxx11::string::string(local_dd40,"carry",&aStack_1018c);
  std::__cxx11::string::string(local_dd20,"cart",&aStack_1018d);
  std::__cxx11::string::string(local_dd00,"case",&aStack_1018e);
  std::__cxx11::string::string(local_dce0,"cash",&aStack_1018f);
  std::__cxx11::string::string(local_dcc0,"casino",&aStack_10190);
  std::__cxx11::string::string(local_dca0,"castle",&aStack_10191);
  std::__cxx11::string::string(local_dc80,"casual",&aStack_10192);
  std::__cxx11::string::string(local_dc60,"cat",&aStack_10193);
  std::__cxx11::string::string(local_dc40,"catalog",&aStack_10194);
  std::__cxx11::string::string(local_dc20,"catch",&aStack_10195);
  std::__cxx11::string::string(local_dc00,"category",&aStack_10196);
  std::__cxx11::string::string(local_dbe0,"cattle",&aStack_10197);
  std::__cxx11::string::string(local_dbc0,"caught",&aStack_10198);
  std::__cxx11::string::string(local_dba0,"cause",&aStack_10199);
  std::__cxx11::string::string(local_db80,"caution",&aStack_1019a);
  std::__cxx11::string::string(local_db60,"cave",&aStack_1019b);
  std::__cxx11::string::string(local_db40,"ceiling",&aStack_1019c);
  std::__cxx11::string::string(local_db20,"celery",&aStack_1019d);
  std::__cxx11::string::string(local_db00,"cement",&aStack_1019e);
  std::__cxx11::string::string(local_dae0,"census",&aStack_1019f);
  std::__cxx11::string::string(local_dac0,"century",&aStack_101a0);
  std::__cxx11::string::string(local_daa0,"cereal",&aStack_101a1);
  std::__cxx11::string::string(local_da80,"certain",&aStack_101a2);
  std::__cxx11::string::string(local_da60,"chair",&aStack_101a3);
  std::__cxx11::string::string(local_da40,"chalk",&aStack_101a4);
  std::__cxx11::string::string(local_da20,"champion",&aStack_101a5);
  std::__cxx11::string::string(local_da00,"change",&aStack_101a6);
  std::__cxx11::string::string(local_d9e0,"chaos",&aStack_101a7);
  std::__cxx11::string::string(local_d9c0,"chapter",&aStack_101a8);
  std::__cxx11::string::string(local_d9a0,"charge",&aStack_101a9);
  std::__cxx11::string::string(local_d980,"chase",&aStack_101aa);
  std::__cxx11::string::string(local_d960,"chat",&aStack_101ab);
  std::__cxx11::string::string(local_d940,"cheap",&aStack_101ac);
  std::__cxx11::string::string(local_d920,"check",&aStack_101ad);
  std::__cxx11::string::string(local_d900,"cheese",&aStack_101ae);
  std::__cxx11::string::string(local_d8e0,"chef",&aStack_101af);
  std::__cxx11::string::string(local_d8c0,"cherry",&aStack_101b0);
  std::__cxx11::string::string(local_d8a0,"chest",&aStack_101b1);
  std::__cxx11::string::string(local_d880,"chicken",&aStack_101b2);
  std::__cxx11::string::string(local_d860,"chief",&aStack_101b3);
  std::__cxx11::string::string(local_d840,"child",&aStack_101b4);
  std::__cxx11::string::string(local_d820,"chimney",&aStack_101b5);
  std::__cxx11::string::string(local_d800,"choice",&aStack_101b6);
  std::__cxx11::string::string(local_d7e0,"choose",&aStack_101b7);
  std::__cxx11::string::string(local_d7c0,"chronic",&aStack_101b8);
  std::__cxx11::string::string(local_d7a0,"chuckle",&aStack_101b9);
  std::__cxx11::string::string(local_d780,"chunk",&aStack_101ba);
  std::__cxx11::string::string(local_d760,"churn",&aStack_101bb);
  std::__cxx11::string::string(local_d740,"cigar",&aStack_101bc);
  std::__cxx11::string::string(local_d720,"cinnamon",&aStack_101bd);
  std::__cxx11::string::string(local_d700,"circle",&aStack_101be);
  std::__cxx11::string::string(local_d6e0,"citizen",&aStack_101bf);
  std::__cxx11::string::string(local_d6c0,"city",&aStack_101c0);
  std::__cxx11::string::string(local_d6a0,"civil",&aStack_101c1);
  std::__cxx11::string::string(local_d680,"claim",&aStack_101c2);
  std::__cxx11::string::string(local_d660,"clap",&aStack_101c3);
  std::__cxx11::string::string(local_d640,"clarify",&aStack_101c4);
  std::__cxx11::string::string(local_d620,"claw",&aStack_101c5);
  std::__cxx11::string::string(local_d600,"clay",&aStack_101c6);
  std::__cxx11::string::string(local_d5e0,"clean",&aStack_101c7);
  std::__cxx11::string::string(local_d5c0,"clerk",&aStack_101c8);
  std::__cxx11::string::string(local_d5a0,"clever",&aStack_101c9);
  std::__cxx11::string::string(local_d580,"click",&aStack_101ca);
  std::__cxx11::string::string(local_d560,"client",&aStack_101cb);
  std::__cxx11::string::string(local_d540,"cliff",&aStack_101cc);
  std::__cxx11::string::string(local_d520,"climb",&aStack_101cd);
  std::__cxx11::string::string(local_d500,"clinic",&aStack_101ce);
  std::__cxx11::string::string(local_d4e0,"clip",&aStack_101cf);
  std::__cxx11::string::string(local_d4c0,"clock",&aStack_101d0);
  std::__cxx11::string::string(local_d4a0,"clog",&aStack_101d1);
  std::__cxx11::string::string(local_d480,"close",&aStack_101d2);
  std::__cxx11::string::string(local_d460,"cloth",&aStack_101d3);
  std::__cxx11::string::string(local_d440,"cloud",&aStack_101d4);
  std::__cxx11::string::string(local_d420,"clown",&aStack_101d5);
  std::__cxx11::string::string(local_d400,"club",&aStack_101d6);
  std::__cxx11::string::string(local_d3e0,"clump",&aStack_101d7);
  std::__cxx11::string::string(local_d3c0,"cluster",&aStack_101d8);
  std::__cxx11::string::string(local_d3a0,"clutch",&aStack_101d9);
  std::__cxx11::string::string(local_d380,"coach",&aStack_101da);
  std::__cxx11::string::string(local_d360,"coast",&aStack_101db);
  std::__cxx11::string::string(local_d340,"coconut",&aStack_101dc);
  std::__cxx11::string::string(local_d320,"code",&aStack_101dd);
  std::__cxx11::string::string(local_d300,"coffee",&aStack_101de);
  std::__cxx11::string::string(local_d2e0,"coil",&aStack_101df);
  std::__cxx11::string::string(local_d2c0,"coin",&aStack_101e0);
  std::__cxx11::string::string(local_d2a0,"collect",&aStack_101e1);
  std::__cxx11::string::string(local_d280,"color",&aStack_101e2);
  std::__cxx11::string::string(local_d260,"column",&aStack_101e3);
  std::__cxx11::string::string(local_d240,"combine",&aStack_101e4);
  std::__cxx11::string::string(local_d220,"come",&aStack_101e5);
  std::__cxx11::string::string(local_d200,"comfort",&aStack_101e6);
  std::__cxx11::string::string(local_d1e0,"comic",&aStack_101e7);
  std::__cxx11::string::string(local_d1c0,"common",&aStack_101e8);
  std::__cxx11::string::string(local_d1a0,"company",&aStack_101e9);
  std::__cxx11::string::string(local_d180,"concert",&aStack_101ea);
  std::__cxx11::string::string(local_d160,"conduct",&aStack_101eb);
  std::__cxx11::string::string(local_d140,"confirm",&aStack_101ec);
  std::__cxx11::string::string(local_d120,"congress",&aStack_101ed);
  std::__cxx11::string::string(local_d100,"connect",&aStack_101ee);
  std::__cxx11::string::string(local_d0e0,"consider",&aStack_101ef);
  std::__cxx11::string::string(local_d0c0,"control",&aStack_101f0);
  std::__cxx11::string::string(local_d0a0,"convince",&aStack_101f1);
  std::__cxx11::string::string(local_d080,"cook",&aStack_101f2);
  std::__cxx11::string::string(local_d060,"cool",&aStack_101f3);
  std::__cxx11::string::string(local_d040,"copper",&aStack_101f4);
  std::__cxx11::string::string(local_d020,"copy",&aStack_101f5);
  std::__cxx11::string::string(local_d000,"coral",&aStack_101f6);
  std::__cxx11::string::string(local_cfe0,"core",&aStack_101f7);
  std::__cxx11::string::string(local_cfc0,"corn",&aStack_101f8);
  std::__cxx11::string::string(local_cfa0,"correct",&aStack_101f9);
  std::__cxx11::string::string(local_cf80,"cost",&aStack_101fa);
  std::__cxx11::string::string(local_cf60,"cotton",&aStack_101fb);
  std::__cxx11::string::string(local_cf40,"couch",&aStack_101fc);
  std::__cxx11::string::string(local_cf20,"country",&aStack_101fd);
  std::__cxx11::string::string(local_cf00,"couple",&aStack_101fe);
  std::__cxx11::string::string(local_cee0,"course",&aStack_101ff);
  std::__cxx11::string::string(local_cec0,"cousin",&aStack_10200);
  std::__cxx11::string::string(local_cea0,"cover",&aStack_10201);
  std::__cxx11::string::string(local_ce80,"coyote",&aStack_10202);
  std::__cxx11::string::string(local_ce60,"crack",&aStack_10203);
  std::__cxx11::string::string(local_ce40,"cradle",&aStack_10204);
  std::__cxx11::string::string(local_ce20,"craft",&aStack_10205);
  std::__cxx11::string::string(local_ce00,"cram",&aStack_10206);
  std::__cxx11::string::string(local_cde0,"crane",&aStack_10207);
  std::__cxx11::string::string(local_cdc0,"crash",&aStack_10208);
  std::__cxx11::string::string(local_cda0,"crater",&aStack_10209);
  std::__cxx11::string::string(local_cd80,"crawl",&aStack_1020a);
  std::__cxx11::string::string(local_cd60,"crazy",&aStack_1020b);
  std::__cxx11::string::string(local_cd40,"cream",&aStack_1020c);
  std::__cxx11::string::string(local_cd20,"credit",&aStack_1020d);
  std::__cxx11::string::string(local_cd00,"creek",&aStack_1020e);
  std::__cxx11::string::string(local_cce0,"crew",&aStack_1020f);
  std::__cxx11::string::string(local_ccc0,"cricket",&aStack_10210);
  std::__cxx11::string::string(local_cca0,"crime",&aStack_10211);
  std::__cxx11::string::string(local_cc80,"crisp",&aStack_10212);
  std::__cxx11::string::string(local_cc60,"critic",&aStack_10213);
  std::__cxx11::string::string(local_cc40,"crop",&aStack_10214);
  std::__cxx11::string::string(local_cc20,"cross",&aStack_10215);
  std::__cxx11::string::string(local_cc00,"crouch",&aStack_10216);
  std::__cxx11::string::string(local_cbe0,"crowd",&aStack_10217);
  std::__cxx11::string::string(local_cbc0,"crucial",&aStack_10218);
  std::__cxx11::string::string(local_cba0,"cruel",&aStack_10219);
  std::__cxx11::string::string(local_cb80,"cruise",&aStack_1021a);
  std::__cxx11::string::string(local_cb60,"crumble",&aStack_1021b);
  std::__cxx11::string::string(local_cb40,"crunch",&aStack_1021c);
  std::__cxx11::string::string(local_cb20,"crush",&aStack_1021d);
  std::__cxx11::string::string(local_cb00,"cry",&aStack_1021e);
  std::__cxx11::string::string(local_cae0,"crystal",&aStack_1021f);
  std::__cxx11::string::string(local_cac0,"cube",&aStack_10220);
  std::__cxx11::string::string(local_caa0,"culture",&aStack_10221);
  std::__cxx11::string::string(local_ca80,"cup",&aStack_10222);
  std::__cxx11::string::string(local_ca60,"cupboard",&aStack_10223);
  std::__cxx11::string::string(local_ca40,"curious",&aStack_10224);
  std::__cxx11::string::string(local_ca20,"current",&aStack_10225);
  std::__cxx11::string::string(local_ca00,"curtain",&aStack_10226);
  std::__cxx11::string::string(local_c9e0,"curve",&aStack_10227);
  std::__cxx11::string::string(local_c9c0,"cushion",&aStack_10228);
  std::__cxx11::string::string(local_c9a0,"custom",&aStack_10229);
  std::__cxx11::string::string(local_c980,"cute",&aStack_1022a);
  std::__cxx11::string::string(local_c960,"cycle",&aStack_1022b);
  std::__cxx11::string::string(local_c940,"dad",&aStack_1022c);
  std::__cxx11::string::string(local_c920,"damage",&aStack_1022d);
  std::__cxx11::string::string(local_c900,"damp",&aStack_1022e);
  std::__cxx11::string::string(local_c8e0,"dance",&aStack_1022f);
  std::__cxx11::string::string(local_c8c0,"danger",&aStack_10230);
  std::__cxx11::string::string(local_c8a0,"daring",&aStack_10231);
  std::__cxx11::string::string(local_c880,"dash",&aStack_10232);
  std::__cxx11::string::string(local_c860,"daughter",&aStack_10233);
  std::__cxx11::string::string(local_c840,"dawn",&aStack_10234);
  std::__cxx11::string::string(local_c820,"day",&aStack_10235);
  std::__cxx11::string::string(local_c800,"deal",&aStack_10236);
  std::__cxx11::string::string(local_c7e0,"debate",&aStack_10237);
  std::__cxx11::string::string(local_c7c0,"debris",&aStack_10238);
  std::__cxx11::string::string(local_c7a0,"decade",&aStack_10239);
  std::__cxx11::string::string(local_c780,"december",&aStack_1023a);
  std::__cxx11::string::string(local_c760,"decide",&aStack_1023b);
  std::__cxx11::string::string(local_c740,"decline",&aStack_1023c);
  std::__cxx11::string::string(local_c720,"decorate",&aStack_1023d);
  std::__cxx11::string::string(local_c700,"decrease",&aStack_1023e);
  std::__cxx11::string::string(local_c6e0,"deer",&aStack_1023f);
  std::__cxx11::string::string(local_c6c0,"defense",&aStack_10240);
  std::__cxx11::string::string(local_c6a0,"define",&aStack_10241);
  std::__cxx11::string::string(local_c680,"defy",&aStack_10242);
  std::__cxx11::string::string(local_c660,"degree",&aStack_10243);
  std::__cxx11::string::string(local_c640,"delay",&aStack_10244);
  std::__cxx11::string::string(local_c620,"deliver",&aStack_10245);
  std::__cxx11::string::string(local_c600,"demand",&aStack_10246);
  std::__cxx11::string::string(local_c5e0,"demise",&aStack_10247);
  std::__cxx11::string::string(local_c5c0,"denial",&aStack_10248);
  std::__cxx11::string::string(local_c5a0,"dentist",&aStack_10249);
  std::__cxx11::string::string(local_c580,"deny",&aStack_1024a);
  std::__cxx11::string::string(local_c560,"depart",&aStack_1024b);
  std::__cxx11::string::string(local_c540,"depend",&aStack_1024c);
  std::__cxx11::string::string(local_c520,"deposit",&aStack_1024d);
  std::__cxx11::string::string(local_c500,"depth",&aStack_1024e);
  std::__cxx11::string::string(local_c4e0,"deputy",&aStack_1024f);
  std::__cxx11::string::string(local_c4c0,"derive",&aStack_10250);
  std::__cxx11::string::string(local_c4a0,"describe",&aStack_10251);
  std::__cxx11::string::string(local_c480,"desert",&aStack_10252);
  std::__cxx11::string::string(local_c460,"design",&aStack_10253);
  std::__cxx11::string::string(local_c440,"desk",&aStack_10254);
  std::__cxx11::string::string(local_c420,"despair",&aStack_10255);
  std::__cxx11::string::string(local_c400,"destroy",&aStack_10256);
  std::__cxx11::string::string(local_c3e0,"detail",&aStack_10257);
  std::__cxx11::string::string(local_c3c0,"detect",&aStack_10258);
  std::__cxx11::string::string(local_c3a0,"develop",&aStack_10259);
  std::__cxx11::string::string(local_c380,"device",&aStack_1025a);
  std::__cxx11::string::string(local_c360,"devote",&aStack_1025b);
  std::__cxx11::string::string(local_c340,"diagram",&aStack_1025c);
  std::__cxx11::string::string(local_c320,"dial",&aStack_1025d);
  std::__cxx11::string::string(local_c300,"diamond",&aStack_1025e);
  std::__cxx11::string::string(local_c2e0,"diary",&aStack_1025f);
  std::__cxx11::string::string(local_c2c0,"dice",&aStack_10260);
  std::__cxx11::string::string(local_c2a0,"diesel",&aStack_10261);
  std::__cxx11::string::string(local_c280,"diet",&aStack_10262);
  std::__cxx11::string::string(local_c260,"differ",&aStack_10263);
  std::__cxx11::string::string(local_c240,"digital",&aStack_10264);
  std::__cxx11::string::string(local_c220,"dignity",&aStack_10265);
  std::__cxx11::string::string(local_c200,"dilemma",&aStack_10266);
  std::__cxx11::string::string(local_c1e0,"dinner",&aStack_10267);
  std::__cxx11::string::string(local_c1c0,"dinosaur",&aStack_10268);
  std::__cxx11::string::string(local_c1a0,"direct",&aStack_10269);
  std::__cxx11::string::string(local_c180,"dirt",&aStack_1026a);
  std::__cxx11::string::string(local_c160,"disagree",&aStack_1026b);
  std::__cxx11::string::string(local_c140,"discover",&aStack_1026c);
  std::__cxx11::string::string(local_c120,"disease",&aStack_1026d);
  std::__cxx11::string::string(local_c100,"dish",&aStack_1026e);
  std::__cxx11::string::string(local_c0e0,"dismiss",&aStack_1026f);
  std::__cxx11::string::string(local_c0c0,"disorder",&aStack_10270);
  std::__cxx11::string::string(local_c0a0,"display",&aStack_10271);
  std::__cxx11::string::string(local_c080,"distance",&aStack_10272);
  std::__cxx11::string::string(local_c060,"divert",&aStack_10273);
  std::__cxx11::string::string(local_c040,"divide",&aStack_10274);
  std::__cxx11::string::string(local_c020,"divorce",&aStack_10275);
  std::__cxx11::string::string(local_c000,"dizzy",&aStack_10276);
  std::__cxx11::string::string(local_bfe0,"doctor",&aStack_10277);
  std::__cxx11::string::string(local_bfc0,"document",&aStack_10278);
  std::__cxx11::string::string(local_bfa0,"dog",&aStack_10279);
  std::__cxx11::string::string(local_bf80,"doll",&aStack_1027a);
  std::__cxx11::string::string(local_bf60,"dolphin",&aStack_1027b);
  std::__cxx11::string::string(local_bf40,"domain",&aStack_1027c);
  std::__cxx11::string::string(local_bf20,"donate",&aStack_1027d);
  std::__cxx11::string::string(local_bf00,"donkey",&aStack_1027e);
  std::__cxx11::string::string(local_bee0,"donor",&aStack_1027f);
  std::__cxx11::string::string(local_bec0,"door",&aStack_10280);
  std::__cxx11::string::string(local_bea0,"dose",&aStack_10281);
  std::__cxx11::string::string(local_be80,"double",&aStack_10282);
  std::__cxx11::string::string(local_be60,"dove",&aStack_10283);
  std::__cxx11::string::string(local_be40,"draft",&aStack_10284);
  std::__cxx11::string::string(local_be20,"dragon",&aStack_10285);
  std::__cxx11::string::string(local_be00,"drama",&aStack_10286);
  std::__cxx11::string::string(local_bde0,"drastic",&aStack_10287);
  std::__cxx11::string::string(local_bdc0,"draw",&aStack_10288);
  std::__cxx11::string::string(local_bda0,"dream",&aStack_10289);
  std::__cxx11::string::string(local_bd80,"dress",&aStack_1028a);
  std::__cxx11::string::string(local_bd60,"drift",&aStack_1028b);
  std::__cxx11::string::string(local_bd40,"drill",&aStack_1028c);
  std::__cxx11::string::string(local_bd20,"drink",&aStack_1028d);
  std::__cxx11::string::string(local_bd00,"drip",&aStack_1028e);
  std::__cxx11::string::string(local_bce0,"drive",&aStack_1028f);
  std::__cxx11::string::string(local_bcc0,"drop",&aStack_10290);
  std::__cxx11::string::string(local_bca0,"drum",&aStack_10291);
  std::__cxx11::string::string(local_bc80,"dry",&aStack_10292);
  std::__cxx11::string::string(local_bc60,"duck",&aStack_10293);
  std::__cxx11::string::string(local_bc40,"dumb",&aStack_10294);
  std::__cxx11::string::string(local_bc20,"dune",&aStack_10295);
  std::__cxx11::string::string(local_bc00,"during",&aStack_10296);
  std::__cxx11::string::string(local_bbe0,"dust",&aStack_10297);
  std::__cxx11::string::string(local_bbc0,"dutch",&aStack_10298);
  std::__cxx11::string::string(local_bba0,"duty",&aStack_10299);
  std::__cxx11::string::string(local_bb80,"dwarf",&aStack_1029a);
  std::__cxx11::string::string(local_bb60,"dynamic",&aStack_1029b);
  std::__cxx11::string::string(local_bb40,"eager",&aStack_1029c);
  std::__cxx11::string::string(local_bb20,"eagle",&aStack_1029d);
  std::__cxx11::string::string(local_bb00,"early",&aStack_1029e);
  std::__cxx11::string::string(local_bae0,"earn",&aStack_1029f);
  std::__cxx11::string::string(local_bac0,"earth",&aStack_102a0);
  std::__cxx11::string::string(local_baa0,"easily",&aStack_102a1);
  std::__cxx11::string::string(local_ba80,"east",&aStack_102a2);
  std::__cxx11::string::string(local_ba60,"easy",&aStack_102a3);
  std::__cxx11::string::string(local_ba40,"echo",&aStack_102a4);
  std::__cxx11::string::string(local_ba20,"ecology",&aStack_102a5);
  std::__cxx11::string::string(local_ba00,"economy",&aStack_102a6);
  std::__cxx11::string::string(local_b9e0,"edge",&aStack_102a7);
  std::__cxx11::string::string(local_b9c0,"edit",&aStack_102a8);
  std::__cxx11::string::string(local_b9a0,"educate",&aStack_102a9);
  std::__cxx11::string::string(local_b980,"effort",&aStack_102aa);
  std::__cxx11::string::string(local_b960,"egg",&aStack_102ab);
  std::__cxx11::string::string(local_b940,"eight",&aStack_102ac);
  std::__cxx11::string::string(local_b920,"either",&aStack_102ad);
  std::__cxx11::string::string(local_b900,"elbow",&aStack_102ae);
  std::__cxx11::string::string(local_b8e0,"elder",&aStack_102af);
  std::__cxx11::string::string(local_b8c0,"electric",&aStack_102b0);
  std::__cxx11::string::string(local_b8a0,"elegant",&aStack_102b1);
  std::__cxx11::string::string(local_b880,"element",&aStack_102b2);
  std::__cxx11::string::string(local_b860,"elephant",&aStack_102b3);
  std::__cxx11::string::string(local_b840,"elevator",&aStack_102b4);
  std::__cxx11::string::string(local_b820,"elite",&aStack_102b5);
  std::__cxx11::string::string(local_b800,"else",&aStack_102b6);
  std::__cxx11::string::string(local_b7e0,"embark",&aStack_102b7);
  std::__cxx11::string::string(local_b7c0,"embody",&aStack_102b8);
  std::__cxx11::string::string(local_b7a0,"embrace",&aStack_102b9);
  std::__cxx11::string::string(local_b780,"emerge",&aStack_102ba);
  std::__cxx11::string::string(local_b760,"emotion",&aStack_102bb);
  std::__cxx11::string::string(local_b740,"employ",&aStack_102bc);
  std::__cxx11::string::string(local_b720,"empower",&aStack_102bd);
  std::__cxx11::string::string(local_b700,"empty",&aStack_102be);
  std::__cxx11::string::string(local_b6e0,"enable",&aStack_102bf);
  std::__cxx11::string::string(local_b6c0,"enact",&aStack_102c0);
  std::__cxx11::string::string(local_b6a0,"end",&aStack_102c1);
  std::__cxx11::string::string(local_b680,"endless",&aStack_102c2);
  std::__cxx11::string::string(local_b660,"endorse",&aStack_102c3);
  std::__cxx11::string::string(local_b640,"enemy",&aStack_102c4);
  std::__cxx11::string::string(local_b620,"energy",&aStack_102c5);
  std::__cxx11::string::string(local_b600,"enforce",&aStack_102c6);
  std::__cxx11::string::string(local_b5e0,"engage",&aStack_102c7);
  std::__cxx11::string::string(local_b5c0,"engine",&aStack_102c8);
  std::__cxx11::string::string(local_b5a0,"enhance",&aStack_102c9);
  std::__cxx11::string::string(local_b580,"enjoy",&aStack_102ca);
  std::__cxx11::string::string(local_b560,"enlist",&aStack_102cb);
  std::__cxx11::string::string(local_b540,"enough",&aStack_102cc);
  std::__cxx11::string::string(local_b520,"enrich",&aStack_102cd);
  std::__cxx11::string::string(local_b500,"enroll",&aStack_102ce);
  std::__cxx11::string::string(local_b4e0,"ensure",&aStack_102cf);
  std::__cxx11::string::string(local_b4c0,"enter",&aStack_102d0);
  std::__cxx11::string::string(local_b4a0,"entire",&aStack_102d1);
  std::__cxx11::string::string(local_b480,"entry",&aStack_102d2);
  std::__cxx11::string::string(local_b460,"envelope",&aStack_102d3);
  std::__cxx11::string::string(local_b440,"episode",&aStack_102d4);
  std::__cxx11::string::string(local_b420,"equal",&aStack_102d5);
  std::__cxx11::string::string(local_b400,"equip",&aStack_102d6);
  std::__cxx11::string::string(local_b3e0,"era",&aStack_102d7);
  std::__cxx11::string::string(local_b3c0,"erase",&aStack_102d8);
  std::__cxx11::string::string(local_b3a0,"erode",&aStack_102d9);
  std::__cxx11::string::string(local_b380,"erosion",&aStack_102da);
  std::__cxx11::string::string(local_b360,"error",&aStack_102db);
  std::__cxx11::string::string(local_b340,"erupt",&aStack_102dc);
  std::__cxx11::string::string(local_b320,"escape",&aStack_102dd);
  std::__cxx11::string::string(local_b300,"essay",&aStack_102de);
  std::__cxx11::string::string(local_b2e0,"essence",&aStack_102df);
  std::__cxx11::string::string(local_b2c0,"estate",&aStack_102e0);
  std::__cxx11::string::string(local_b2a0,"eternal",&aStack_102e1);
  std::__cxx11::string::string(local_b280,"ethics",&aStack_102e2);
  std::__cxx11::string::string(local_b260,"evidence",&aStack_102e3);
  std::__cxx11::string::string(local_b240,"evil",&aStack_102e4);
  std::__cxx11::string::string(local_b220,"evoke",&aStack_102e5);
  std::__cxx11::string::string(local_b200,"evolve",&aStack_102e6);
  std::__cxx11::string::string(local_b1e0,"exact",&aStack_102e7);
  std::__cxx11::string::string(local_b1c0,"example",&aStack_102e8);
  std::__cxx11::string::string(local_b1a0,"excess",&aStack_102e9);
  std::__cxx11::string::string(local_b180,"exchange",&aStack_102ea);
  std::__cxx11::string::string(local_b160,"excite",&aStack_102eb);
  std::__cxx11::string::string(local_b140,"exclude",&aStack_102ec);
  std::__cxx11::string::string(local_b120,"excuse",&aStack_102ed);
  std::__cxx11::string::string(local_b100,"execute",&aStack_102ee);
  std::__cxx11::string::string(local_b0e0,"exercise",&aStack_102ef);
  std::__cxx11::string::string(local_b0c0,"exhaust",&aStack_102f0);
  std::__cxx11::string::string(local_b0a0,"exhibit",&aStack_102f1);
  std::__cxx11::string::string(local_b080,"exile",&aStack_102f2);
  std::__cxx11::string::string(local_b060,"exist",&aStack_102f3);
  std::__cxx11::string::string(local_b040,"exit",&aStack_102f4);
  std::__cxx11::string::string(local_b020,"exotic",&aStack_102f5);
  std::__cxx11::string::string(local_b000,"expand",&aStack_102f6);
  std::__cxx11::string::string(local_afe0,"expect",&aStack_102f7);
  std::__cxx11::string::string(local_afc0,"expire",&aStack_102f8);
  std::__cxx11::string::string(local_afa0,"explain",&aStack_102f9);
  std::__cxx11::string::string(local_af80,"expose",&aStack_102fa);
  std::__cxx11::string::string(local_af60,"express",&aStack_102fb);
  std::__cxx11::string::string(local_af40,"extend",&aStack_102fc);
  std::__cxx11::string::string(local_af20,"extra",&aStack_102fd);
  std::__cxx11::string::string(local_af00,"eye",&aStack_102fe);
  std::__cxx11::string::string(local_aee0,"eyebrow",&aStack_102ff);
  std::__cxx11::string::string(local_aec0,"fabric",&aStack_10300);
  std::__cxx11::string::string(local_aea0,"face",&aStack_10301);
  std::__cxx11::string::string(local_ae80,"faculty",&aStack_10302);
  std::__cxx11::string::string(local_ae60,"fade",&aStack_10303);
  std::__cxx11::string::string(local_ae40,"faint",&aStack_10304);
  std::__cxx11::string::string(local_ae20,"faith",&aStack_10305);
  std::__cxx11::string::string(local_ae00,"fall",&aStack_10306);
  std::__cxx11::string::string(local_ade0,"false",&aStack_10307);
  std::__cxx11::string::string(local_adc0,"fame",&aStack_10308);
  std::__cxx11::string::string(local_ada0,"family",&aStack_10309);
  std::__cxx11::string::string(local_ad80,"famous",&aStack_1030a);
  std::__cxx11::string::string(local_ad60,"fan",&aStack_1030b);
  std::__cxx11::string::string(local_ad40,"fancy",&aStack_1030c);
  std::__cxx11::string::string(local_ad20,"fantasy",&aStack_1030d);
  std::__cxx11::string::string(local_ad00,"farm",&aStack_1030e);
  std::__cxx11::string::string(local_ace0,"fashion",&aStack_1030f);
  std::__cxx11::string::string(local_acc0,"fat",&aStack_10310);
  std::__cxx11::string::string(local_aca0,"fatal",&aStack_10311);
  std::__cxx11::string::string(local_ac80,"father",&aStack_10312);
  std::__cxx11::string::string(local_ac60,"fatigue",&aStack_10313);
  std::__cxx11::string::string(local_ac40,"fault",&aStack_10314);
  std::__cxx11::string::string(local_ac20,"favorite",&aStack_10315);
  std::__cxx11::string::string(local_ac00,"feature",&aStack_10316);
  std::__cxx11::string::string(local_abe0,"february",&aStack_10317);
  std::__cxx11::string::string(local_abc0,"federal",&aStack_10318);
  std::__cxx11::string::string(local_aba0,"fee",&aStack_10319);
  std::__cxx11::string::string(local_ab80,"feed",&aStack_1031a);
  std::__cxx11::string::string(local_ab60,"feel",&aStack_1031b);
  std::__cxx11::string::string(local_ab40,"female",&aStack_1031c);
  std::__cxx11::string::string(local_ab20,"fence",&aStack_1031d);
  std::__cxx11::string::string(local_ab00,"festival",&aStack_1031e);
  std::__cxx11::string::string(local_aae0,"fetch",&aStack_1031f);
  std::__cxx11::string::string(local_aac0,"fever",&aStack_10320);
  std::__cxx11::string::string(local_aaa0,"few",&aStack_10321);
  std::__cxx11::string::string(local_aa80,"fiber",&aStack_10322);
  std::__cxx11::string::string(local_aa60,"fiction",&aStack_10323);
  std::__cxx11::string::string(local_aa40,"field",&aStack_10324);
  std::__cxx11::string::string(local_aa20,"figure",&aStack_10325);
  std::__cxx11::string::string(local_aa00,"file",&aStack_10326);
  std::__cxx11::string::string(local_a9e0,"film",&aStack_10327);
  std::__cxx11::string::string(local_a9c0,"filter",&aStack_10328);
  std::__cxx11::string::string(local_a9a0,"final",&aStack_10329);
  std::__cxx11::string::string(local_a980,"find",&aStack_1032a);
  std::__cxx11::string::string(local_a960,"fine",&aStack_1032b);
  std::__cxx11::string::string(local_a940,"finger",&aStack_1032c);
  std::__cxx11::string::string(local_a920,"finish",&aStack_1032d);
  std::__cxx11::string::string(local_a900,"fire",&aStack_1032e);
  std::__cxx11::string::string(local_a8e0,"firm",&aStack_1032f);
  std::__cxx11::string::string(local_a8c0,"first",&aStack_10330);
  std::__cxx11::string::string(local_a8a0,"fiscal",&aStack_10331);
  std::__cxx11::string::string(local_a880,"fish",&aStack_10332);
  std::__cxx11::string::string(local_a860,"fit",&aStack_10333);
  std::__cxx11::string::string(local_a840,"fitness",&aStack_10334);
  std::__cxx11::string::string(local_a820,"fix",&aStack_10335);
  std::__cxx11::string::string(local_a800,"flag",&aStack_10336);
  std::__cxx11::string::string(local_a7e0,"flame",&aStack_10337);
  std::__cxx11::string::string(local_a7c0,"flash",&aStack_10338);
  std::__cxx11::string::string(local_a7a0,"flat",&aStack_10339);
  std::__cxx11::string::string(local_a780,"flavor",&aStack_1033a);
  std::__cxx11::string::string(local_a760,"flee",&aStack_1033b);
  std::__cxx11::string::string(local_a740,"flight",&aStack_1033c);
  std::__cxx11::string::string(local_a720,"flip",&aStack_1033d);
  std::__cxx11::string::string(local_a700,"float",&aStack_1033e);
  std::__cxx11::string::string(local_a6e0,"flock",&aStack_1033f);
  std::__cxx11::string::string(local_a6c0,"floor",&aStack_10340);
  std::__cxx11::string::string(local_a6a0,"flower",&aStack_10341);
  std::__cxx11::string::string(local_a680,"fluid",&aStack_10342);
  std::__cxx11::string::string(local_a660,"flush",&aStack_10343);
  std::__cxx11::string::string(local_a640,"fly",&aStack_10344);
  std::__cxx11::string::string(local_a620,"foam",&aStack_10345);
  std::__cxx11::string::string(local_a600,"focus",&aStack_10346);
  std::__cxx11::string::string(local_a5e0,"fog",&aStack_10347);
  std::__cxx11::string::string(local_a5c0,"foil",&aStack_10348);
  std::__cxx11::string::string(local_a5a0,"fold",&aStack_10349);
  std::__cxx11::string::string(local_a580,"follow",&aStack_1034a);
  std::__cxx11::string::string(local_a560,"food",&aStack_1034b);
  std::__cxx11::string::string(local_a540,"foot",&aStack_1034c);
  std::__cxx11::string::string(local_a520,"force",&aStack_1034d);
  std::__cxx11::string::string(local_a500,"forest",&aStack_1034e);
  std::__cxx11::string::string(local_a4e0,"forget",&aStack_1034f);
  std::__cxx11::string::string(local_a4c0,"fork",&aStack_10350);
  std::__cxx11::string::string(local_a4a0,"fortune",&aStack_10351);
  std::__cxx11::string::string(local_a480,"forum",&aStack_10352);
  std::__cxx11::string::string(local_a460,"forward",&aStack_10353);
  std::__cxx11::string::string(local_a440,"fossil",&aStack_10354);
  std::__cxx11::string::string(local_a420,"foster",&aStack_10355);
  std::__cxx11::string::string(local_a400,"found",&aStack_10356);
  std::__cxx11::string::string(local_a3e0,"fox",&aStack_10357);
  std::__cxx11::string::string(local_a3c0,"fragile",&aStack_10358);
  std::__cxx11::string::string(local_a3a0,"frame",&aStack_10359);
  std::__cxx11::string::string(local_a380,"frequent",&aStack_1035a);
  std::__cxx11::string::string(local_a360,"fresh",&aStack_1035b);
  std::__cxx11::string::string(local_a340,"friend",&aStack_1035c);
  std::__cxx11::string::string(local_a320,"fringe",&aStack_1035d);
  std::__cxx11::string::string(local_a300,"frog",&aStack_1035e);
  std::__cxx11::string::string(local_a2e0,"front",&aStack_1035f);
  std::__cxx11::string::string(local_a2c0,"frost",&aStack_10360);
  std::__cxx11::string::string(local_a2a0,"frown",&aStack_10361);
  std::__cxx11::string::string(local_a280,"frozen",&aStack_10362);
  std::__cxx11::string::string(local_a260,"fruit",&aStack_10363);
  std::__cxx11::string::string(local_a240,"fuel",&aStack_10364);
  std::__cxx11::string::string(local_a220,"fun",&aStack_10365);
  std::__cxx11::string::string(local_a200,"funny",&aStack_10366);
  std::__cxx11::string::string(local_a1e0,"furnace",&aStack_10367);
  std::__cxx11::string::string(local_a1c0,"fury",&aStack_10368);
  std::__cxx11::string::string(local_a1a0,"future",&aStack_10369);
  std::__cxx11::string::string(local_a180,"gadget",&aStack_1036a);
  std::__cxx11::string::string(local_a160,"gain",&aStack_1036b);
  std::__cxx11::string::string(local_a140,"galaxy",&aStack_1036c);
  std::__cxx11::string::string(local_a120,"gallery",&aStack_1036d);
  std::__cxx11::string::string(local_a100,"game",&aStack_1036e);
  std::__cxx11::string::string(local_a0e0,"gap",&aStack_1036f);
  std::__cxx11::string::string(local_a0c0,"garage",&aStack_10370);
  std::__cxx11::string::string(local_a0a0,"garbage",&aStack_10371);
  std::__cxx11::string::string(local_a080,"garden",&aStack_10372);
  std::__cxx11::string::string(local_a060,"garlic",&aStack_10373);
  std::__cxx11::string::string(local_a040,"garment",&aStack_10374);
  std::__cxx11::string::string(local_a020,"gas",&aStack_10375);
  std::__cxx11::string::string(local_a000,"gasp",&aStack_10376);
  std::__cxx11::string::string(local_9fe0,"gate",&aStack_10377);
  std::__cxx11::string::string(local_9fc0,"gather",&aStack_10378);
  std::__cxx11::string::string(local_9fa0,"gauge",&aStack_10379);
  std::__cxx11::string::string(local_9f80,"gaze",&aStack_1037a);
  std::__cxx11::string::string(local_9f60,"general",&aStack_1037b);
  std::__cxx11::string::string(local_9f40,"genius",&aStack_1037c);
  std::__cxx11::string::string(local_9f20,"genre",&aStack_1037d);
  std::__cxx11::string::string(local_9f00,"gentle",&aStack_1037e);
  std::__cxx11::string::string(local_9ee0,"genuine",&aStack_1037f);
  std::__cxx11::string::string(local_9ec0,"gesture",&aStack_10380);
  std::__cxx11::string::string(local_9ea0,"ghost",&aStack_10381);
  std::__cxx11::string::string(local_9e80,"giant",&aStack_10382);
  std::__cxx11::string::string(local_9e60,"gift",&aStack_10383);
  std::__cxx11::string::string(local_9e40,"giggle",&aStack_10384);
  std::__cxx11::string::string(local_9e20,"ginger",&aStack_10385);
  std::__cxx11::string::string(local_9e00,"giraffe",&aStack_10386);
  std::__cxx11::string::string(local_9de0,"girl",&aStack_10387);
  std::__cxx11::string::string(local_9dc0,"give",&aStack_10388);
  std::__cxx11::string::string(local_9da0,"glad",&aStack_10389);
  std::__cxx11::string::string(local_9d80,"glance",&aStack_1038a);
  std::__cxx11::string::string(local_9d60,"glare",&aStack_1038b);
  std::__cxx11::string::string(local_9d40,"glass",&aStack_1038c);
  std::__cxx11::string::string(local_9d20,"glide",&aStack_1038d);
  std::__cxx11::string::string(local_9d00,"glimpse",&aStack_1038e);
  std::__cxx11::string::string(local_9ce0,"globe",&aStack_1038f);
  std::__cxx11::string::string(local_9cc0,"gloom",&aStack_10390);
  std::__cxx11::string::string(local_9ca0,"glory",&aStack_10391);
  std::__cxx11::string::string(local_9c80,"glove",&aStack_10392);
  std::__cxx11::string::string(local_9c60,"glow",&aStack_10393);
  std::__cxx11::string::string(local_9c40,"glue",&aStack_10394);
  std::__cxx11::string::string(local_9c20,"goat",&aStack_10395);
  std::__cxx11::string::string(local_9c00,"goddess",&aStack_10396);
  std::__cxx11::string::string(local_9be0,"gold",&aStack_10397);
  std::__cxx11::string::string(local_9bc0,"good",&aStack_10398);
  std::__cxx11::string::string(local_9ba0,"goose",&aStack_10399);
  std::__cxx11::string::string(local_9b80,"gorilla",&aStack_1039a);
  std::__cxx11::string::string(local_9b60,"gospel",&aStack_1039b);
  std::__cxx11::string::string(local_9b40,"gossip",&aStack_1039c);
  std::__cxx11::string::string(local_9b20,"govern",&aStack_1039d);
  std::__cxx11::string::string(local_9b00,"gown",&aStack_1039e);
  std::__cxx11::string::string(local_9ae0,"grab",&aStack_1039f);
  std::__cxx11::string::string(local_9ac0,"grace",&aStack_103a0);
  std::__cxx11::string::string(local_9aa0,"grain",&aStack_103a1);
  std::__cxx11::string::string(local_9a80,"grant",&aStack_103a2);
  std::__cxx11::string::string(local_9a60,"grape",&aStack_103a3);
  std::__cxx11::string::string(local_9a40,"grass",&aStack_103a4);
  std::__cxx11::string::string(local_9a20,"gravity",&aStack_103a5);
  std::__cxx11::string::string(local_9a00,"great",&aStack_103a6);
  std::__cxx11::string::string(local_99e0,"green",&aStack_103a7);
  std::__cxx11::string::string(local_99c0,"grid",&aStack_103a8);
  std::__cxx11::string::string(local_99a0,"grief",&aStack_103a9);
  std::__cxx11::string::string(local_9980,"grit",&aStack_103aa);
  std::__cxx11::string::string(local_9960,"grocery",&aStack_103ab);
  std::__cxx11::string::string(local_9940,"group",&aStack_103ac);
  std::__cxx11::string::string(local_9920,"grow",&aStack_103ad);
  std::__cxx11::string::string(local_9900,"grunt",&aStack_103ae);
  std::__cxx11::string::string(local_98e0,"guard",&aStack_103af);
  std::__cxx11::string::string(local_98c0,"guess",&aStack_103b0);
  std::__cxx11::string::string(local_98a0,"guide",&aStack_103b1);
  std::__cxx11::string::string(local_9880,"guilt",&aStack_103b2);
  std::__cxx11::string::string(local_9860,"guitar",&aStack_103b3);
  std::__cxx11::string::string(local_9840,"gun",&aStack_103b4);
  std::__cxx11::string::string(local_9820,"gym",&aStack_103b5);
  std::__cxx11::string::string(local_9800,"habit",&aStack_103b6);
  std::__cxx11::string::string(local_97e0,"hair",&aStack_103b7);
  std::__cxx11::string::string(local_97c0,"half",&aStack_103b8);
  std::__cxx11::string::string(local_97a0,"hammer",&aStack_103b9);
  std::__cxx11::string::string(local_9780,"hamster",&aStack_103ba);
  std::__cxx11::string::string(local_9760,"hand",&aStack_103bb);
  std::__cxx11::string::string(local_9740,"happy",&aStack_103bc);
  std::__cxx11::string::string(local_9720,"harbor",&aStack_103bd);
  std::__cxx11::string::string(local_9700,"hard",&aStack_103be);
  std::__cxx11::string::string(local_96e0,"harsh",&aStack_103bf);
  std::__cxx11::string::string(local_96c0,"harvest",&aStack_103c0);
  std::__cxx11::string::string(local_96a0,"hat",&aStack_103c1);
  std::__cxx11::string::string(local_9680,"have",&aStack_103c2);
  std::__cxx11::string::string(local_9660,"hawk",&aStack_103c3);
  std::__cxx11::string::string(local_9640,"hazard",&aStack_103c4);
  std::__cxx11::string::string(local_9620,"head",&aStack_103c5);
  std::__cxx11::string::string(local_9600,"health",&aStack_103c6);
  std::__cxx11::string::string(local_95e0,"heart",&aStack_103c7);
  std::__cxx11::string::string(local_95c0,"heavy",&aStack_103c8);
  std::__cxx11::string::string(local_95a0,"hedgehog",&aStack_103c9);
  std::__cxx11::string::string(local_9580,"height",&aStack_103ca);
  std::__cxx11::string::string(local_9560,"hello",&aStack_103cb);
  std::__cxx11::string::string(local_9540,"helmet",&aStack_103cc);
  std::__cxx11::string::string(local_9520,"help",&aStack_103cd);
  std::__cxx11::string::string(local_9500,"hen",&aStack_103ce);
  std::__cxx11::string::string(local_94e0,"hero",&aStack_103cf);
  std::__cxx11::string::string(local_94c0,"hidden",&aStack_103d0);
  std::__cxx11::string::string(local_94a0,"high",&aStack_103d1);
  std::__cxx11::string::string(local_9480,"hill",&aStack_103d2);
  std::__cxx11::string::string(local_9460,"hint",&aStack_103d3);
  std::__cxx11::string::string(local_9440,"hip",&aStack_103d4);
  std::__cxx11::string::string(local_9420,"hire",&aStack_103d5);
  std::__cxx11::string::string(local_9400,"history",&aStack_103d6);
  std::__cxx11::string::string(local_93e0,"hobby",&aStack_103d7);
  std::__cxx11::string::string(local_93c0,"hockey",&aStack_103d8);
  std::__cxx11::string::string(local_93a0,"hold",&aStack_103d9);
  std::__cxx11::string::string(local_9380,"hole",&aStack_103da);
  std::__cxx11::string::string(local_9360,"holiday",&aStack_103db);
  std::__cxx11::string::string(local_9340,"hollow",&aStack_103dc);
  std::__cxx11::string::string(local_9320,"home",&aStack_103dd);
  std::__cxx11::string::string(local_9300,"honey",&aStack_103de);
  std::__cxx11::string::string(local_92e0,"hood",&aStack_103df);
  std::__cxx11::string::string(local_92c0,"hope",&aStack_103e0);
  std::__cxx11::string::string(local_92a0,"horn",&aStack_103e1);
  std::__cxx11::string::string(local_9280,"horror",&aStack_103e2);
  std::__cxx11::string::string(local_9260,"horse",&aStack_103e3);
  std::__cxx11::string::string(local_9240,"hospital",&aStack_103e4);
  std::__cxx11::string::string(local_9220,"host",&aStack_103e5);
  std::__cxx11::string::string(local_9200,"hotel",&aStack_103e6);
  std::__cxx11::string::string(local_91e0,"hour",&aStack_103e7);
  std::__cxx11::string::string(local_91c0,"hover",&aStack_103e8);
  std::__cxx11::string::string(local_91a0,"hub",&aStack_103e9);
  std::__cxx11::string::string(local_9180,"huge",&aStack_103ea);
  std::__cxx11::string::string(local_9160,"human",&aStack_103eb);
  std::__cxx11::string::string(local_9140,"humble",&aStack_103ec);
  std::__cxx11::string::string(local_9120,"humor",&aStack_103ed);
  std::__cxx11::string::string(local_9100,"hundred",&aStack_103ee);
  std::__cxx11::string::string(local_90e0,"hungry",&aStack_103ef);
  std::__cxx11::string::string(local_90c0,"hunt",&aStack_103f0);
  std::__cxx11::string::string(local_90a0,"hurdle",&aStack_103f1);
  std::__cxx11::string::string(local_9080,"hurry",&aStack_103f2);
  std::__cxx11::string::string(local_9060,"hurt",&aStack_103f3);
  std::__cxx11::string::string(local_9040,"husband",&aStack_103f4);
  std::__cxx11::string::string(local_9020,"hybrid",&aStack_103f5);
  std::__cxx11::string::string(local_9000,"ice",&aStack_103f6);
  std::__cxx11::string::string(local_8fe0,"icon",&aStack_103f7);
  std::__cxx11::string::string(local_8fc0,"idea",&aStack_103f8);
  std::__cxx11::string::string(local_8fa0,"identify",&aStack_103f9);
  std::__cxx11::string::string(local_8f80,"idle",&aStack_103fa);
  std::__cxx11::string::string(local_8f60,"ignore",&aStack_103fb);
  std::__cxx11::string::string(local_8f40,"ill",&aStack_103fc);
  std::__cxx11::string::string(local_8f20,"illegal",&aStack_103fd);
  std::__cxx11::string::string(local_8f00,"illness",&aStack_103fe);
  std::__cxx11::string::string(local_8ee0,"image",&aStack_103ff);
  std::__cxx11::string::string(local_8ec0,"imitate",&aStack_10400);
  std::__cxx11::string::string(local_8ea0,"immense",&aStack_10401);
  std::__cxx11::string::string(local_8e80,"immune",&aStack_10402);
  std::__cxx11::string::string(local_8e60,"impact",&aStack_10403);
  std::__cxx11::string::string(local_8e40,"impose",&aStack_10404);
  std::__cxx11::string::string(local_8e20,"improve",&aStack_10405);
  std::__cxx11::string::string(local_8e00,"impulse",&aStack_10406);
  std::__cxx11::string::string(local_8de0,"inch",&aStack_10407);
  std::__cxx11::string::string(local_8dc0,"include",&aStack_10408);
  std::__cxx11::string::string(local_8da0,"income",&aStack_10409);
  std::__cxx11::string::string(local_8d80,"increase",&aStack_1040a);
  std::__cxx11::string::string(local_8d60,"index",&aStack_1040b);
  std::__cxx11::string::string(local_8d40,"indicate",&aStack_1040c);
  std::__cxx11::string::string(local_8d20,"indoor",&aStack_1040d);
  std::__cxx11::string::string(local_8d00,"industry",&aStack_1040e);
  std::__cxx11::string::string(local_8ce0,"infant",&aStack_1040f);
  std::__cxx11::string::string(local_8cc0,"inflict",&aStack_10410);
  std::__cxx11::string::string(local_8ca0,"inform",&aStack_10411);
  std::__cxx11::string::string(local_8c80,"inhale",&aStack_10412);
  std::__cxx11::string::string(local_8c60,"inherit",&aStack_10413);
  std::__cxx11::string::string(local_8c40,"initial",&aStack_10414);
  std::__cxx11::string::string(local_8c20,"inject",&aStack_10415);
  std::__cxx11::string::string(local_8c00,"injury",&aStack_10416);
  std::__cxx11::string::string(local_8be0,"inmate",&aStack_10417);
  std::__cxx11::string::string(local_8bc0,"inner",&aStack_10418);
  std::__cxx11::string::string(local_8ba0,"innocent",&aStack_10419);
  std::__cxx11::string::string(local_8b80,"input",&aStack_1041a);
  std::__cxx11::string::string(local_8b60,"inquiry",&aStack_1041b);
  std::__cxx11::string::string(local_8b40,"insane",&aStack_1041c);
  std::__cxx11::string::string(local_8b20,"insect",&aStack_1041d);
  std::__cxx11::string::string(local_8b00,"inside",&aStack_1041e);
  std::__cxx11::string::string(local_8ae0,"inspire",&aStack_1041f);
  std::__cxx11::string::string(local_8ac0,"install",&aStack_10420);
  std::__cxx11::string::string(local_8aa0,"intact",&aStack_10421);
  std::__cxx11::string::string(local_8a80,"interest",&aStack_10422);
  std::__cxx11::string::string(local_8a60,"into",&aStack_10423);
  std::__cxx11::string::string(local_8a40,"invest",&aStack_10424);
  std::__cxx11::string::string(local_8a20,"invite",&aStack_10425);
  std::__cxx11::string::string(local_8a00,"involve",&aStack_10426);
  std::__cxx11::string::string(local_89e0,"iron",&aStack_10427);
  std::__cxx11::string::string(local_89c0,"island",&aStack_10428);
  std::__cxx11::string::string(local_89a0,"isolate",&aStack_10429);
  std::__cxx11::string::string(local_8980,"issue",&aStack_1042a);
  std::__cxx11::string::string(local_8960,"item",&aStack_1042b);
  std::__cxx11::string::string(local_8940,"ivory",&aStack_1042c);
  std::__cxx11::string::string(local_8920,"jacket",&aStack_1042d);
  std::__cxx11::string::string(local_8900,"jaguar",&aStack_1042e);
  std::__cxx11::string::string(local_88e0,"jar",&aStack_1042f);
  std::__cxx11::string::string(local_88c0,"jazz",&aStack_10430);
  std::__cxx11::string::string(local_88a0,"jealous",&aStack_10431);
  std::__cxx11::string::string(local_8880,"jeans",&aStack_10432);
  std::__cxx11::string::string(local_8860,"jelly",&aStack_10433);
  std::__cxx11::string::string(local_8840,"jewel",&aStack_10434);
  std::__cxx11::string::string(local_8820,"job",&aStack_10435);
  std::__cxx11::string::string(local_8800,"join",&aStack_10436);
  std::__cxx11::string::string(local_87e0,"joke",&aStack_10437);
  std::__cxx11::string::string(local_87c0,"journey",&aStack_10438);
  std::__cxx11::string::string(local_87a0,"joy",&aStack_10439);
  std::__cxx11::string::string(local_8780,"judge",&aStack_1043a);
  std::__cxx11::string::string(local_8760,"juice",&aStack_1043b);
  std::__cxx11::string::string(local_8740,"jump",&aStack_1043c);
  std::__cxx11::string::string(local_8720,"jungle",&aStack_1043d);
  std::__cxx11::string::string(local_8700,"junior",&aStack_1043e);
  std::__cxx11::string::string(local_86e0,"junk",&aStack_1043f);
  std::__cxx11::string::string(local_86c0,"just",&aStack_10440);
  std::__cxx11::string::string(local_86a0,"kangaroo",&aStack_10441);
  std::__cxx11::string::string(local_8680,"keen",&aStack_10442);
  std::__cxx11::string::string(local_8660,"keep",&aStack_10443);
  std::__cxx11::string::string(local_8640,"ketchup",&aStack_10444);
  std::__cxx11::string::string(local_8620,"key",&aStack_10445);
  std::__cxx11::string::string(local_8600,"kick",&aStack_10446);
  std::__cxx11::string::string(local_85e0,"kid",&aStack_10447);
  std::__cxx11::string::string(local_85c0,"kidney",&aStack_10448);
  std::__cxx11::string::string(local_85a0,"kind",&aStack_10449);
  std::__cxx11::string::string(local_8580,"kingdom",&aStack_1044a);
  std::__cxx11::string::string(local_8560,"kiss",&aStack_1044b);
  std::__cxx11::string::string(local_8540,"kit",&aStack_1044c);
  std::__cxx11::string::string(local_8520,"kitchen",&aStack_1044d);
  std::__cxx11::string::string(local_8500,"kite",&aStack_1044e);
  std::__cxx11::string::string(local_84e0,"kitten",&aStack_1044f);
  std::__cxx11::string::string(local_84c0,"kiwi",&aStack_10450);
  std::__cxx11::string::string(local_84a0,"knee",&aStack_10451);
  std::__cxx11::string::string(local_8480,"knife",&aStack_10452);
  std::__cxx11::string::string(local_8460,"knock",&aStack_10453);
  std::__cxx11::string::string(local_8440,"know",&aStack_10454);
  std::__cxx11::string::string(local_8420,"lab",&aStack_10455);
  std::__cxx11::string::string(local_8400,"label",&aStack_10456);
  std::__cxx11::string::string(local_83e0,"labor",&aStack_10457);
  std::__cxx11::string::string(local_83c0,"ladder",&aStack_10458);
  std::__cxx11::string::string(local_83a0,"lady",&aStack_10459);
  std::__cxx11::string::string(local_8380,"lake",&aStack_1045a);
  std::__cxx11::string::string(local_8360,"lamp",&aStack_1045b);
  std::__cxx11::string::string(local_8340,"language",&aStack_1045c);
  std::__cxx11::string::string(local_8320,"laptop",&aStack_1045d);
  std::__cxx11::string::string(local_8300,"large",&aStack_1045e);
  std::__cxx11::string::string(local_82e0,"later",&aStack_1045f);
  std::__cxx11::string::string(local_82c0,"latin",&aStack_10460);
  std::__cxx11::string::string(local_82a0,"laugh",&aStack_10461);
  std::__cxx11::string::string(local_8280,"laundry",&aStack_10462);
  std::__cxx11::string::string(local_8260,"lava",&aStack_10463);
  std::__cxx11::string::string(local_8240,"law",&aStack_10464);
  std::__cxx11::string::string(local_8220,"lawn",&aStack_10465);
  std::__cxx11::string::string(local_8200,"lawsuit",&aStack_10466);
  std::__cxx11::string::string(local_81e0,"layer",&aStack_10467);
  std::__cxx11::string::string(local_81c0,"lazy",&aStack_10468);
  std::__cxx11::string::string(local_81a0,"leader",&aStack_10469);
  std::__cxx11::string::string(local_8180,"leaf",&aStack_1046a);
  std::__cxx11::string::string(local_8160,"learn",&aStack_1046b);
  std::__cxx11::string::string(local_8140,"leave",&aStack_1046c);
  std::__cxx11::string::string(local_8120,"lecture",&aStack_1046d);
  std::__cxx11::string::string(local_8100,"left",&aStack_1046e);
  std::__cxx11::string::string(local_80e0,"leg",&aStack_1046f);
  std::__cxx11::string::string(local_80c0,"legal",&aStack_10470);
  std::__cxx11::string::string(local_80a0,"legend",&aStack_10471);
  std::__cxx11::string::string(local_8080,"leisure",&aStack_10472);
  std::__cxx11::string::string(local_8060,"lemon",&aStack_10473);
  std::__cxx11::string::string(local_8040,"lend",&aStack_10474);
  std::__cxx11::string::string(local_8020,"length",&aStack_10475);
  std::__cxx11::string::string(local_8000,"lens",&aStack_10476);
  std::__cxx11::string::string(local_7fe0,"leopard",&aStack_10477);
  std::__cxx11::string::string(local_7fc0,"lesson",&aStack_10478);
  std::__cxx11::string::string(local_7fa0,"letter",&aStack_10479);
  std::__cxx11::string::string(local_7f80,"level",&aStack_1047a);
  std::__cxx11::string::string(local_7f60,"liar",&aStack_1047b);
  std::__cxx11::string::string(local_7f40,"liberty",&aStack_1047c);
  std::__cxx11::string::string(local_7f20,"library",&aStack_1047d);
  std::__cxx11::string::string(local_7f00,"license",&aStack_1047e);
  std::__cxx11::string::string(local_7ee0,"life",&aStack_1047f);
  std::__cxx11::string::string(local_7ec0,"lift",&aStack_10480);
  std::__cxx11::string::string(local_7ea0,"light",&aStack_10481);
  std::__cxx11::string::string(local_7e80,"like",&aStack_10482);
  std::__cxx11::string::string(local_7e60,"limb",&aStack_10483);
  std::__cxx11::string::string(local_7e40,"limit",&aStack_10484);
  std::__cxx11::string::string(local_7e20,"link",&aStack_10485);
  std::__cxx11::string::string(local_7e00,"lion",&aStack_10486);
  std::__cxx11::string::string(local_7de0,"liquid",&aStack_10487);
  std::__cxx11::string::string(local_7dc0,"list",&aStack_10488);
  std::__cxx11::string::string(local_7da0,"little",&aStack_10489);
  std::__cxx11::string::string(local_7d80,"live",&aStack_1048a);
  std::__cxx11::string::string(local_7d60,"lizard",&aStack_1048b);
  std::__cxx11::string::string(local_7d40,"load",&aStack_1048c);
  std::__cxx11::string::string(local_7d20,"loan",&aStack_1048d);
  std::__cxx11::string::string(local_7d00,"lobster",&aStack_1048e);
  std::__cxx11::string::string(local_7ce0,"local",&aStack_1048f);
  std::__cxx11::string::string(local_7cc0,"lock",&aStack_10490);
  std::__cxx11::string::string(local_7ca0,"logic",&aStack_10491);
  std::__cxx11::string::string(local_7c80,"lonely",&aStack_10492);
  std::__cxx11::string::string(local_7c60,"long",&aStack_10493);
  std::__cxx11::string::string(local_7c40,"loop",&aStack_10494);
  std::__cxx11::string::string(local_7c20,"lottery",&aStack_10495);
  std::__cxx11::string::string(local_7c00,"loud",&aStack_10496);
  std::__cxx11::string::string(local_7be0,"lounge",&aStack_10497);
  std::__cxx11::string::string(local_7bc0,"love",&aStack_10498);
  std::__cxx11::string::string(local_7ba0,"loyal",&aStack_10499);
  std::__cxx11::string::string(local_7b80,"lucky",&aStack_1049a);
  std::__cxx11::string::string(local_7b60,"luggage",&aStack_1049b);
  std::__cxx11::string::string(local_7b40,"lumber",&aStack_1049c);
  std::__cxx11::string::string(local_7b20,"lunar",&aStack_1049d);
  std::__cxx11::string::string(local_7b00,"lunch",&aStack_1049e);
  std::__cxx11::string::string(local_7ae0,"luxury",&aStack_1049f);
  std::__cxx11::string::string(local_7ac0,"lyrics",&aStack_104a0);
  std::__cxx11::string::string(local_7aa0,"machine",&aStack_104a1);
  std::__cxx11::string::string(local_7a80,"mad",&aStack_104a2);
  std::__cxx11::string::string(local_7a60,"magic",&aStack_104a3);
  std::__cxx11::string::string(local_7a40,"magnet",&aStack_104a4);
  std::__cxx11::string::string(local_7a20,"maid",&aStack_104a5);
  std::__cxx11::string::string(local_7a00,"mail",&aStack_104a6);
  std::__cxx11::string::string(local_79e0,"main",&aStack_104a7);
  std::__cxx11::string::string(local_79c0,"major",&aStack_104a8);
  std::__cxx11::string::string(local_79a0,"make",&aStack_104a9);
  std::__cxx11::string::string(local_7980,"mammal",&aStack_104aa);
  std::__cxx11::string::string(local_7960,"man",&aStack_104ab);
  std::__cxx11::string::string(local_7940,"manage",&aStack_104ac);
  std::__cxx11::string::string(local_7920,"mandate",&aStack_104ad);
  std::__cxx11::string::string(local_7900,"mango",&aStack_104ae);
  std::__cxx11::string::string(local_78e0,"mansion",&aStack_104af);
  std::__cxx11::string::string(local_78c0,"manual",&aStack_104b0);
  std::__cxx11::string::string(local_78a0,"maple",&aStack_104b1);
  std::__cxx11::string::string(local_7880,"marble",&aStack_104b2);
  std::__cxx11::string::string(local_7860,"march",&aStack_104b3);
  std::__cxx11::string::string(local_7840,"margin",&aStack_104b4);
  std::__cxx11::string::string(local_7820,"marine",&aStack_104b5);
  std::__cxx11::string::string(local_7800,"market",&aStack_104b6);
  std::__cxx11::string::string(local_77e0,"marriage",&aStack_104b7);
  std::__cxx11::string::string(local_77c0,"mask",&aStack_104b8);
  std::__cxx11::string::string(local_77a0,"mass",&aStack_104b9);
  std::__cxx11::string::string(local_7780,"master",&aStack_104ba);
  std::__cxx11::string::string(local_7760,"match",&aStack_104bb);
  std::__cxx11::string::string(local_7740,"material",&aStack_104bc);
  std::__cxx11::string::string(local_7720,"math",&aStack_104bd);
  std::__cxx11::string::string(local_7700,"matrix",&aStack_104be);
  std::__cxx11::string::string(local_76e0,"matter",&aStack_104bf);
  std::__cxx11::string::string(local_76c0,"maximum",&aStack_104c0);
  std::__cxx11::string::string(local_76a0,"maze",&aStack_104c1);
  std::__cxx11::string::string(local_7680,"meadow",&aStack_104c2);
  std::__cxx11::string::string(local_7660,"mean",&aStack_104c3);
  std::__cxx11::string::string(local_7640,"measure",&aStack_104c4);
  std::__cxx11::string::string(local_7620,"meat",&aStack_104c5);
  std::__cxx11::string::string(local_7600,"mechanic",&aStack_104c6);
  std::__cxx11::string::string(local_75e0,"medal",&aStack_104c7);
  std::__cxx11::string::string(local_75c0,"media",&aStack_104c8);
  std::__cxx11::string::string(local_75a0,"melody",&aStack_104c9);
  std::__cxx11::string::string(local_7580,"melt",&aStack_104ca);
  std::__cxx11::string::string(local_7560,"member",&aStack_104cb);
  std::__cxx11::string::string(local_7540,"memory",&aStack_104cc);
  std::__cxx11::string::string(local_7520,"mention",&aStack_104cd);
  std::__cxx11::string::string(local_7500,"menu",&aStack_104ce);
  std::__cxx11::string::string(local_74e0,"mercy",&aStack_104cf);
  std::__cxx11::string::string(local_74c0,"merge",&aStack_104d0);
  std::__cxx11::string::string(local_74a0,"merit",&aStack_104d1);
  std::__cxx11::string::string(local_7480,"merry",&aStack_104d2);
  std::__cxx11::string::string(local_7460,"mesh",&aStack_104d3);
  std::__cxx11::string::string(local_7440,"message",&aStack_104d4);
  std::__cxx11::string::string(local_7420,"metal",&aStack_104d5);
  std::__cxx11::string::string(local_7400,"method",&aStack_104d6);
  std::__cxx11::string::string(local_73e0,"middle",&aStack_104d7);
  std::__cxx11::string::string(local_73c0,"midnight",&aStack_104d8);
  std::__cxx11::string::string(local_73a0,"milk",&aStack_104d9);
  std::__cxx11::string::string(local_7380,"million",&aStack_104da);
  std::__cxx11::string::string(local_7360,"mimic",&aStack_104db);
  std::__cxx11::string::string(local_7340,"mind",&aStack_104dc);
  std::__cxx11::string::string(local_7320,"minimum",&aStack_104dd);
  std::__cxx11::string::string(local_7300,"minor",&aStack_104de);
  std::__cxx11::string::string(local_72e0,"minute",&aStack_104df);
  std::__cxx11::string::string(local_72c0,"miracle",&aStack_104e0);
  std::__cxx11::string::string(local_72a0,"mirror",&aStack_104e1);
  std::__cxx11::string::string(local_7280,"misery",&aStack_104e2);
  std::__cxx11::string::string(local_7260,"miss",&aStack_104e3);
  std::__cxx11::string::string(local_7240,"mistake",&aStack_104e4);
  std::__cxx11::string::string(local_7220,"mix",&aStack_104e5);
  std::__cxx11::string::string(local_7200,"mixed",&aStack_104e6);
  std::__cxx11::string::string(local_71e0,"mixture",&aStack_104e7);
  std::__cxx11::string::string(local_71c0,"mobile",&aStack_104e8);
  std::__cxx11::string::string(local_71a0,"model",&aStack_104e9);
  std::__cxx11::string::string(local_7180,"modify",&aStack_104ea);
  std::__cxx11::string::string(local_7160,"mom",&aStack_104eb);
  std::__cxx11::string::string(local_7140,"moment",&aStack_104ec);
  std::__cxx11::string::string(local_7120,"monitor",&aStack_104ed);
  std::__cxx11::string::string(local_7100,"monkey",&aStack_104ee);
  std::__cxx11::string::string(local_70e0,"monster",&aStack_104ef);
  std::__cxx11::string::string(local_70c0,"month",&aStack_104f0);
  std::__cxx11::string::string(local_70a0,"moon",&aStack_104f1);
  std::__cxx11::string::string(local_7080,"moral",&aStack_104f2);
  std::__cxx11::string::string(local_7060,"more",&aStack_104f3);
  std::__cxx11::string::string(local_7040,"morning",&aStack_104f4);
  std::__cxx11::string::string(local_7020,"mosquito",&aStack_104f5);
  std::__cxx11::string::string(local_7000,"mother",&aStack_104f6);
  std::__cxx11::string::string(local_6fe0,"motion",&aStack_104f7);
  std::__cxx11::string::string(local_6fc0,"motor",&aStack_104f8);
  std::__cxx11::string::string(local_6fa0,"mountain",&aStack_104f9);
  std::__cxx11::string::string(local_6f80,"mouse",&aStack_104fa);
  std::__cxx11::string::string(local_6f60,"move",&aStack_104fb);
  std::__cxx11::string::string(local_6f40,"movie",&aStack_104fc);
  std::__cxx11::string::string(local_6f20,"much",&aStack_104fd);
  std::__cxx11::string::string(local_6f00,"muffin",&aStack_104fe);
  std::__cxx11::string::string(local_6ee0,"mule",&aStack_104ff);
  std::__cxx11::string::string(local_6ec0,"multiply",&aStack_10500);
  std::__cxx11::string::string(local_6ea0,"muscle",&aStack_10501);
  std::__cxx11::string::string(local_6e80,"museum",&aStack_10502);
  std::__cxx11::string::string(local_6e60,"mushroom",&aStack_10503);
  std::__cxx11::string::string(local_6e40,"music",&aStack_10504);
  std::__cxx11::string::string(local_6e20,"must",&aStack_10505);
  std::__cxx11::string::string(local_6e00,"mutual",&aStack_10506);
  std::__cxx11::string::string(local_6de0,"myself",&aStack_10507);
  std::__cxx11::string::string(local_6dc0,"mystery",&aStack_10508);
  std::__cxx11::string::string(local_6da0,"myth",&aStack_10509);
  std::__cxx11::string::string(local_6d80,"naive",&aStack_1050a);
  std::__cxx11::string::string(local_6d60,"name",&aStack_1050b);
  std::__cxx11::string::string(local_6d40,"napkin",&aStack_1050c);
  std::__cxx11::string::string(local_6d20,"narrow",&aStack_1050d);
  std::__cxx11::string::string(local_6d00,"nasty",&aStack_1050e);
  std::__cxx11::string::string(local_6ce0,"nation",&aStack_1050f);
  std::__cxx11::string::string(local_6cc0,"nature",&aStack_10510);
  std::__cxx11::string::string(local_6ca0,"near",&aStack_10511);
  std::__cxx11::string::string(local_6c80,"neck",&aStack_10512);
  std::__cxx11::string::string(local_6c60,"need",&aStack_10513);
  std::__cxx11::string::string(local_6c40,"negative",&aStack_10514);
  std::__cxx11::string::string(local_6c20,"neglect",&aStack_10515);
  std::__cxx11::string::string(local_6c00,"neither",&aStack_10516);
  std::__cxx11::string::string(local_6be0,"nephew",&aStack_10517);
  std::__cxx11::string::string(local_6bc0,"nerve",&aStack_10518);
  std::__cxx11::string::string(local_6ba0,"nest",&aStack_10519);
  std::__cxx11::string::string(local_6b80,"net",&aStack_1051a);
  std::__cxx11::string::string(local_6b60,"network",&aStack_1051b);
  std::__cxx11::string::string(local_6b40,"neutral",&aStack_1051c);
  std::__cxx11::string::string(local_6b20,"never",&aStack_1051d);
  std::__cxx11::string::string(local_6b00,"news",&aStack_1051e);
  std::__cxx11::string::string(local_6ae0,"next",&aStack_1051f);
  std::__cxx11::string::string(local_6ac0,"nice",&aStack_10520);
  std::__cxx11::string::string(local_6aa0,"night",&aStack_10521);
  std::__cxx11::string::string(local_6a80,"noble",&aStack_10522);
  std::__cxx11::string::string(local_6a60,"noise",&aStack_10523);
  std::__cxx11::string::string(local_6a40,"nominee",&aStack_10524);
  std::__cxx11::string::string(local_6a20,"noodle",&aStack_10525);
  std::__cxx11::string::string(local_6a00,"normal",&aStack_10526);
  std::__cxx11::string::string(local_69e0,"north",&aStack_10527);
  std::__cxx11::string::string(local_69c0,"nose",&aStack_10528);
  std::__cxx11::string::string(local_69a0,"notable",&aStack_10529);
  std::__cxx11::string::string(local_6980,"note",&aStack_1052a);
  std::__cxx11::string::string(local_6960,"nothing",&aStack_1052b);
  std::__cxx11::string::string(local_6940,"notice",&aStack_1052c);
  std::__cxx11::string::string(local_6920,"novel",&aStack_1052d);
  std::__cxx11::string::string(local_6900,"now",&aStack_1052e);
  std::__cxx11::string::string(local_68e0,"nuclear",&aStack_1052f);
  std::__cxx11::string::string(local_68c0,"number",&aStack_10530);
  std::__cxx11::string::string(local_68a0,"nurse",&aStack_10531);
  std::__cxx11::string::string(local_6880,"nut",&aStack_10532);
  std::__cxx11::string::string(local_6860,"oak",&aStack_10533);
  std::__cxx11::string::string(local_6840,"obey",&aStack_10534);
  std::__cxx11::string::string(local_6820,"object",&aStack_10535);
  std::__cxx11::string::string(local_6800,"oblige",&aStack_10536);
  std::__cxx11::string::string(local_67e0,"obscure",&aStack_10537);
  std::__cxx11::string::string(local_67c0,"observe",&aStack_10538);
  std::__cxx11::string::string(local_67a0,"obtain",&aStack_10539);
  std::__cxx11::string::string(local_6780,"obvious",&aStack_1053a);
  std::__cxx11::string::string(local_6760,"occur",&aStack_1053b);
  std::__cxx11::string::string(local_6740,"ocean",&aStack_1053c);
  std::__cxx11::string::string(local_6720,"october",&aStack_1053d);
  std::__cxx11::string::string(local_6700,"odor",&aStack_1053e);
  std::__cxx11::string::string(local_66e0,"off",&aStack_1053f);
  std::__cxx11::string::string(local_66c0,"offer",&aStack_10540);
  std::__cxx11::string::string(local_66a0,"office",&aStack_10541);
  std::__cxx11::string::string(local_6680,"often",&aStack_10542);
  std::__cxx11::string::string(local_6660,"oil",&aStack_10543);
  std::__cxx11::string::string(local_6640,"okay",&aStack_10544);
  std::__cxx11::string::string(local_6620,"old",&aStack_10545);
  std::__cxx11::string::string(local_6600,"olive",&aStack_10546);
  std::__cxx11::string::string(local_65e0,"olympic",&aStack_10547);
  std::__cxx11::string::string(local_65c0,"omit",&aStack_10548);
  std::__cxx11::string::string(local_65a0,"once",&aStack_10549);
  std::__cxx11::string::string(local_6580,"one",&aStack_1054a);
  std::__cxx11::string::string(local_6560,"onion",&aStack_1054b);
  std::__cxx11::string::string(local_6540,"online",&aStack_1054c);
  std::__cxx11::string::string(local_6520,"only",&aStack_1054d);
  std::__cxx11::string::string(local_6500,"open",&aStack_1054e);
  std::__cxx11::string::string(local_64e0,"opera",&aStack_1054f);
  std::__cxx11::string::string(local_64c0,"opinion",&aStack_10550);
  std::__cxx11::string::string(local_64a0,"oppose",&aStack_10551);
  std::__cxx11::string::string(local_6480,"option",&aStack_10552);
  std::__cxx11::string::string(local_6460,"orange",&aStack_10553);
  std::__cxx11::string::string(local_6440,"orbit",&aStack_10554);
  std::__cxx11::string::string(local_6420,"orchard",&aStack_10555);
  std::__cxx11::string::string(local_6400,"order",&aStack_10556);
  std::__cxx11::string::string(local_63e0,"ordinary",&aStack_10557);
  std::__cxx11::string::string(local_63c0,"organ",&aStack_10558);
  std::__cxx11::string::string(local_63a0,"orient",&aStack_10559);
  std::__cxx11::string::string(local_6380,"original",&aStack_1055a);
  std::__cxx11::string::string(local_6360,"orphan",&aStack_1055b);
  std::__cxx11::string::string(local_6340,"ostrich",&aStack_1055c);
  std::__cxx11::string::string(local_6320,"other",&aStack_1055d);
  std::__cxx11::string::string(local_6300,"outdoor",&aStack_1055e);
  std::__cxx11::string::string(local_62e0,"outer",&aStack_1055f);
  std::__cxx11::string::string(local_62c0,"output",&aStack_10560);
  std::__cxx11::string::string(local_62a0,"outside",&aStack_10561);
  std::__cxx11::string::string(local_6280,"oval",&aStack_10562);
  std::__cxx11::string::string(local_6260,"oven",&aStack_10563);
  std::__cxx11::string::string(local_6240,"over",&aStack_10564);
  std::__cxx11::string::string(local_6220,"own",&aStack_10565);
  std::__cxx11::string::string(local_6200,"owner",&aStack_10566);
  std::__cxx11::string::string(local_61e0,"oxygen",&aStack_10567);
  std::__cxx11::string::string(local_61c0,"oyster",&aStack_10568);
  std::__cxx11::string::string(local_61a0,"ozone",&aStack_10569);
  std::__cxx11::string::string(local_6180,"pact",&aStack_1056a);
  std::__cxx11::string::string(local_6160,"paddle",&aStack_1056b);
  std::__cxx11::string::string(local_6140,"page",&aStack_1056c);
  std::__cxx11::string::string(local_6120,"pair",&aStack_1056d);
  std::__cxx11::string::string(local_6100,"palace",&aStack_1056e);
  std::__cxx11::string::string(local_60e0,"palm",&aStack_1056f);
  std::__cxx11::string::string(local_60c0,"panda",&aStack_10570);
  std::__cxx11::string::string(local_60a0,"panel",&aStack_10571);
  std::__cxx11::string::string(local_6080,"panic",&aStack_10572);
  std::__cxx11::string::string(local_6060,"panther",&aStack_10573);
  std::__cxx11::string::string(local_6040,"paper",&aStack_10574);
  std::__cxx11::string::string(local_6020,"parade",&aStack_10575);
  std::__cxx11::string::string(local_6000,"parent",&aStack_10576);
  std::__cxx11::string::string(local_5fe0,"park",&aStack_10577);
  std::__cxx11::string::string(local_5fc0,"parrot",&aStack_10578);
  std::__cxx11::string::string(local_5fa0,"party",&aStack_10579);
  std::__cxx11::string::string(local_5f80,"pass",&aStack_1057a);
  std::__cxx11::string::string(local_5f60,"patch",&aStack_1057b);
  std::__cxx11::string::string(local_5f40,"path",&aStack_1057c);
  std::__cxx11::string::string(local_5f20,"patient",&aStack_1057d);
  std::__cxx11::string::string(local_5f00,"patrol",&aStack_1057e);
  std::__cxx11::string::string(local_5ee0,"pattern",&aStack_1057f);
  std::__cxx11::string::string(local_5ec0,"pause",&aStack_10580);
  std::__cxx11::string::string(local_5ea0,"pave",&aStack_10581);
  std::__cxx11::string::string(local_5e80,"payment",&aStack_10582);
  std::__cxx11::string::string(local_5e60,"peace",&aStack_10583);
  std::__cxx11::string::string(local_5e40,"peanut",&aStack_10584);
  std::__cxx11::string::string(local_5e20,"pear",&aStack_10585);
  std::__cxx11::string::string(local_5e00,"peasant",&aStack_10586);
  std::__cxx11::string::string(local_5de0,"pelican",&aStack_10587);
  std::__cxx11::string::string(local_5dc0,"pen",&aStack_10588);
  std::__cxx11::string::string(local_5da0,"penalty",&aStack_10589);
  std::__cxx11::string::string(local_5d80,"pencil",&aStack_1058a);
  std::__cxx11::string::string(local_5d60,"people",&aStack_1058b);
  std::__cxx11::string::string(local_5d40,"pepper",&aStack_1058c);
  std::__cxx11::string::string(local_5d20,"perfect",&aStack_1058d);
  std::__cxx11::string::string(local_5d00,"permit",&aStack_1058e);
  std::__cxx11::string::string(local_5ce0,"person",&aStack_1058f);
  std::__cxx11::string::string(local_5cc0,"pet",&aStack_10590);
  std::__cxx11::string::string(local_5ca0,"phone",&aStack_10591);
  std::__cxx11::string::string(local_5c80,"photo",&aStack_10592);
  std::__cxx11::string::string(local_5c60,"phrase",&aStack_10593);
  std::__cxx11::string::string(local_5c40,"physical",&aStack_10594);
  std::__cxx11::string::string(local_5c20,"piano",&aStack_10595);
  std::__cxx11::string::string(local_5c00,"picnic",&aStack_10596);
  std::__cxx11::string::string(local_5be0,"picture",&aStack_10597);
  std::__cxx11::string::string(local_5bc0,"piece",&aStack_10598);
  std::__cxx11::string::string(local_5ba0,"pig",&aStack_10599);
  std::__cxx11::string::string(local_5b80,"pigeon",&aStack_1059a);
  std::__cxx11::string::string(local_5b60,"pill",&aStack_1059b);
  std::__cxx11::string::string(local_5b40,"pilot",&aStack_1059c);
  std::__cxx11::string::string(local_5b20,"pink",&aStack_1059d);
  std::__cxx11::string::string(local_5b00,"pioneer",&aStack_1059e);
  std::__cxx11::string::string(local_5ae0,"pipe",&aStack_1059f);
  std::__cxx11::string::string(local_5ac0,"pistol",&aStack_105a0);
  std::__cxx11::string::string(local_5aa0,"pitch",&aStack_105a1);
  std::__cxx11::string::string(local_5a80,"pizza",&aStack_105a2);
  std::__cxx11::string::string(local_5a60,"place",&aStack_105a3);
  std::__cxx11::string::string(local_5a40,"planet",&aStack_105a4);
  std::__cxx11::string::string(local_5a20,"plastic",&aStack_105a5);
  std::__cxx11::string::string(local_5a00,"plate",&aStack_105a6);
  std::__cxx11::string::string(local_59e0,"play",&aStack_105a7);
  std::__cxx11::string::string(local_59c0,"please",&aStack_105a8);
  std::__cxx11::string::string(local_59a0,"pledge",&aStack_105a9);
  std::__cxx11::string::string(local_5980,"pluck",&aStack_105aa);
  std::__cxx11::string::string(local_5960,"plug",&aStack_105ab);
  std::__cxx11::string::string(local_5940,"plunge",&aStack_105ac);
  std::__cxx11::string::string(local_5920,"poem",&aStack_105ad);
  std::__cxx11::string::string(local_5900,"poet",&aStack_105ae);
  std::__cxx11::string::string(local_58e0,"point",&aStack_105af);
  std::__cxx11::string::string(local_58c0,"polar",&aStack_105b0);
  std::__cxx11::string::string(local_58a0,"pole",&aStack_105b1);
  std::__cxx11::string::string(local_5880,"police",&aStack_105b2);
  std::__cxx11::string::string(local_5860,"pond",&aStack_105b3);
  std::__cxx11::string::string(local_5840,"pony",&aStack_105b4);
  std::__cxx11::string::string(local_5820,"pool",&aStack_105b5);
  std::__cxx11::string::string(local_5800,"popular",&aStack_105b6);
  std::__cxx11::string::string(local_57e0,"portion",&aStack_105b7);
  std::__cxx11::string::string(local_57c0,"position",&aStack_105b8);
  std::__cxx11::string::string(local_57a0,"possible",&aStack_105b9);
  std::__cxx11::string::string(local_5780,"post",&aStack_105ba);
  std::__cxx11::string::string(local_5760,"potato",&aStack_105bb);
  std::__cxx11::string::string(local_5740,"pottery",&aStack_105bc);
  std::__cxx11::string::string(local_5720,"poverty",&aStack_105bd);
  std::__cxx11::string::string(local_5700,"powder",&aStack_105be);
  std::__cxx11::string::string(local_56e0,"power",&aStack_105bf);
  std::__cxx11::string::string(local_56c0,"practice",&aStack_105c0);
  std::__cxx11::string::string(local_56a0,"praise",&aStack_105c1);
  std::__cxx11::string::string(local_5680,"predict",&aStack_105c2);
  std::__cxx11::string::string(local_5660,"prefer",&aStack_105c3);
  std::__cxx11::string::string(local_5640,"prepare",&aStack_105c4);
  std::__cxx11::string::string(local_5620,"present",&aStack_105c5);
  std::__cxx11::string::string(local_5600,"pretty",&aStack_105c6);
  std::__cxx11::string::string(local_55e0,"prevent",&aStack_105c7);
  std::__cxx11::string::string(local_55c0,"price",&aStack_105c8);
  std::__cxx11::string::string(local_55a0,"pride",&aStack_105c9);
  std::__cxx11::string::string(local_5580,"primary",&aStack_105ca);
  std::__cxx11::string::string(local_5560,"print",&aStack_105cb);
  std::__cxx11::string::string(local_5540,"priority",&aStack_105cc);
  std::__cxx11::string::string(local_5520,"prison",&aStack_105cd);
  std::__cxx11::string::string(local_5500,"private",&aStack_105ce);
  std::__cxx11::string::string(local_54e0,"prize",&aStack_105cf);
  std::__cxx11::string::string(local_54c0,"problem",&aStack_105d0);
  std::__cxx11::string::string(local_54a0,"process",&aStack_105d1);
  std::__cxx11::string::string(local_5480,"produce",&aStack_105d2);
  std::__cxx11::string::string(local_5460,"profit",&aStack_105d3);
  std::__cxx11::string::string(local_5440,"program",&aStack_105d4);
  std::__cxx11::string::string(local_5420,"project",&aStack_105d5);
  std::__cxx11::string::string(local_5400,"promote",&aStack_105d6);
  std::__cxx11::string::string(local_53e0,"proof",&aStack_105d7);
  std::__cxx11::string::string(local_53c0,"property",&aStack_105d8);
  std::__cxx11::string::string(local_53a0,"prosper",&aStack_105d9);
  std::__cxx11::string::string(local_5380,"protect",&aStack_105da);
  std::__cxx11::string::string(local_5360,"proud",&aStack_105db);
  std::__cxx11::string::string(local_5340,"provide",&aStack_105dc);
  std::__cxx11::string::string(local_5320,"public",&aStack_105dd);
  std::__cxx11::string::string(local_5300,"pudding",&aStack_105de);
  std::__cxx11::string::string(local_52e0,"pull",&aStack_105df);
  std::__cxx11::string::string(local_52c0,"pulp",&aStack_105e0);
  std::__cxx11::string::string(local_52a0,"pulse",&aStack_105e1);
  std::__cxx11::string::string(local_5280,"pumpkin",&aStack_105e2);
  std::__cxx11::string::string(local_5260,"punch",&aStack_105e3);
  std::__cxx11::string::string(local_5240,"pupil",&aStack_105e4);
  std::__cxx11::string::string(local_5220,"puppy",&aStack_105e5);
  std::__cxx11::string::string(local_5200,"purchase",&aStack_105e6);
  std::__cxx11::string::string(local_51e0,"purity",&aStack_105e7);
  std::__cxx11::string::string(local_51c0,"purpose",&aStack_105e8);
  std::__cxx11::string::string(local_51a0,"purse",&aStack_105e9);
  std::__cxx11::string::string(local_5180,"push",&aStack_105ea);
  std::__cxx11::string::string(local_5160,"put",&aStack_105eb);
  std::__cxx11::string::string(local_5140,"puzzle",&aStack_105ec);
  std::__cxx11::string::string(local_5120,"pyramid",&aStack_105ed);
  std::__cxx11::string::string(local_5100,"quality",&aStack_105ee);
  std::__cxx11::string::string(local_50e0,"quantum",&aStack_105ef);
  std::__cxx11::string::string(local_50c0,"quarter",&aStack_105f0);
  std::__cxx11::string::string(local_50a0,"question",&aStack_105f1);
  std::__cxx11::string::string(local_5080,"quick",&aStack_105f2);
  std::__cxx11::string::string(local_5060,"quit",&aStack_105f3);
  std::__cxx11::string::string(local_5040,"quiz",&aStack_105f4);
  std::__cxx11::string::string(local_5020,"quote",&aStack_105f5);
  std::__cxx11::string::string(local_5000,"rabbit",&aStack_105f6);
  std::__cxx11::string::string(local_4fe0,"raccoon",&aStack_105f7);
  std::__cxx11::string::string(local_4fc0,"race",&aStack_105f8);
  std::__cxx11::string::string(local_4fa0,"rack",&aStack_105f9);
  std::__cxx11::string::string(local_4f80,"radar",&aStack_105fa);
  std::__cxx11::string::string(local_4f60,"radio",&aStack_105fb);
  std::__cxx11::string::string(local_4f40,"rail",&aStack_105fc);
  std::__cxx11::string::string(local_4f20,"rain",&aStack_105fd);
  std::__cxx11::string::string(local_4f00,"raise",&aStack_105fe);
  std::__cxx11::string::string(local_4ee0,"rally",&aStack_105ff);
  std::__cxx11::string::string(local_4ec0,"ramp",&aStack_10600);
  std::__cxx11::string::string(local_4ea0,"ranch",&aStack_10601);
  std::__cxx11::string::string(local_4e80,"random",&aStack_10602);
  std::__cxx11::string::string(local_4e60,"range",&aStack_10603);
  std::__cxx11::string::string(local_4e40,"rapid",&aStack_10604);
  std::__cxx11::string::string(local_4e20,"rare",&aStack_10605);
  std::__cxx11::string::string(local_4e00,"rate",&aStack_10606);
  std::__cxx11::string::string(local_4de0,"rather",&aStack_10607);
  std::__cxx11::string::string(local_4dc0,"raven",&aStack_10608);
  std::__cxx11::string::string(local_4da0,"raw",&aStack_10609);
  std::__cxx11::string::string(local_4d80,"razor",&aStack_1060a);
  std::__cxx11::string::string(local_4d60,"ready",&aStack_1060b);
  std::__cxx11::string::string(local_4d40,"real",&aStack_1060c);
  std::__cxx11::string::string(local_4d20,"reason",&aStack_1060d);
  std::__cxx11::string::string(local_4d00,"rebel",&aStack_1060e);
  std::__cxx11::string::string(local_4ce0,"rebuild",&aStack_1060f);
  std::__cxx11::string::string(local_4cc0,"recall",&aStack_10610);
  std::__cxx11::string::string(local_4ca0,"receive",&aStack_10611);
  std::__cxx11::string::string(local_4c80,"recipe",&aStack_10612);
  std::__cxx11::string::string(local_4c60,"record",&aStack_10613);
  std::__cxx11::string::string(local_4c40,"recycle",&aStack_10614);
  std::__cxx11::string::string(local_4c20,"reduce",&aStack_10615);
  std::__cxx11::string::string(local_4c00,"reflect",&aStack_10616);
  std::__cxx11::string::string(local_4be0,"reform",&aStack_10617);
  std::__cxx11::string::string(local_4bc0,"refuse",&aStack_10618);
  std::__cxx11::string::string(local_4ba0,"region",&aStack_10619);
  std::__cxx11::string::string(local_4b80,"regret",&aStack_1061a);
  std::__cxx11::string::string(local_4b60,"regular",&aStack_1061b);
  std::__cxx11::string::string(local_4b40,"reject",&aStack_1061c);
  std::__cxx11::string::string(local_4b20,"relax",&aStack_1061d);
  std::__cxx11::string::string(local_4b00,"release",&aStack_1061e);
  std::__cxx11::string::string(local_4ae0,"relief",&aStack_1061f);
  std::__cxx11::string::string(local_4ac0,"rely",&aStack_10620);
  std::__cxx11::string::string(local_4aa0,"remain",&aStack_10621);
  std::__cxx11::string::string(local_4a80,"remember",&aStack_10622);
  std::__cxx11::string::string(local_4a60,"remind",&aStack_10623);
  std::__cxx11::string::string(local_4a40,"remove",&aStack_10624);
  std::__cxx11::string::string(local_4a20,"render",&aStack_10625);
  std::__cxx11::string::string(local_4a00,"renew",&aStack_10626);
  std::__cxx11::string::string(local_49e0,"rent",&aStack_10627);
  std::__cxx11::string::string(local_49c0,"reopen",&aStack_10628);
  std::__cxx11::string::string(local_49a0,"repair",&aStack_10629);
  std::__cxx11::string::string(local_4980,"repeat",&aStack_1062a);
  std::__cxx11::string::string(local_4960,"replace",&aStack_1062b);
  std::__cxx11::string::string(local_4940,"report",&aStack_1062c);
  std::__cxx11::string::string(local_4920,"require",&aStack_1062d);
  std::__cxx11::string::string(local_4900,"rescue",&aStack_1062e);
  std::__cxx11::string::string(local_48e0,"resemble",&aStack_1062f);
  std::__cxx11::string::string(local_48c0,"resist",&aStack_10630);
  std::__cxx11::string::string(local_48a0,"resource",&aStack_10631);
  std::__cxx11::string::string(local_4880,"response",&aStack_10632);
  std::__cxx11::string::string(local_4860,"result",&aStack_10633);
  std::__cxx11::string::string(local_4840,"retire",&aStack_10634);
  std::__cxx11::string::string(local_4820,"retreat",&aStack_10635);
  std::__cxx11::string::string(local_4800,"return",&aStack_10636);
  std::__cxx11::string::string(local_47e0,"reunion",&aStack_10637);
  std::__cxx11::string::string(local_47c0,"reveal",&aStack_10638);
  std::__cxx11::string::string(local_47a0,"review",&aStack_10639);
  std::__cxx11::string::string(local_4780,"reward",&aStack_1063a);
  std::__cxx11::string::string(local_4760,"rhythm",&aStack_1063b);
  std::__cxx11::string::string(local_4740,"rib",&aStack_1063c);
  std::__cxx11::string::string(local_4720,"ribbon",&aStack_1063d);
  std::__cxx11::string::string(local_4700,"rice",&aStack_1063e);
  std::__cxx11::string::string(local_46e0,"rich",&aStack_1063f);
  std::__cxx11::string::string(local_46c0,"ride",&aStack_10640);
  std::__cxx11::string::string(local_46a0,"ridge",&aStack_10641);
  std::__cxx11::string::string(local_4680,"rifle",&aStack_10642);
  std::__cxx11::string::string(local_4660,"right",&aStack_10643);
  std::__cxx11::string::string(local_4640,"rigid",&aStack_10644);
  std::__cxx11::string::string(local_4620,"ring",&aStack_10645);
  std::__cxx11::string::string(local_4600,"riot",&aStack_10646);
  std::__cxx11::string::string(local_45e0,"ripple",&aStack_10647);
  std::__cxx11::string::string(local_45c0,"risk",&aStack_10648);
  std::__cxx11::string::string(local_45a0,"ritual",&aStack_10649);
  std::__cxx11::string::string(local_4580,"rival",&aStack_1064a);
  std::__cxx11::string::string(local_4560,"river",&aStack_1064b);
  std::__cxx11::string::string(local_4540,"road",&aStack_1064c);
  std::__cxx11::string::string(local_4520,"roast",&aStack_1064d);
  std::__cxx11::string::string(local_4500,"robot",&aStack_1064e);
  std::__cxx11::string::string(local_44e0,"robust",&aStack_1064f);
  std::__cxx11::string::string(local_44c0,"rocket",&aStack_10650);
  std::__cxx11::string::string(local_44a0,"romance",&aStack_10651);
  std::__cxx11::string::string(local_4480,"roof",&aStack_10652);
  std::__cxx11::string::string(local_4460,"rookie",&aStack_10653);
  std::__cxx11::string::string(local_4440,"room",&aStack_10654);
  std::__cxx11::string::string(local_4420,"rose",&aStack_10655);
  std::__cxx11::string::string(local_4400,"rotate",&aStack_10656);
  std::__cxx11::string::string(local_43e0,"rough",&aStack_10657);
  std::__cxx11::string::string(local_43c0,"round",&aStack_10658);
  std::__cxx11::string::string(local_43a0,"route",&aStack_10659);
  std::__cxx11::string::string(local_4380,"royal",&aStack_1065a);
  std::__cxx11::string::string(local_4360,"rubber",&aStack_1065b);
  std::__cxx11::string::string(local_4340,"rude",&aStack_1065c);
  std::__cxx11::string::string(local_4320,"rug",&aStack_1065d);
  std::__cxx11::string::string(local_4300,"rule",&aStack_1065e);
  std::__cxx11::string::string(local_42e0,"run",&aStack_1065f);
  std::__cxx11::string::string(local_42c0,"runway",&aStack_10660);
  std::__cxx11::string::string(local_42a0,"rural",&aStack_10661);
  std::__cxx11::string::string(local_4280,"sad",&aStack_10662);
  std::__cxx11::string::string(local_4260,"saddle",&aStack_10663);
  std::__cxx11::string::string(local_4240,"sadness",&aStack_10664);
  std::__cxx11::string::string(local_4220,"safe",&aStack_10665);
  std::__cxx11::string::string(local_4200,"sail",&aStack_10666);
  std::__cxx11::string::string(local_41e0,"salad",&aStack_10667);
  std::__cxx11::string::string(local_41c0,"salmon",&aStack_10668);
  std::__cxx11::string::string(local_41a0,"salon",&aStack_10669);
  std::__cxx11::string::string(local_4180,"salt",&aStack_1066a);
  std::__cxx11::string::string(local_4160,"salute",&aStack_1066b);
  std::__cxx11::string::string(local_4140,"same",&aStack_1066c);
  std::__cxx11::string::string(local_4120,"sample",&aStack_1066d);
  std::__cxx11::string::string(local_4100,"sand",&aStack_1066e);
  std::__cxx11::string::string(local_40e0,"satisfy",&aStack_1066f);
  std::__cxx11::string::string(local_40c0,"satoshi",&aStack_10670);
  std::__cxx11::string::string(local_40a0,"sauce",&aStack_10671);
  std::__cxx11::string::string(local_4080,"sausage",&aStack_10672);
  std::__cxx11::string::string(local_4060,"save",&aStack_10673);
  std::__cxx11::string::string(local_4040,"say",&aStack_10674);
  std::__cxx11::string::string(local_4020,"scale",&aStack_10675);
  std::__cxx11::string::string(local_4000,"scan",&aStack_10676);
  std::__cxx11::string::string(local_3fe0,"scare",&aStack_10677);
  std::__cxx11::string::string(local_3fc0,"scatter",&aStack_10678);
  std::__cxx11::string::string(local_3fa0,"scene",&aStack_10679);
  std::__cxx11::string::string(local_3f80,"scheme",&aStack_1067a);
  std::__cxx11::string::string(local_3f60,"school",&aStack_1067b);
  std::__cxx11::string::string(local_3f40,"science",&aStack_1067c);
  std::__cxx11::string::string(local_3f20,"scissors",&aStack_1067d);
  std::__cxx11::string::string(local_3f00,"scorpion",&aStack_1067e);
  std::__cxx11::string::string(local_3ee0,"scout",&aStack_1067f);
  std::__cxx11::string::string(local_3ec0,"scrap",&aStack_10680);
  std::__cxx11::string::string(local_3ea0,"screen",&aStack_10681);
  std::__cxx11::string::string(local_3e80,"script",&aStack_10682);
  std::__cxx11::string::string(local_3e60,"scrub",&aStack_10683);
  std::__cxx11::string::string(local_3e40,"sea",&aStack_10684);
  std::__cxx11::string::string(local_3e20,"search",&aStack_10685);
  std::__cxx11::string::string(local_3e00,"season",&aStack_10686);
  std::__cxx11::string::string(local_3de0,"seat",&aStack_10687);
  std::__cxx11::string::string(local_3dc0,"second",&aStack_10688);
  std::__cxx11::string::string(local_3da0,"secret",&aStack_10689);
  std::__cxx11::string::string(local_3d80,"section",&aStack_1068a);
  std::__cxx11::string::string(local_3d60,"security",&aStack_1068b);
  std::__cxx11::string::string(local_3d40,"seed",&aStack_1068c);
  std::__cxx11::string::string(local_3d20,"seek",&aStack_1068d);
  std::__cxx11::string::string(local_3d00,"segment",&aStack_1068e);
  std::__cxx11::string::string(local_3ce0,"select",&aStack_1068f);
  std::__cxx11::string::string(local_3cc0,"sell",&aStack_10690);
  std::__cxx11::string::string(local_3ca0,"seminar",&aStack_10691);
  std::__cxx11::string::string(local_3c80,"senior",&aStack_10692);
  std::__cxx11::string::string(local_3c60,"sense",&aStack_10693);
  std::__cxx11::string::string(local_3c40,"sentence",&aStack_10694);
  std::__cxx11::string::string(local_3c20,"series",&aStack_10695);
  std::__cxx11::string::string(local_3c00,"service",&aStack_10696);
  std::__cxx11::string::string(local_3be0,"session",&aStack_10697);
  std::__cxx11::string::string(local_3bc0,"settle",&aStack_10698);
  std::__cxx11::string::string(local_3ba0,"setup",&aStack_10699);
  std::__cxx11::string::string(local_3b80,"seven",&aStack_1069a);
  std::__cxx11::string::string(local_3b60,"shadow",&aStack_1069b);
  std::__cxx11::string::string(local_3b40,"shaft",&aStack_1069c);
  std::__cxx11::string::string(local_3b20,"shallow",&aStack_1069d);
  std::__cxx11::string::string(local_3b00,"share",&aStack_1069e);
  std::__cxx11::string::string(local_3ae0,"shed",&aStack_1069f);
  std::__cxx11::string::string(local_3ac0,"shell",&aStack_106a0);
  std::__cxx11::string::string(local_3aa0,"sheriff",&aStack_106a1);
  std::__cxx11::string::string(local_3a80,"shield",&aStack_106a2);
  std::__cxx11::string::string(local_3a60,"shift",&aStack_106a3);
  std::__cxx11::string::string(local_3a40,"shine",&aStack_106a4);
  std::__cxx11::string::string(local_3a20,"ship",&aStack_106a5);
  std::__cxx11::string::string(local_3a00,"shiver",&aStack_106a6);
  std::__cxx11::string::string(local_39e0,"shock",&aStack_106a7);
  std::__cxx11::string::string(local_39c0,"shoe",&aStack_106a8);
  std::__cxx11::string::string(local_39a0,"shoot",&aStack_106a9);
  std::__cxx11::string::string(local_3980,"shop",&aStack_106aa);
  std::__cxx11::string::string(local_3960,"short",&aStack_106ab);
  std::__cxx11::string::string(local_3940,"shoulder",&aStack_106ac);
  std::__cxx11::string::string(local_3920,"shove",&aStack_106ad);
  std::__cxx11::string::string(local_3900,"shrimp",&aStack_106ae);
  std::__cxx11::string::string(local_38e0,"shrug",&aStack_106af);
  std::__cxx11::string::string(local_38c0,"shuffle",&aStack_106b0);
  std::__cxx11::string::string(local_38a0,"shy",&aStack_106b1);
  std::__cxx11::string::string(local_3880,"sibling",&aStack_106b2);
  std::__cxx11::string::string(local_3860,"sick",&aStack_106b3);
  std::__cxx11::string::string(local_3840,"side",&aStack_106b4);
  std::__cxx11::string::string(local_3820,"siege",&aStack_106b5);
  std::__cxx11::string::string(local_3800,"sight",&aStack_106b6);
  std::__cxx11::string::string(local_37e0,"sign",&aStack_106b7);
  std::__cxx11::string::string(local_37c0,"silent",&aStack_106b8);
  std::__cxx11::string::string(local_37a0,"silk",&aStack_106b9);
  std::__cxx11::string::string(local_3780,"silly",&aStack_106ba);
  std::__cxx11::string::string(local_3760,"silver",&aStack_106bb);
  std::__cxx11::string::string(local_3740,"similar",&aStack_106bc);
  std::__cxx11::string::string(local_3720,"simple",&aStack_106bd);
  std::__cxx11::string::string(local_3700,"since",&aStack_106be);
  std::__cxx11::string::string(local_36e0,"sing",&aStack_106bf);
  std::__cxx11::string::string(local_36c0,"siren",&aStack_106c0);
  std::__cxx11::string::string(local_36a0,"sister",&aStack_106c1);
  std::__cxx11::string::string(local_3680,"situate",&aStack_106c2);
  std::__cxx11::string::string(local_3660,"six",&aStack_106c3);
  std::__cxx11::string::string(local_3640,"size",&aStack_106c4);
  std::__cxx11::string::string(local_3620,"skate",&aStack_106c5);
  std::__cxx11::string::string(local_3600,"sketch",&aStack_106c6);
  std::__cxx11::string::string(local_35e0,"ski",&aStack_106c7);
  std::__cxx11::string::string(local_35c0,"skill",&aStack_106c8);
  std::__cxx11::string::string(local_35a0,"skin",&aStack_106c9);
  std::__cxx11::string::string(local_3580,"skirt",&aStack_106ca);
  std::__cxx11::string::string(local_3560,"skull",&aStack_106cb);
  std::__cxx11::string::string(local_3540,"slab",&aStack_106cc);
  std::__cxx11::string::string(local_3520,"slam",&aStack_106cd);
  std::__cxx11::string::string(local_3500,"sleep",&aStack_106ce);
  std::__cxx11::string::string(local_34e0,"slender",&aStack_106cf);
  std::__cxx11::string::string(local_34c0,"slice",&aStack_106d0);
  std::__cxx11::string::string(local_34a0,"slide",&aStack_106d1);
  std::__cxx11::string::string(local_3480,"slight",&aStack_106d2);
  std::__cxx11::string::string(local_3460,"slim",&aStack_106d3);
  std::__cxx11::string::string(local_3440,"slogan",&aStack_106d4);
  std::__cxx11::string::string(local_3420,"slot",&aStack_106d5);
  std::__cxx11::string::string(local_3400,"slow",&aStack_106d6);
  std::__cxx11::string::string(local_33e0,"slush",&aStack_106d7);
  std::__cxx11::string::string(local_33c0,"small",&aStack_106d8);
  std::__cxx11::string::string(local_33a0,"smart",&aStack_106d9);
  std::__cxx11::string::string(local_3380,"smile",&aStack_106da);
  std::__cxx11::string::string(local_3360,"smoke",&aStack_106db);
  std::__cxx11::string::string(local_3340,"smooth",&aStack_106dc);
  std::__cxx11::string::string(local_3320,"snack",&aStack_106dd);
  std::__cxx11::string::string(local_3300,"snake",&aStack_106de);
  std::__cxx11::string::string(local_32e0,"snap",&aStack_106df);
  std::__cxx11::string::string(local_32c0,"sniff",&aStack_106e0);
  std::__cxx11::string::string(local_32a0,"snow",&aStack_106e1);
  std::__cxx11::string::string(local_3280,"soap",&aStack_106e2);
  std::__cxx11::string::string(local_3260,"soccer",&aStack_106e3);
  std::__cxx11::string::string(local_3240,"social",&aStack_106e4);
  std::__cxx11::string::string(local_3220,"sock",&aStack_106e5);
  std::__cxx11::string::string(local_3200,"soda",&aStack_106e6);
  std::__cxx11::string::string(local_31e0,"soft",&aStack_106e7);
  std::__cxx11::string::string(local_31c0,"solar",&aStack_106e8);
  std::__cxx11::string::string(local_31a0,"soldier",&aStack_106e9);
  std::__cxx11::string::string(local_3180,"solid",&aStack_106ea);
  std::__cxx11::string::string(local_3160,"solution",&aStack_106eb);
  std::__cxx11::string::string(local_3140,"solve",&aStack_106ec);
  std::__cxx11::string::string(local_3120,"someone",&aStack_106ed);
  std::__cxx11::string::string(local_3100,"song",&aStack_106ee);
  std::__cxx11::string::string(local_30e0,"soon",&aStack_106ef);
  std::__cxx11::string::string(local_30c0,"sorry",&aStack_106f0);
  std::__cxx11::string::string(local_30a0,"sort",&aStack_106f1);
  std::__cxx11::string::string(local_3080,"soul",&aStack_106f2);
  std::__cxx11::string::string(local_3060,"sound",&aStack_106f3);
  std::__cxx11::string::string(local_3040,"soup",&aStack_106f4);
  std::__cxx11::string::string(local_3020,"source",&aStack_106f5);
  std::__cxx11::string::string(local_3000,"south",&aStack_106f6);
  std::__cxx11::string::string(local_2fe0,"space",&aStack_106f7);
  std::__cxx11::string::string(local_2fc0,"spare",&aStack_106f8);
  std::__cxx11::string::string(local_2fa0,"spatial",&aStack_106f9);
  std::__cxx11::string::string(local_2f80,"spawn",&aStack_106fa);
  std::__cxx11::string::string(local_2f60,"speak",&aStack_106fb);
  std::__cxx11::string::string(local_2f40,"special",&aStack_106fc);
  std::__cxx11::string::string(local_2f20,"speed",&aStack_106fd);
  std::__cxx11::string::string(local_2f00,"spell",&aStack_106fe);
  std::__cxx11::string::string(local_2ee0,"spend",&aStack_106ff);
  std::__cxx11::string::string(local_2ec0,"sphere",&aStack_10700);
  std::__cxx11::string::string(local_2ea0,"spice",&aStack_10701);
  std::__cxx11::string::string(local_2e80,"spider",&aStack_10702);
  std::__cxx11::string::string(local_2e60,"spike",&aStack_10703);
  std::__cxx11::string::string(local_2e40,"spin",&aStack_10704);
  std::__cxx11::string::string(local_2e20,"spirit",&aStack_10705);
  std::__cxx11::string::string(local_2e00,"split",&aStack_10706);
  std::__cxx11::string::string(local_2de0,"spoil",&aStack_10707);
  std::__cxx11::string::string(local_2dc0,"sponsor",&aStack_10708);
  std::__cxx11::string::string(local_2da0,"spoon",&aStack_10709);
  std::__cxx11::string::string(local_2d80,"sport",&aStack_1070a);
  std::__cxx11::string::string(local_2d60,"spot",&aStack_1070b);
  std::__cxx11::string::string(local_2d40,"spray",&aStack_1070c);
  std::__cxx11::string::string(local_2d20,"spread",&aStack_1070d);
  std::__cxx11::string::string(local_2d00,"spring",&aStack_1070e);
  std::__cxx11::string::string(local_2ce0,"spy",&aStack_1070f);
  std::__cxx11::string::string(local_2cc0,"square",&aStack_10710);
  std::__cxx11::string::string(local_2ca0,"squeeze",&aStack_10711);
  std::__cxx11::string::string(local_2c80,"squirrel",&aStack_10712);
  std::__cxx11::string::string(local_2c60,"stable",&aStack_10713);
  std::__cxx11::string::string(local_2c40,"stadium",&aStack_10714);
  std::__cxx11::string::string(local_2c20,"staff",&aStack_10715);
  std::__cxx11::string::string(local_2c00,"stage",&aStack_10716);
  std::__cxx11::string::string(local_2be0,"stairs",&aStack_10717);
  std::__cxx11::string::string(local_2bc0,"stamp",&aStack_10718);
  std::__cxx11::string::string(local_2ba0,"stand",&aStack_10719);
  std::__cxx11::string::string(local_2b80,"start",&aStack_1071a);
  std::__cxx11::string::string(local_2b60,"state",&aStack_1071b);
  std::__cxx11::string::string(local_2b40,"stay",&aStack_1071c);
  std::__cxx11::string::string(local_2b20,"steak",&aStack_1071d);
  std::__cxx11::string::string(local_2b00,"steel",&aStack_1071e);
  std::__cxx11::string::string(local_2ae0,"stem",&aStack_1071f);
  std::__cxx11::string::string(local_2ac0,"step",&aStack_10720);
  std::__cxx11::string::string(local_2aa0,"stereo",&aStack_10721);
  std::__cxx11::string::string(local_2a80,"stick",&aStack_10722);
  std::__cxx11::string::string(local_2a60,"still",&aStack_10723);
  std::__cxx11::string::string(local_2a40,"sting",&aStack_10724);
  std::__cxx11::string::string(local_2a20,"stock",&aStack_10725);
  std::__cxx11::string::string(local_2a00,"stomach",&aStack_10726);
  std::__cxx11::string::string(local_29e0,"stone",&aStack_10727);
  std::__cxx11::string::string(local_29c0,"stool",&aStack_10728);
  std::__cxx11::string::string(local_29a0,"story",&aStack_10729);
  std::__cxx11::string::string(local_2980,"stove",&aStack_1072a);
  std::__cxx11::string::string(local_2960,"strategy",&aStack_1072b);
  std::__cxx11::string::string(local_2940,"street",&aStack_1072c);
  std::__cxx11::string::string(local_2920,"strike",&aStack_1072d);
  std::__cxx11::string::string(local_2900,"strong",&aStack_1072e);
  std::__cxx11::string::string(local_28e0,"struggle",&aStack_1072f);
  std::__cxx11::string::string(local_28c0,"student",&aStack_10730);
  std::__cxx11::string::string(local_28a0,"stuff",&aStack_10731);
  std::__cxx11::string::string(local_2880,"stumble",&aStack_10732);
  std::__cxx11::string::string(local_2860,"style",&aStack_10733);
  std::__cxx11::string::string(local_2840,"subject",&aStack_10734);
  std::__cxx11::string::string(local_2820,"submit",&aStack_10735);
  std::__cxx11::string::string(local_2800,"subway",&aStack_10736);
  std::__cxx11::string::string(local_27e0,"success",&aStack_10737);
  std::__cxx11::string::string(local_27c0,"such",&aStack_10738);
  std::__cxx11::string::string(local_27a0,"sudden",&aStack_10739);
  std::__cxx11::string::string(local_2780,"suffer",&aStack_1073a);
  std::__cxx11::string::string(local_2760,"sugar",&aStack_1073b);
  std::__cxx11::string::string(local_2740,"suggest",&aStack_1073c);
  std::__cxx11::string::string(local_2720,"suit",&aStack_1073d);
  std::__cxx11::string::string(local_2700,"summer",&aStack_1073e);
  std::__cxx11::string::string(local_26e0,"sun",&aStack_1073f);
  std::__cxx11::string::string(local_26c0,"sunny",&aStack_10740);
  std::__cxx11::string::string(local_26a0,"sunset",&aStack_10741);
  std::__cxx11::string::string(local_2680,"super",&aStack_10742);
  std::__cxx11::string::string(local_2660,"supply",&aStack_10743);
  std::__cxx11::string::string(local_2640,"supreme",&aStack_10744);
  std::__cxx11::string::string(local_2620,"sure",&aStack_10745);
  std::__cxx11::string::string(local_2600,"surface",&aStack_10746);
  std::__cxx11::string::string(local_25e0,"surge",&aStack_10747);
  std::__cxx11::string::string(local_25c0,"surprise",&aStack_10748);
  std::__cxx11::string::string(local_25a0,"surround",&aStack_10749);
  std::__cxx11::string::string(local_2580,"survey",&aStack_1074a);
  std::__cxx11::string::string(local_2560,"suspect",&aStack_1074b);
  std::__cxx11::string::string(local_2540,"sustain",&aStack_1074c);
  std::__cxx11::string::string(local_2520,"swallow",&aStack_1074d);
  std::__cxx11::string::string(local_2500,"swamp",&aStack_1074e);
  std::__cxx11::string::string(local_24e0,"swap",&aStack_1074f);
  std::__cxx11::string::string(local_24c0,"swarm",&aStack_10750);
  std::__cxx11::string::string(local_24a0,"swear",&aStack_10751);
  std::__cxx11::string::string(local_2480,"sweet",&aStack_10752);
  std::__cxx11::string::string(local_2460,"swift",&aStack_10753);
  std::__cxx11::string::string(local_2440,"swim",&aStack_10754);
  std::__cxx11::string::string(local_2420,"swing",&aStack_10755);
  std::__cxx11::string::string(local_2400,"switch",&aStack_10756);
  std::__cxx11::string::string(local_23e0,"sword",&aStack_10757);
  std::__cxx11::string::string(local_23c0,"symbol",&aStack_10758);
  std::__cxx11::string::string(local_23a0,"symptom",&aStack_10759);
  std::__cxx11::string::string(local_2380,"syrup",&aStack_1075a);
  std::__cxx11::string::string(local_2360,"system",&aStack_1075b);
  std::__cxx11::string::string(local_2340,"table",&aStack_1075c);
  std::__cxx11::string::string(local_2320,"tackle",&aStack_1075d);
  std::__cxx11::string::string(local_2300,"tag",&aStack_1075e);
  std::__cxx11::string::string(local_22e0,"tail",&aStack_1075f);
  std::__cxx11::string::string(local_22c0,"talent",&aStack_10760);
  std::__cxx11::string::string(local_22a0,"talk",&aStack_10761);
  std::__cxx11::string::string(local_2280,"tank",&aStack_10762);
  std::__cxx11::string::string(local_2260,"tape",&aStack_10763);
  std::__cxx11::string::string(local_2240,"target",&aStack_10764);
  std::__cxx11::string::string(local_2220,"task",&aStack_10765);
  std::__cxx11::string::string(local_2200,"taste",&aStack_10766);
  std::__cxx11::string::string(local_21e0,"tattoo",&aStack_10767);
  std::__cxx11::string::string(local_21c0,"taxi",&aStack_10768);
  std::__cxx11::string::string(local_21a0,"teach",&aStack_10769);
  std::__cxx11::string::string(local_2180,"team",&aStack_1076a);
  std::__cxx11::string::string(local_2160,"tell",&aStack_1076b);
  std::__cxx11::string::string(local_2140,"ten",&aStack_1076c);
  std::__cxx11::string::string(local_2120,"tenant",&aStack_1076d);
  std::__cxx11::string::string(local_2100,"tennis",&aStack_1076e);
  std::__cxx11::string::string(local_20e0,"tent",&aStack_1076f);
  std::__cxx11::string::string(local_20c0,"term",&aStack_10770);
  std::__cxx11::string::string(local_20a0,"test",&aStack_10771);
  std::__cxx11::string::string(local_2080,"text",&aStack_10772);
  std::__cxx11::string::string(local_2060,"thank",&aStack_10773);
  std::__cxx11::string::string(local_2040,"that",&aStack_10774);
  std::__cxx11::string::string(local_2020,"theme",&aStack_10775);
  std::__cxx11::string::string(local_2000,"then",&aStack_10776);
  std::__cxx11::string::string(local_1fe0,"theory",&aStack_10777);
  std::__cxx11::string::string(local_1fc0,"there",&aStack_10778);
  std::__cxx11::string::string(local_1fa0,"they",&aStack_10779);
  std::__cxx11::string::string(local_1f80,"thing",&aStack_1077a);
  std::__cxx11::string::string(local_1f60,"this",&aStack_1077b);
  std::__cxx11::string::string(local_1f40,"thought",&aStack_1077c);
  std::__cxx11::string::string(local_1f20,"three",&aStack_1077d);
  std::__cxx11::string::string(local_1f00,"thrive",&aStack_1077e);
  std::__cxx11::string::string(local_1ee0,"throw",&aStack_1077f);
  std::__cxx11::string::string(local_1ec0,"thumb",&aStack_10780);
  std::__cxx11::string::string(local_1ea0,"thunder",&aStack_10781);
  std::__cxx11::string::string(local_1e80,"ticket",&aStack_10782);
  std::__cxx11::string::string(local_1e60,"tide",&aStack_10783);
  std::__cxx11::string::string(local_1e40,"tiger",&aStack_10784);
  std::__cxx11::string::string(local_1e20,"tilt",&aStack_10785);
  std::__cxx11::string::string(local_1e00,"timber",&aStack_10786);
  std::__cxx11::string::string(local_1de0,"time",&aStack_10787);
  std::__cxx11::string::string(local_1dc0,"tiny",&aStack_10788);
  std::__cxx11::string::string(local_1da0,"tip",&aStack_10789);
  std::__cxx11::string::string(local_1d80,"tired",&aStack_1078a);
  std::__cxx11::string::string(local_1d60,"tissue",&aStack_1078b);
  std::__cxx11::string::string(local_1d40,"title",&aStack_1078c);
  std::__cxx11::string::string(local_1d20,"toast",&aStack_1078d);
  std::__cxx11::string::string(local_1d00,"tobacco",&aStack_1078e);
  std::__cxx11::string::string(local_1ce0,"today",&aStack_1078f);
  std::__cxx11::string::string(local_1cc0,"toddler",&aStack_10790);
  std::__cxx11::string::string(local_1ca0,"toe",&aStack_10791);
  std::__cxx11::string::string(local_1c80,"together",&aStack_10792);
  std::__cxx11::string::string(local_1c60,"toilet",&aStack_10793);
  std::__cxx11::string::string(local_1c40,"token",&aStack_10794);
  std::__cxx11::string::string(local_1c20,"tomato",&aStack_10795);
  std::__cxx11::string::string(local_1c00,"tomorrow",&aStack_10796);
  std::__cxx11::string::string(local_1be0,"tone",&aStack_10797);
  std::__cxx11::string::string(local_1bc0,"tongue",&aStack_10798);
  std::__cxx11::string::string(local_1ba0,"tonight",&aStack_10799);
  std::__cxx11::string::string(local_1b80,"tool",&aStack_1079a);
  std::__cxx11::string::string(local_1b60,"tooth",&aStack_1079b);
  std::__cxx11::string::string(local_1b40,"top",&aStack_1079c);
  std::__cxx11::string::string(local_1b20,"topic",&aStack_1079d);
  std::__cxx11::string::string(local_1b00,"topple",&aStack_1079e);
  std::__cxx11::string::string(local_1ae0,"torch",&aStack_1079f);
  std::__cxx11::string::string(local_1ac0,"tornado",&aStack_107a0);
  std::__cxx11::string::string(local_1aa0,"tortoise",&aStack_107a1);
  std::__cxx11::string::string(local_1a80,"toss",&aStack_107a2);
  std::__cxx11::string::string(local_1a60,"total",&aStack_107a3);
  std::__cxx11::string::string(local_1a40,"tourist",&aStack_107a4);
  std::__cxx11::string::string(local_1a20,"toward",&aStack_107a5);
  std::__cxx11::string::string(local_1a00,"tower",&aStack_107a6);
  std::__cxx11::string::string(local_19e0,"town",&aStack_107a7);
  std::__cxx11::string::string(local_19c0,"toy",&aStack_107a8);
  std::__cxx11::string::string(local_19a0,"track",&aStack_107a9);
  std::__cxx11::string::string(local_1980,"trade",&aStack_107aa);
  std::__cxx11::string::string(local_1960,"traffic",&aStack_107ab);
  std::__cxx11::string::string(local_1940,"tragic",&aStack_107ac);
  std::__cxx11::string::string(local_1920,"train",&aStack_107ad);
  std::__cxx11::string::string(local_1900,"transfer",&aStack_107ae);
  std::__cxx11::string::string(local_18e0,"trap",&aStack_107af);
  std::__cxx11::string::string(local_18c0,"trash",&aStack_107b0);
  std::__cxx11::string::string(local_18a0,"travel",&aStack_107b1);
  std::__cxx11::string::string(local_1880,"tray",&aStack_107b2);
  std::__cxx11::string::string(local_1860,"treat",&aStack_107b3);
  std::__cxx11::string::string(local_1840,"tree",&aStack_107b4);
  std::__cxx11::string::string(local_1820,"trend",&aStack_107b5);
  std::__cxx11::string::string(local_1800,"trial",&aStack_107b6);
  std::__cxx11::string::string(local_17e0,"tribe",&aStack_107b7);
  std::__cxx11::string::string(local_17c0,"trick",&aStack_107b8);
  std::__cxx11::string::string(local_17a0,"trigger",&aStack_107b9);
  std::__cxx11::string::string(local_1780,"trim",&aStack_107ba);
  std::__cxx11::string::string(local_1760,"trip",&aStack_107bb);
  std::__cxx11::string::string(local_1740,"trophy",&aStack_107bc);
  std::__cxx11::string::string(local_1720,"trouble",&aStack_107bd);
  std::__cxx11::string::string(local_1700,"truck",&aStack_107be);
  std::__cxx11::string::string(local_16e0,"true",&aStack_107bf);
  std::__cxx11::string::string(local_16c0,"truly",&aStack_107c0);
  std::__cxx11::string::string(local_16a0,"trumpet",&aStack_107c1);
  std::__cxx11::string::string(local_1680,"trust",&aStack_107c2);
  std::__cxx11::string::string(local_1660,"truth",&aStack_107c3);
  std::__cxx11::string::string(local_1640,"try",&aStack_107c4);
  std::__cxx11::string::string(local_1620,"tube",&aStack_107c5);
  std::__cxx11::string::string(local_1600,"tuition",&aStack_107c6);
  std::__cxx11::string::string(local_15e0,"tumble",&aStack_107c7);
  std::__cxx11::string::string(local_15c0,"tuna",&aStack_107c8);
  std::__cxx11::string::string(local_15a0,"tunnel",&aStack_107c9);
  std::__cxx11::string::string(local_1580,"turkey",&aStack_107ca);
  std::__cxx11::string::string(local_1560,"turn",&aStack_107cb);
  std::__cxx11::string::string(local_1540,"turtle",&aStack_107cc);
  std::__cxx11::string::string(local_1520,"twelve",&aStack_107cd);
  std::__cxx11::string::string(local_1500,"twenty",&aStack_107ce);
  std::__cxx11::string::string(local_14e0,"twice",&aStack_107cf);
  std::__cxx11::string::string(local_14c0,"twin",&aStack_107d0);
  std::__cxx11::string::string(local_14a0,"twist",&aStack_107d1);
  std::__cxx11::string::string(local_1480,"two",&aStack_107d2);
  std::__cxx11::string::string(local_1460,"type",&aStack_107d3);
  std::__cxx11::string::string(local_1440,"typical",&aStack_107d4);
  std::__cxx11::string::string(local_1420,"ugly",&aStack_107d5);
  std::__cxx11::string::string(local_1400,"umbrella",&aStack_107d6);
  std::__cxx11::string::string(local_13e0,"unable",&aStack_107d7);
  std::__cxx11::string::string(local_13c0,"unaware",&aStack_107d8);
  std::__cxx11::string::string(local_13a0,"uncle",&aStack_107d9);
  std::__cxx11::string::string(local_1380,"uncover",&aStack_107da);
  std::__cxx11::string::string(local_1360,"under",&aStack_107db);
  std::__cxx11::string::string(local_1340,"undo",&aStack_107dc);
  std::__cxx11::string::string(local_1320,"unfair",&aStack_107dd);
  std::__cxx11::string::string(local_1300,"unfold",&aStack_107de);
  std::__cxx11::string::string(local_12e0,"unhappy",&aStack_107df);
  std::__cxx11::string::string(local_12c0,"uniform",&aStack_107e0);
  std::__cxx11::string::string(local_12a0,"unique",&aStack_107e1);
  std::__cxx11::string::string(local_1280,"unit",&aStack_107e2);
  std::__cxx11::string::string(local_1260,"universe",&aStack_107e3);
  std::__cxx11::string::string(local_1240,"unknown",&aStack_107e4);
  std::__cxx11::string::string(local_1220,"unlock",&aStack_107e5);
  std::__cxx11::string::string(local_1200,"until",&aStack_107e6);
  std::__cxx11::string::string(local_11e0,"unusual",&aStack_107e7);
  std::__cxx11::string::string(local_11c0,"unveil",&aStack_107e8);
  std::__cxx11::string::string(local_11a0,"update",&aStack_107e9);
  std::__cxx11::string::string(local_1180,"upgrade",&aStack_107ea);
  std::__cxx11::string::string(local_1160,"uphold",&aStack_107eb);
  std::__cxx11::string::string(local_1140,"upon",&aStack_107ec);
  std::__cxx11::string::string(local_1120,"upper",&aStack_107ed);
  std::__cxx11::string::string(local_1100,"upset",&aStack_107ee);
  std::__cxx11::string::string(local_10e0,"urban",&aStack_107ef);
  std::__cxx11::string::string(local_10c0,"urge",&aStack_107f0);
  std::__cxx11::string::string(local_10a0,"usage",&aStack_107f1);
  std::__cxx11::string::string(local_1080,"use",&aStack_107f2);
  std::__cxx11::string::string(local_1060,"used",&aStack_107f3);
  std::__cxx11::string::string(local_1040,"useful",&aStack_107f4);
  std::__cxx11::string::string(local_1020,"useless",&aStack_107f5);
  std::__cxx11::string::string(local_1000,"usual",&aStack_107f6);
  std::__cxx11::string::string(local_fe0,"utility",&aStack_107f7);
  std::__cxx11::string::string(local_fc0,"vacant",&aStack_107f8);
  std::__cxx11::string::string(local_fa0,"vacuum",&aStack_107f9);
  std::__cxx11::string::string(local_f80,"vague",&aStack_107fa);
  std::__cxx11::string::string(local_f60,"valid",&aStack_107fb);
  std::__cxx11::string::string(local_f40,"valley",&aStack_107fc);
  std::__cxx11::string::string(local_f20,"valve",&aStack_107fd);
  std::__cxx11::string::string(local_f00,"van",&aStack_107fe);
  std::__cxx11::string::string(local_ee0,"vanish",&aStack_107ff);
  std::__cxx11::string::string(local_ec0,"vapor",&aStack_10800);
  std::__cxx11::string::string(local_ea0,"various",&aStack_10801);
  std::__cxx11::string::string(local_e80,"vast",&aStack_10802);
  std::__cxx11::string::string(local_e60,"vault",&aStack_10803);
  std::__cxx11::string::string(local_e40,"vehicle",&aStack_10804);
  std::__cxx11::string::string(local_e20,"velvet",&aStack_10805);
  std::__cxx11::string::string(local_e00,"vendor",&aStack_10806);
  std::__cxx11::string::string(local_de0,"venture",&aStack_10807);
  std::__cxx11::string::string(local_dc0,"venue",&aStack_10808);
  std::__cxx11::string::string(local_da0,"verb",&aStack_10809);
  std::__cxx11::string::string(local_d80,"verify",&aStack_1080a);
  std::__cxx11::string::string(local_d60,"version",&aStack_1080b);
  std::__cxx11::string::string(local_d40,"very",&aStack_1080c);
  std::__cxx11::string::string(local_d20,"vessel",&aStack_1080d);
  std::__cxx11::string::string(local_d00,"veteran",&aStack_1080e);
  std::__cxx11::string::string(local_ce0,"viable",&aStack_1080f);
  std::__cxx11::string::string(local_cc0,"vibrant",&aStack_10810);
  std::__cxx11::string::string(local_ca0,"vicious",&aStack_10811);
  std::__cxx11::string::string(local_c80,"victory",&aStack_10812);
  std::__cxx11::string::string(local_c60,"video",&aStack_10813);
  std::__cxx11::string::string(local_c40,"view",&aStack_10814);
  std::__cxx11::string::string(local_c20,"village",&aStack_10815);
  std::__cxx11::string::string(local_c00,"vintage",&aStack_10816);
  std::__cxx11::string::string(local_be0,"violin",&aStack_10817);
  std::__cxx11::string::string(local_bc0,"virtual",&aStack_10818);
  std::__cxx11::string::string(local_ba0,"virus",&aStack_10819);
  std::__cxx11::string::string(local_b80,"visa",&aStack_1081a);
  std::__cxx11::string::string(local_b60,"visit",&aStack_1081b);
  std::__cxx11::string::string(local_b40,"visual",&aStack_1081c);
  std::__cxx11::string::string(local_b20,"vital",&aStack_1081d);
  std::__cxx11::string::string(local_b00,"vivid",&aStack_1081e);
  std::__cxx11::string::string(local_ae0,"vocal",&aStack_1081f);
  std::__cxx11::string::string(local_ac0,"voice",&aStack_10820);
  std::__cxx11::string::string(local_aa0,"void",&aStack_10821);
  std::__cxx11::string::string(local_a80,"volcano",&aStack_10822);
  std::__cxx11::string::string(local_a60,"volume",&aStack_10823);
  std::__cxx11::string::string(local_a40,"vote",&aStack_10824);
  std::__cxx11::string::string(local_a20,"voyage",&aStack_10825);
  std::__cxx11::string::string(local_a00,"wage",&aStack_10826);
  std::__cxx11::string::string(local_9e0,"wagon",&aStack_10827);
  std::__cxx11::string::string(local_9c0,"wait",&aStack_10828);
  std::__cxx11::string::string(local_9a0,"walk",&aStack_10829);
  std::__cxx11::string::string(local_980,"wall",&aStack_1082a);
  std::__cxx11::string::string(local_960,"walnut",&aStack_1082b);
  std::__cxx11::string::string(local_940,"want",&aStack_1082c);
  std::__cxx11::string::string(local_920,"warfare",&aStack_1082d);
  std::__cxx11::string::string(local_900,"warm",&aStack_1082e);
  std::__cxx11::string::string(local_8e0,"warrior",&aStack_1082f);
  std::__cxx11::string::string(local_8c0,"wash",&aStack_10830);
  std::__cxx11::string::string(local_8a0,"wasp",&aStack_10831);
  std::__cxx11::string::string(local_880,"waste",&aStack_10832);
  std::__cxx11::string::string(local_860,"water",&aStack_10833);
  std::__cxx11::string::string(local_840,"wave",&aStack_10834);
  std::__cxx11::string::string(local_820,"way",&aStack_10835);
  std::__cxx11::string::string(local_800,"wealth",&aStack_10836);
  std::__cxx11::string::string(local_7e0,"weapon",&aStack_10837);
  std::__cxx11::string::string(local_7c0,"wear",&aStack_10838);
  std::__cxx11::string::string(local_7a0,"weasel",&aStack_10839);
  std::__cxx11::string::string(local_780,"weather",&aStack_1083a);
  std::__cxx11::string::string(local_760,"web",&aStack_1083b);
  std::__cxx11::string::string(local_740,"wedding",&aStack_1083c);
  std::__cxx11::string::string(local_720,"weekend",&aStack_1083d);
  std::__cxx11::string::string(local_700,"weird",&aStack_1083e);
  std::__cxx11::string::string(local_6e0,"welcome",&aStack_1083f);
  std::__cxx11::string::string(local_6c0,"west",&aStack_10840);
  std::__cxx11::string::string(local_6a0,"wet",&aStack_10841);
  std::__cxx11::string::string(local_680,"whale",&aStack_10842);
  std::__cxx11::string::string(local_660,"what",&aStack_10843);
  std::__cxx11::string::string(local_640,"wheat",&aStack_10844);
  std::__cxx11::string::string(local_620,"wheel",&aStack_10845);
  std::__cxx11::string::string(local_600,"when",&aStack_10846);
  std::__cxx11::string::string(local_5e0,"where",&aStack_10847);
  std::__cxx11::string::string(local_5c0,"whip",&aStack_10848);
  std::__cxx11::string::string(local_5a0,"whisper",&aStack_10849);
  std::__cxx11::string::string(local_580,"wide",&aStack_1084a);
  std::__cxx11::string::string(local_560,"width",&aStack_1084b);
  std::__cxx11::string::string(local_540,"wife",&aStack_1084c);
  std::__cxx11::string::string(local_520,"wild",&aStack_1084d);
  std::__cxx11::string::string(local_500,"will",&aStack_1084e);
  std::__cxx11::string::string(local_4e0,"win",&aStack_1084f);
  std::__cxx11::string::string(local_4c0,"window",&aStack_10850);
  std::__cxx11::string::string(local_4a0,"wine",&aStack_10851);
  std::__cxx11::string::string(local_480,"wing",&aStack_10852);
  std::__cxx11::string::string(local_460,"wink",&aStack_10853);
  std::__cxx11::string::string(local_440,"winner",&aStack_10854);
  std::__cxx11::string::string(local_420,"winter",&aStack_10855);
  std::__cxx11::string::string(local_400,"wire",&aStack_10856);
  std::__cxx11::string::string(local_3e0,"wisdom",&aStack_10857);
  std::__cxx11::string::string(local_3c0,"wise",&aStack_10858);
  std::__cxx11::string::string(local_3a0,"wish",&aStack_10859);
  std::__cxx11::string::string(local_380,"witness",&aStack_1085a);
  std::__cxx11::string::string(local_360,"wolf",&aStack_1085b);
  std::__cxx11::string::string(local_340,"woman",&aStack_1085c);
  std::__cxx11::string::string(local_320,"wonder",&aStack_1085d);
  std::__cxx11::string::string(local_300,"wood",&aStack_1085e);
  std::__cxx11::string::string(local_2e0,"wool",&aStack_1085f);
  std::__cxx11::string::string(local_2c0,"word",&aStack_10860);
  std::__cxx11::string::string(local_2a0,"work",&aStack_10861);
  std::__cxx11::string::string(local_280,"world",&aStack_10862);
  std::__cxx11::string::string(local_260,"worry",&aStack_10863);
  std::__cxx11::string::string(local_240,"worth",&aStack_10864);
  std::__cxx11::string::string(local_220,"wrap",&aStack_10865);
  std::__cxx11::string::string(local_200,"wreck",&aStack_10866);
  std::__cxx11::string::string(local_1e0,"wrestle",&aStack_10867);
  std::__cxx11::string::string(local_1c0,"wrist",&aStack_10868);
  std::__cxx11::string::string(local_1a0,"write",&aStack_10869);
  std::__cxx11::string::string(local_180,"wrong",&aStack_1086a);
  std::__cxx11::string::string(local_160,"yard",&aStack_1086b);
  std::__cxx11::string::string(local_140,"year",&aStack_1086c);
  std::__cxx11::string::string(local_120,"yellow",&aStack_1086d);
  std::__cxx11::string::string(local_100,"you",&aStack_1086e);
  std::__cxx11::string::string(local_e0,"young",&aStack_1086f);
  std::__cxx11::string::string(local_c0,"youth",&aStack_10870);
  std::__cxx11::string::string(local_a0,"zebra",&aStack_10871);
  std::__cxx11::string::string(local_80,"zero",&aStack_10872);
  std::__cxx11::string::string(local_60,"zone",&aStack_10873);
  std::__cxx11::string::string(local_40,"zoo",&aStack_10874);
  __l._M_len = 0x800;
  __l._M_array = &language;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expect_en_words,__l,&aStack_10875);
  lVar2 = 0xffe0;
  do {
    std::__cxx11::string::~string(local_10000 + lVar2 + -0x20);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string((string *)&language,"en",(allocator *)&gtest_ar);
  actual_wordlist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  actual_wordlist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  actual_wordlist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GetMnemonicWordlist
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gtest_ar,&language);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&actual_wordlist,&gtest_ar);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vStack_10890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1f,
               "Expected: actual_wordlist = HDWallet::GetMnemonicWordlist(language) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&vStack_10890,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vStack_10890);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"expect_en_words","actual_wordlist",&expect_en_words,
             &actual_wordlist);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&vStack_10890);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_10898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_10898,(Message *)&vStack_10890);
    testing::internal::AssertHelper::~AssertHelper(&AStack_10898);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vStack_10890);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  AStack_10898.data_._0_4_ = 0x800;
  vStack_10890.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)actual_wordlist.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)actual_wordlist.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"2048","actual_wordlist.size()",(int *)&AStack_10898,
             (unsigned_long *)&vStack_10890);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&vStack_10890);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_10898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_10898,(Message *)&vStack_10890);
    testing::internal::AssertHelper::~AssertHelper(&AStack_10898);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vStack_10890);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&gtest_ar,"jp",(allocator *)&AStack_10898);
      cfd::core::HDWallet::GetMnemonicWordlist(&vStack_10890,(string *)&gtest_ar);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&actual_wordlist,&vStack_10890);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_10890);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vStack_10890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x24,
               "Expected: actual_wordlist = HDWallet::GetMnemonicWordlist(\"jp\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&vStack_10890,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vStack_10890);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  AStack_10898.data_._0_4_ = 0x800;
  vStack_10890.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)actual_wordlist.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)actual_wordlist.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"2048","actual_wordlist.size()",(int *)&AStack_10898,
             (unsigned_long *)&vStack_10890);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&vStack_10890);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_10898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_10898,(Message *)&vStack_10890);
    testing::internal::AssertHelper::~AssertHelper(&AStack_10898);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vStack_10890);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&actual_wordlist);
  std::__cxx11::string::~string((string *)&language);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expect_en_words);
  return;
}

Assistant:

TEST(HDWallet, GetMnemonicWordlistTest) {
  // ref: https://github.com/bitcoin/bips/blob/master/bip-0039/english.txt
  std::vector<std::string> expect_en_words = {"abandon", "ability", "able", "about", "above", "absent", "absorb", "abstract", "absurd", "abuse", "access", "accident", "account", "accuse", "achieve", "acid", "acoustic", "acquire", "across", "act", "action", "actor", "actress", "actual", "adapt", "add", "addict", "address", "adjust", "admit", "adult", "advance", "advice", "aerobic", "affair", "afford", "afraid", "again", "age", "agent", "agree", "ahead", "aim", "air", "airport", "aisle", "alarm", "album", "alcohol", "alert", "alien", "all", "alley", "allow", "almost", "alone", "alpha", "already", "also", "alter", "always", "amateur", "amazing", "among", "amount", "amused", "analyst", "anchor", "ancient", "anger", "angle", "angry", "animal", "ankle", "announce", "annual", "another", "answer", "antenna", "antique", "anxiety", "any", "apart", "apology", "appear", "apple", "approve", "april", "arch", "arctic", "area", "arena", "argue", "arm", "armed", "armor", "army", "around", "arrange", "arrest", "arrive", "arrow", "art", "artefact", "artist", "artwork", "ask", "aspect", "assault", "asset", "assist", "assume", "asthma", "athlete", "atom", "attack", "attend", "attitude", "attract", "auction", "audit", "august", "aunt", "author", "auto", "autumn", "average", "avocado", "avoid", "awake", "aware", "away", "awesome", "awful", "awkward", "axis", "baby", "bachelor", "bacon", "badge", "bag", "balance", "balcony", "ball", "bamboo", "banana", "banner", "bar", "barely", "bargain", "barrel", "base", "basic", "basket", "battle", "beach", "bean", "beauty", "because", "become", "beef", "before", "begin", "behave", "behind", "believe", "below", "belt", "bench", "benefit", "best", "betray", "better", "between", "beyond", "bicycle", "bid", "bike", "bind", "biology", "bird", "birth", "bitter", "black", "blade", "blame", "blanket", "blast", "bleak", "bless", "blind", "blood", "blossom", "blouse", "blue", "blur", "blush", "board", "boat", "body", "boil", "bomb", "bone", "bonus", "book", "boost", "border", "boring", "borrow", "boss", "bottom", "bounce", "box", "boy", "bracket", "brain", "brand", "brass", "brave", "bread", "breeze", "brick", "bridge", "brief", "bright", "bring", "brisk", "broccoli", "broken", "bronze", "broom", "brother", "brown", "brush", "bubble", "buddy", "budget", "buffalo", "build", "bulb", "bulk", "bullet", "bundle", "bunker", "burden", "burger", "burst", "bus", "business", "busy", "butter", "buyer", "buzz", "cabbage", "cabin", "cable", "cactus", "cage", "cake", "call", "calm", "camera", "camp", "can", "canal", "cancel", "candy", "cannon", "canoe", "canvas", "canyon", "capable", "capital", "captain", "car", "carbon", "card", "cargo", "carpet", "carry", "cart", "case", "cash", "casino", "castle", "casual", "cat", "catalog", "catch", "category", "cattle", "caught", "cause", "caution", "cave", "ceiling", "celery", "cement", "census", "century", "cereal", "certain", "chair", "chalk", "champion", "change", "chaos", "chapter", "charge", "chase", "chat", "cheap", "check", "cheese", "chef", "cherry", "chest", "chicken", "chief", "child", "chimney", "choice", "choose", "chronic", "chuckle", "chunk", "churn", "cigar", "cinnamon", "circle", "citizen", "city", "civil", "claim", "clap", "clarify", "claw", "clay", "clean", "clerk", "clever", "click", "client", "cliff", "climb", "clinic", "clip", "clock", "clog", "close", "cloth", "cloud", "clown", "club", "clump", "cluster", "clutch", "coach", "coast", "coconut", "code", "coffee", "coil", "coin", "collect", "color", "column", "combine", "come", "comfort", "comic", "common", "company", "concert", "conduct", "confirm", "congress", "connect", "consider", "control", "convince", "cook", "cool", "copper", "copy", "coral", "core", "corn", "correct", "cost", "cotton", "couch", "country", "couple", "course", "cousin", "cover", "coyote", "crack", "cradle", "craft", "cram", "crane", "crash", "crater", "crawl", "crazy", "cream", "credit", "creek", "crew", "cricket", "crime", "crisp", "critic", "crop", "cross", "crouch", "crowd", "crucial", "cruel", "cruise", "crumble", "crunch", "crush", "cry", "crystal", "cube", "culture", "cup", "cupboard", "curious", "current", "curtain", "curve", "cushion", "custom", "cute", "cycle", "dad", "damage", "damp", "dance", "danger", "daring", "dash", "daughter", "dawn", "day", "deal", "debate", "debris", "decade", "december", "decide", "decline", "decorate", "decrease", "deer", "defense", "define", "defy", "degree", "delay", "deliver", "demand", "demise", "denial", "dentist", "deny", "depart", "depend", "deposit", "depth", "deputy", "derive", "describe", "desert", "design", "desk", "despair", "destroy", "detail", "detect", "develop", "device", "devote", "diagram", "dial", "diamond", "diary", "dice", "diesel", "diet", "differ", "digital", "dignity", "dilemma", "dinner", "dinosaur", "direct", "dirt", "disagree", "discover", "disease", "dish", "dismiss", "disorder", "display", "distance", "divert", "divide", "divorce", "dizzy", "doctor", "document", "dog", "doll", "dolphin", "domain", "donate", "donkey", "donor", "door", "dose", "double", "dove", "draft", "dragon", "drama", "drastic", "draw", "dream", "dress", "drift", "drill", "drink", "drip", "drive", "drop", "drum", "dry", "duck", "dumb", "dune", "during", "dust", "dutch", "duty", "dwarf", "dynamic", "eager", "eagle", "early", "earn", "earth", "easily", "east", "easy", "echo", "ecology", "economy", "edge", "edit", "educate", "effort", "egg", "eight", "either", "elbow", "elder", "electric", "elegant", "element", "elephant", "elevator", "elite", "else", "embark", "embody", "embrace", "emerge", "emotion", "employ", "empower", "empty", "enable", "enact", "end", "endless", "endorse", "enemy", "energy", "enforce", "engage", "engine", "enhance", "enjoy", "enlist", "enough", "enrich", "enroll", "ensure", "enter", "entire", "entry", "envelope", "episode", "equal", "equip", "era", "erase", "erode", "erosion", "error", "erupt", "escape", "essay", "essence", "estate", "eternal", "ethics", "evidence", "evil", "evoke", "evolve", "exact", "example", "excess", "exchange", "excite", "exclude", "excuse", "execute", "exercise", "exhaust", "exhibit", "exile", "exist", "exit", "exotic", "expand", "expect", "expire", "explain", "expose", "express", "extend", "extra", "eye", "eyebrow", "fabric", "face", "faculty", "fade", "faint", "faith", "fall", "false", "fame", "family", "famous", "fan", "fancy", "fantasy", "farm", "fashion", "fat", "fatal", "father", "fatigue", "fault", "favorite", "feature", "february", "federal", "fee", "feed", "feel", "female", "fence", "festival", "fetch", "fever", "few", "fiber", "fiction", "field", "figure", "file", "film", "filter", "final", "find", "fine", "finger", "finish", "fire", "firm", "first", "fiscal", "fish", "fit", "fitness", "fix", "flag", "flame", "flash", "flat", "flavor", "flee", "flight", "flip", "float", "flock", "floor", "flower", "fluid", "flush", "fly", "foam", "focus", "fog", "foil", "fold", "follow", "food", "foot", "force", "forest", "forget", "fork", "fortune", "forum", "forward", "fossil", "foster", "found", "fox", "fragile", "frame", "frequent", "fresh", "friend", "fringe", "frog", "front", "frost", "frown", "frozen", "fruit", "fuel", "fun", "funny", "furnace", "fury", "future", "gadget", "gain", "galaxy", "gallery", "game", "gap", "garage", "garbage", "garden", "garlic", "garment", "gas", "gasp", "gate", "gather", "gauge", "gaze", "general", "genius", "genre", "gentle", "genuine", "gesture", "ghost", "giant", "gift", "giggle", "ginger", "giraffe", "girl", "give", "glad", "glance", "glare", "glass", "glide", "glimpse", "globe", "gloom", "glory", "glove", "glow", "glue", "goat", "goddess", "gold", "good", "goose", "gorilla", "gospel", "gossip", "govern", "gown", "grab", "grace", "grain", "grant", "grape", "grass", "gravity", "great", "green", "grid", "grief", "grit", "grocery", "group", "grow", "grunt", "guard", "guess", "guide", "guilt", "guitar", "gun", "gym", "habit", "hair", "half", "hammer", "hamster", "hand", "happy", "harbor", "hard", "harsh", "harvest", "hat", "have", "hawk", "hazard", "head", "health", "heart", "heavy", "hedgehog", "height", "hello", "helmet", "help", "hen", "hero", "hidden", "high", "hill", "hint", "hip", "hire", "history", "hobby", "hockey", "hold", "hole", "holiday", "hollow", "home", "honey", "hood", "hope", "horn", "horror", "horse", "hospital", "host", "hotel", "hour", "hover", "hub", "huge", "human", "humble", "humor", "hundred", "hungry", "hunt", "hurdle", "hurry", "hurt", "husband", "hybrid", "ice", "icon", "idea", "identify", "idle", "ignore", "ill", "illegal", "illness", "image", "imitate", "immense", "immune", "impact", "impose", "improve", "impulse", "inch", "include", "income", "increase", "index", "indicate", "indoor", "industry", "infant", "inflict", "inform", "inhale", "inherit", "initial", "inject", "injury", "inmate", "inner", "innocent", "input", "inquiry", "insane", "insect", "inside", "inspire", "install", "intact", "interest", "into", "invest", "invite", "involve", "iron", "island", "isolate", "issue", "item", "ivory", "jacket", "jaguar", "jar", "jazz", "jealous", "jeans", "jelly", "jewel", "job", "join", "joke", "journey", "joy", "judge", "juice", "jump", "jungle", "junior", "junk", "just", "kangaroo", "keen", "keep", "ketchup", "key", "kick", "kid", "kidney", "kind", "kingdom", "kiss", "kit", "kitchen", "kite", "kitten", "kiwi", "knee", "knife", "knock", "know", "lab", "label", "labor", "ladder", "lady", "lake", "lamp", "language", "laptop", "large", "later", "latin", "laugh", "laundry", "lava", "law", "lawn", "lawsuit", "layer", "lazy", "leader", "leaf", "learn", "leave", "lecture", "left", "leg", "legal", "legend", "leisure", "lemon", "lend", "length", "lens", "leopard", "lesson", "letter", "level", "liar", "liberty", "library", "license", "life", "lift", "light", "like", "limb", "limit", "link", "lion", "liquid", "list", "little", "live", "lizard", "load", "loan", "lobster", "local", "lock", "logic", "lonely", "long", "loop", "lottery", "loud", "lounge", "love", "loyal", "lucky", "luggage", "lumber", "lunar", "lunch", "luxury", "lyrics", "machine", "mad", "magic", "magnet", "maid", "mail", "main", "major", "make", "mammal", "man", "manage", "mandate", "mango", "mansion", "manual", "maple", "marble", "march", "margin", "marine", "market", "marriage", "mask", "mass", "master", "match", "material", "math", "matrix", "matter", "maximum", "maze", "meadow", "mean", "measure", "meat", "mechanic", "medal", "media", "melody", "melt", "member", "memory", "mention", "menu", "mercy", "merge", "merit", "merry", "mesh", "message", "metal", "method", "middle", "midnight", "milk", "million", "mimic", "mind", "minimum", "minor", "minute", "miracle", "mirror", "misery", "miss", "mistake", "mix", "mixed", "mixture", "mobile", "model", "modify", "mom", "moment", "monitor", "monkey", "monster", "month", "moon", "moral", "more", "morning", "mosquito", "mother", "motion", "motor", "mountain", "mouse", "move", "movie", "much", "muffin", "mule", "multiply", "muscle", "museum", "mushroom", "music", "must", "mutual", "myself", "mystery", "myth", "naive", "name", "napkin", "narrow", "nasty", "nation", "nature", "near", "neck", "need", "negative", "neglect", "neither", "nephew", "nerve", "nest", "net", "network", "neutral", "never", "news", "next", "nice", "night", "noble", "noise", "nominee", "noodle", "normal", "north", "nose", "notable", "note", "nothing", "notice", "novel", "now", "nuclear", "number", "nurse", "nut", "oak", "obey", "object", "oblige", "obscure", "observe", "obtain", "obvious", "occur", "ocean", "october", "odor", "off", "offer", "office", "often", "oil", "okay", "old", "olive", "olympic", "omit", "once", "one", "onion", "online", "only", "open", "opera", "opinion", "oppose", "option", "orange", "orbit", "orchard", "order", "ordinary", "organ", "orient", "original", "orphan", "ostrich", "other", "outdoor", "outer", "output", "outside", "oval", "oven", "over", "own", "owner", "oxygen", "oyster", "ozone", "pact", "paddle", "page", "pair", "palace", "palm", "panda", "panel", "panic", "panther", "paper", "parade", "parent", "park", "parrot", "party", "pass", "patch", "path", "patient", "patrol", "pattern", "pause", "pave", "payment", "peace", "peanut", "pear", "peasant", "pelican", "pen", "penalty", "pencil", "people", "pepper", "perfect", "permit", "person", "pet", "phone", "photo", "phrase", "physical", "piano", "picnic", "picture", "piece", "pig", "pigeon", "pill", "pilot", "pink", "pioneer", "pipe", "pistol", "pitch", "pizza", "place", "planet", "plastic", "plate", "play", "please", "pledge", "pluck", "plug", "plunge", "poem", "poet", "point", "polar", "pole", "police", "pond", "pony", "pool", "popular", "portion", "position", "possible", "post", "potato", "pottery", "poverty", "powder", "power", "practice", "praise", "predict", "prefer", "prepare", "present", "pretty", "prevent", "price", "pride", "primary", "print", "priority", "prison", "private", "prize", "problem", "process", "produce", "profit", "program", "project", "promote", "proof", "property", "prosper", "protect", "proud", "provide", "public", "pudding", "pull", "pulp", "pulse", "pumpkin", "punch", "pupil", "puppy", "purchase", "purity", "purpose", "purse", "push", "put", "puzzle", "pyramid", "quality", "quantum", "quarter", "question", "quick", "quit", "quiz", "quote", "rabbit", "raccoon", "race", "rack", "radar", "radio", "rail", "rain", "raise", "rally", "ramp", "ranch", "random", "range", "rapid", "rare", "rate", "rather", "raven", "raw", "razor", "ready", "real", "reason", "rebel", "rebuild", "recall", "receive", "recipe", "record", "recycle", "reduce", "reflect", "reform", "refuse", "region", "regret", "regular", "reject", "relax", "release", "relief", "rely", "remain", "remember", "remind", "remove", "render", "renew", "rent", "reopen", "repair", "repeat", "replace", "report", "require", "rescue", "resemble", "resist", "resource", "response", "result", "retire", "retreat", "return", "reunion", "reveal", "review", "reward", "rhythm", "rib", "ribbon", "rice", "rich", "ride", "ridge", "rifle", "right", "rigid", "ring", "riot", "ripple", "risk", "ritual", "rival", "river", "road", "roast", "robot", "robust", "rocket", "romance", "roof", "rookie", "room", "rose", "rotate", "rough", "round", "route", "royal", "rubber", "rude", "rug", "rule", "run", "runway", "rural", "sad", "saddle", "sadness", "safe", "sail", "salad", "salmon", "salon", "salt", "salute", "same", "sample", "sand", "satisfy", "satoshi", "sauce", "sausage", "save", "say", "scale", "scan", "scare", "scatter", "scene", "scheme", "school", "science", "scissors", "scorpion", "scout", "scrap", "screen", "script", "scrub", "sea", "search", "season", "seat", "second", "secret", "section", "security", "seed", "seek", "segment", "select", "sell", "seminar", "senior", "sense", "sentence", "series", "service", "session", "settle", "setup", "seven", "shadow", "shaft", "shallow", "share", "shed", "shell", "sheriff", "shield", "shift", "shine", "ship", "shiver", "shock", "shoe", "shoot", "shop", "short", "shoulder", "shove", "shrimp", "shrug", "shuffle", "shy", "sibling", "sick", "side", "siege", "sight", "sign", "silent", "silk", "silly", "silver", "similar", "simple", "since", "sing", "siren", "sister", "situate", "six", "size", "skate", "sketch", "ski", "skill", "skin", "skirt", "skull", "slab", "slam", "sleep", "slender", "slice", "slide", "slight", "slim", "slogan", "slot", "slow", "slush", "small", "smart", "smile", "smoke", "smooth", "snack", "snake", "snap", "sniff", "snow", "soap", "soccer", "social", "sock", "soda", "soft", "solar", "soldier", "solid", "solution", "solve", "someone", "song", "soon", "sorry", "sort", "soul", "sound", "soup", "source", "south", "space", "spare", "spatial", "spawn", "speak", "special", "speed", "spell", "spend", "sphere", "spice", "spider", "spike", "spin", "spirit", "split", "spoil", "sponsor", "spoon", "sport", "spot", "spray", "spread", "spring", "spy", "square", "squeeze", "squirrel", "stable", "stadium", "staff", "stage", "stairs", "stamp", "stand", "start", "state", "stay", "steak", "steel", "stem", "step", "stereo", "stick", "still", "sting", "stock", "stomach", "stone", "stool", "story", "stove", "strategy", "street", "strike", "strong", "struggle", "student", "stuff", "stumble", "style", "subject", "submit", "subway", "success", "such", "sudden", "suffer", "sugar", "suggest", "suit", "summer", "sun", "sunny", "sunset", "super", "supply", "supreme", "sure", "surface", "surge", "surprise", "surround", "survey", "suspect", "sustain", "swallow", "swamp", "swap", "swarm", "swear", "sweet", "swift", "swim", "swing", "switch", "sword", "symbol", "symptom", "syrup", "system", "table", "tackle", "tag", "tail", "talent", "talk", "tank", "tape", "target", "task", "taste", "tattoo", "taxi", "teach", "team", "tell", "ten", "tenant", "tennis", "tent", "term", "test", "text", "thank", "that", "theme", "then", "theory", "there", "they", "thing", "this", "thought", "three", "thrive", "throw", "thumb", "thunder", "ticket", "tide", "tiger", "tilt", "timber", "time", "tiny", "tip", "tired", "tissue", "title", "toast", "tobacco", "today", "toddler", "toe", "together", "toilet", "token", "tomato", "tomorrow", "tone", "tongue", "tonight", "tool", "tooth", "top", "topic", "topple", "torch", "tornado", "tortoise", "toss", "total", "tourist", "toward", "tower", "town", "toy", "track", "trade", "traffic", "tragic", "train", "transfer", "trap", "trash", "travel", "tray", "treat", "tree", "trend", "trial", "tribe", "trick", "trigger", "trim", "trip", "trophy", "trouble", "truck", "true", "truly", "trumpet", "trust", "truth", "try", "tube", "tuition", "tumble", "tuna", "tunnel", "turkey", "turn", "turtle", "twelve", "twenty", "twice", "twin", "twist", "two", "type", "typical", "ugly", "umbrella", "unable", "unaware", "uncle", "uncover", "under", "undo", "unfair", "unfold", "unhappy", "uniform", "unique", "unit", "universe", "unknown", "unlock", "until", "unusual", "unveil", "update", "upgrade", "uphold", "upon", "upper", "upset", "urban", "urge", "usage", "use", "used", "useful", "useless", "usual", "utility", "vacant", "vacuum", "vague", "valid", "valley", "valve", "van", "vanish", "vapor", "various", "vast", "vault", "vehicle", "velvet", "vendor", "venture", "venue", "verb", "verify", "version", "very", "vessel", "veteran", "viable", "vibrant", "vicious", "victory", "video", "view", "village", "vintage", "violin", "virtual", "virus", "visa", "visit", "visual", "vital", "vivid", "vocal", "voice", "void", "volcano", "volume", "vote", "voyage", "wage", "wagon", "wait", "walk", "wall", "walnut", "want", "warfare", "warm", "warrior", "wash", "wasp", "waste", "water", "wave", "way", "wealth", "weapon", "wear", "weasel", "weather", "web", "wedding", "weekend", "weird", "welcome", "west", "wet", "whale", "what", "wheat", "wheel", "when", "where", "whip", "whisper", "wide", "width", "wife", "wild", "will", "win", "window", "wine", "wing", "wink", "winner", "winter", "wire", "wisdom", "wise", "wish", "witness", "wolf", "woman", "wonder", "wood", "wool", "word", "work", "world", "worry", "worth", "wrap", "wreck", "wrestle", "wrist", "write", "wrong", "yard", "year", "yellow", "you", "young", "youth", "zebra", "zero", "zone", "zoo"};

  // check en
  std::string language = "en";
  std::vector<std::string> actual_wordlist;
  EXPECT_NO_THROW(actual_wordlist = HDWallet::GetMnemonicWordlist(language));
  EXPECT_EQ(expect_en_words, actual_wordlist);
  EXPECT_EQ(2048, actual_wordlist.size());

  // check ja
  EXPECT_NO_THROW(actual_wordlist = HDWallet::GetMnemonicWordlist("jp"));
  EXPECT_EQ(2048, actual_wordlist.size());
}